

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_avx512_functor::binary_op_rpow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  ulong uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  ushort uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar164 [64];
  undefined1 auVar165 [64];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar168 [64];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [16];
  undefined1 auVar281 [40];
  undefined1 auVar282 [48];
  undefined1 auVar283 [56];
  undefined1 auVar284 [40];
  undefined1 auVar285 [48];
  undefined1 auVar286 [56];
  undefined1 auVar287 [24];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar288 [64];
  undefined1 auVar289 [64];
  undefined1 auVar290 [64];
  undefined1 auVar291 [64];
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar296;
  undefined1 auVar293 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  __m128 _outp_5;
  __m128 _b_5;
  __m256 _outp_4;
  __m256 _b_4;
  __m128 _b1_2;
  __m128 _b0_2;
  __m512 _outp_3;
  __m512 _b_3;
  __m256 _b23;
  __m256 _b01;
  __m128 _b3;
  __m128 _b2;
  __m128 _b1_1;
  __m128 _b0_1;
  __m512 _p_512_1;
  __m256 _p_256;
  __m128 _p_2;
  int i_2;
  __m256 _outp_2;
  __m256 _b_2;
  __m512 _outp_1;
  __m512 _b_1;
  __m256 _b1;
  __m256 _b0;
  __m512 _p_512;
  __m256 _p_1;
  int i_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_rpow op;
  __m512 pow2n_3;
  __m512 y_7;
  __mmask16 mask_7;
  __m512 one_7;
  __m512i imm0_7;
  __m512 fx_3;
  __m512 tmp_7;
  __m512 y_6;
  __m512 z_3;
  __m512 tmp_6;
  __mmask16 mask_6;
  __m512 e_3;
  __mmask16 invalid_mask_3;
  __m512 one_6;
  __m512i imm0_6;
  __m512 pow2n_1;
  __m512 y_3;
  __mmask16 mask_3;
  __m512 one_3;
  __m512i imm0_3;
  __m512 fx_1;
  __m512 tmp_3;
  __m512 y_2;
  __m512 z_1;
  __m512 tmp_2;
  __mmask16 mask_2;
  __m512 e_1;
  __mmask16 invalid_mask_1;
  __m512 one_2;
  __m512i imm0_2;
  __m512 pow2n;
  __m512 y_1;
  __mmask16 mask_1;
  __m512 one_1;
  __m512i imm0_1;
  __m512 fx;
  __m512 tmp_1;
  __m512 y;
  __m512 z;
  __m512 tmp;
  __mmask16 mask;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one;
  __m512i imm0;
  __m256 pow2n_4;
  __m256 y_9;
  __m256 mask_9;
  __m256 one_9;
  __m256i imm0_9;
  __m256 fx_4;
  __m256 tmp_9;
  __m256 y_8;
  __m256 z_4;
  __m256 tmp_8;
  __m256 mask_8;
  __m256 e_4;
  __m256 invalid_mask_4;
  __m256 one_8;
  __m256i imm0_8;
  __m256 pow2n_2;
  __m256 y_5;
  __m256 mask_5;
  __m256 one_5;
  __m256i imm0_5;
  __m256 fx_2;
  __m256 tmp_5;
  __m256 y_4;
  __m256 z_2;
  __m256 tmp_4;
  __m256 mask_4;
  __m256 e_2;
  __m256 invalid_mask_2;
  __m256 one_4;
  __m256i imm0_4;
  v4sf pow2n_5;
  v4sf y_11;
  v4sf mask_11;
  v4sf one_11;
  v4si emm0_1;
  v4sf fx_5;
  v4sf tmp_11;
  v4sf y_10;
  v4sf z_5;
  v4sf tmp_10;
  v4sf mask_10;
  v4sf e_5;
  v4sf invalid_mask_5;
  v4sf one_10;
  v4si emm0;
  int local_a8c4;
  int local_a744;
  int local_a670;
  undefined8 *local_a660;
  uint *local_a658;
  undefined8 uStack_a210;
  undefined8 uStack_a208;
  undefined8 uStack_a1d0;
  undefined8 uStack_a1c8;
  undefined8 uStack_a190;
  undefined8 uStack_a188;
  undefined1 local_a000 [8];
  undefined8 uStack_9ff8;
  undefined8 uStack_9ff0;
  undefined8 uStack_9fe8;
  undefined8 uStack_9fe0;
  undefined8 uStack_9fd8;
  undefined8 uStack_9fd0;
  undefined8 uStack_9fc8;
  undefined1 local_9f00 [16];
  undefined8 uStack_9ef0;
  undefined8 uStack_9ee8;
  undefined8 uStack_9ee0;
  undefined8 uStack_9ed8;
  undefined8 uStack_9ed0;
  undefined8 uStack_9ec8;
  undefined1 local_9bc0 [256];
  undefined1 local_9ac0 [16];
  undefined8 uStack_9ab0;
  undefined8 uStack_9aa8;
  undefined8 uStack_9aa0;
  undefined8 uStack_9a98;
  undefined8 uStack_9a90;
  undefined8 uStack_9a88;
  undefined1 local_99c0 [16];
  undefined8 uStack_99b0;
  undefined8 uStack_99a8;
  undefined8 uStack_99a0;
  undefined8 uStack_9998;
  undefined8 uStack_9990;
  undefined8 uStack_9988;
  int local_8800;
  int iStack_87fc;
  int iStack_87f8;
  int iStack_87f4;
  int iStack_87f0;
  int iStack_87ec;
  int iStack_87e8;
  int iStack_87e4;
  int iStack_87e0;
  int iStack_87dc;
  int iStack_87d8;
  int iStack_87d4;
  int iStack_87d0;
  int iStack_87cc;
  int iStack_87c8;
  int iStack_87c4;
  int local_8680;
  int iStack_867c;
  int iStack_8678;
  int iStack_8674;
  int iStack_8670;
  int iStack_866c;
  int iStack_8668;
  int iStack_8664;
  int iStack_8660;
  int iStack_865c;
  int iStack_8658;
  int iStack_8654;
  int iStack_8650;
  int iStack_864c;
  int iStack_8648;
  int iStack_8644;
  int local_7dc0;
  int iStack_7dbc;
  int iStack_7db8;
  int iStack_7db4;
  int iStack_7db0;
  int iStack_7dac;
  int iStack_7da8;
  int iStack_7da4;
  int iStack_7da0;
  int iStack_7d9c;
  int iStack_7d98;
  int iStack_7d94;
  int iStack_7d90;
  int iStack_7d8c;
  int iStack_7d88;
  int iStack_7d84;
  undefined1 local_7b80 [8];
  undefined8 uStack_7b78;
  undefined8 uStack_7b70;
  undefined8 uStack_7b68;
  undefined8 uStack_7b60;
  undefined8 uStack_7b58;
  undefined8 uStack_7b50;
  undefined8 uStack_7b48;
  undefined1 local_7a80 [16];
  undefined8 uStack_7a70;
  undefined8 uStack_7a68;
  undefined8 uStack_7a60;
  undefined8 uStack_7a58;
  undefined8 uStack_7a50;
  undefined8 uStack_7a48;
  undefined1 local_7740 [256];
  undefined1 local_7640 [16];
  undefined8 uStack_7630;
  undefined8 uStack_7628;
  undefined8 uStack_7620;
  undefined8 uStack_7618;
  undefined8 uStack_7610;
  undefined8 uStack_7608;
  undefined1 local_7540 [16];
  undefined8 uStack_7530;
  undefined8 uStack_7528;
  undefined8 uStack_7520;
  undefined8 uStack_7518;
  undefined8 uStack_7510;
  undefined8 uStack_7508;
  int local_6380;
  int iStack_637c;
  int iStack_6378;
  int iStack_6374;
  int iStack_6370;
  int iStack_636c;
  int iStack_6368;
  int iStack_6364;
  int iStack_6360;
  int iStack_635c;
  int iStack_6358;
  int iStack_6354;
  int iStack_6350;
  int iStack_634c;
  int iStack_6348;
  int iStack_6344;
  int local_6200;
  int iStack_61fc;
  int iStack_61f8;
  int iStack_61f4;
  int iStack_61f0;
  int iStack_61ec;
  int iStack_61e8;
  int iStack_61e4;
  int iStack_61e0;
  int iStack_61dc;
  int iStack_61d8;
  int iStack_61d4;
  int iStack_61d0;
  int iStack_61cc;
  int iStack_61c8;
  int iStack_61c4;
  int local_5940;
  int iStack_593c;
  int iStack_5938;
  int iStack_5934;
  int iStack_5930;
  int iStack_592c;
  int iStack_5928;
  int iStack_5924;
  int iStack_5920;
  int iStack_591c;
  int iStack_5918;
  int iStack_5914;
  int iStack_5910;
  int iStack_590c;
  int iStack_5908;
  int iStack_5904;
  undefined1 local_5700 [8];
  undefined8 uStack_56f8;
  undefined8 uStack_56f0;
  undefined8 uStack_56e8;
  undefined8 uStack_56e0;
  undefined8 uStack_56d8;
  undefined8 uStack_56d0;
  undefined8 uStack_56c8;
  undefined1 local_5600 [16];
  undefined8 uStack_55f0;
  undefined8 uStack_55e8;
  undefined8 uStack_55e0;
  undefined8 uStack_55d8;
  undefined8 uStack_55d0;
  undefined8 uStack_55c8;
  undefined1 local_52c0 [256];
  undefined1 local_51c0 [16];
  undefined8 uStack_51b0;
  undefined8 uStack_51a8;
  undefined8 uStack_51a0;
  undefined8 uStack_5198;
  undefined8 uStack_5190;
  undefined8 uStack_5188;
  undefined1 local_50c0 [16];
  undefined8 uStack_50b0;
  undefined8 uStack_50a8;
  undefined8 uStack_50a0;
  undefined8 uStack_5098;
  undefined8 uStack_5090;
  undefined8 uStack_5088;
  int local_3f00;
  int iStack_3efc;
  int iStack_3ef8;
  int iStack_3ef4;
  int iStack_3ef0;
  int iStack_3eec;
  int iStack_3ee8;
  int iStack_3ee4;
  int iStack_3ee0;
  int iStack_3edc;
  int iStack_3ed8;
  int iStack_3ed4;
  int iStack_3ed0;
  int iStack_3ecc;
  int iStack_3ec8;
  int iStack_3ec4;
  int local_3d80;
  int iStack_3d7c;
  int iStack_3d78;
  int iStack_3d74;
  int iStack_3d70;
  int iStack_3d6c;
  int iStack_3d68;
  int iStack_3d64;
  int iStack_3d60;
  int iStack_3d5c;
  int iStack_3d58;
  int iStack_3d54;
  int iStack_3d50;
  int iStack_3d4c;
  int iStack_3d48;
  int iStack_3d44;
  int local_34c0;
  int iStack_34bc;
  int iStack_34b8;
  int iStack_34b4;
  int iStack_34b0;
  int iStack_34ac;
  int iStack_34a8;
  int iStack_34a4;
  int iStack_34a0;
  int iStack_349c;
  int iStack_3498;
  int iStack_3494;
  int iStack_3490;
  int iStack_348c;
  int iStack_3488;
  int iStack_3484;
  float local_3380;
  float fStack_337c;
  float fStack_3378;
  float fStack_3374;
  float fStack_3370;
  float fStack_336c;
  float fStack_3368;
  float local_3360;
  float fStack_335c;
  float fStack_3358;
  float fStack_3354;
  undefined1 local_3320 [8];
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined1 local_32c0 [16];
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined1 local_3280 [8];
  float fStack_3278;
  float fStack_3274;
  undefined1 local_3260 [8];
  float fStack_3258;
  float fStack_3254;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  float local_3220;
  float fStack_321c;
  float fStack_3218;
  float fStack_3214;
  float local_31c0;
  float fStack_31bc;
  float fStack_31b8;
  float fStack_31b4;
  float fStack_31b0;
  float fStack_31ac;
  float fStack_31a8;
  float local_3160;
  float fStack_315c;
  float fStack_3158;
  float fStack_3154;
  undefined1 local_30c0 [8];
  float fStack_30b8;
  float fStack_30b4;
  float fStack_30b0;
  float fStack_30ac;
  float fStack_30a8;
  undefined4 uStack_30a4;
  undefined1 local_3040 [8];
  float fStack_3038;
  float fStack_3034;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined1 local_2fc0 [8];
  float fStack_2fb8;
  float fStack_2fb4;
  float fStack_2fb0;
  float fStack_2fac;
  float fStack_2fa8;
  float fStack_2fa4;
  float local_2fa0;
  float fStack_2f9c;
  float fStack_2f98;
  float fStack_2f94;
  float local_2f60;
  float fStack_2f5c;
  float fStack_2f58;
  float fStack_2f54;
  float fStack_2f50;
  float fStack_2f4c;
  float fStack_2f48;
  float fStack_2f44;
  float local_2f40;
  float fStack_2f3c;
  float fStack_2f38;
  float fStack_2f34;
  float fStack_2f30;
  float fStack_2f2c;
  float fStack_2f28;
  float fStack_2f24;
  float local_2f00;
  float fStack_2efc;
  float fStack_2ef8;
  float fStack_2ef4;
  float fStack_2ef0;
  float fStack_2eec;
  float fStack_2ee8;
  float fStack_2ee4;
  float local_2e00;
  float fStack_2dfc;
  float fStack_2df8;
  float fStack_2df4;
  float local_2a20;
  float fStack_2a1c;
  float fStack_2a18;
  float fStack_2a14;
  float fStack_2a10;
  float fStack_2a0c;
  float fStack_2a08;
  float fStack_2a04;
  float local_1f40;
  float fStack_1f3c;
  float fStack_1f38;
  float fStack_1f34;
  float fStack_1f30;
  float fStack_1f2c;
  float fStack_1f28;
  float local_1f20;
  float fStack_1f1c;
  float fStack_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float fStack_1f08;
  undefined4 uStack_1f04;
  undefined1 local_1ee0 [8];
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined1 local_1e80 [16];
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined1 local_1e40 [8];
  float fStack_1e38;
  float fStack_1e34;
  undefined1 local_1e20 [8];
  float fStack_1e18;
  float fStack_1e14;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  float local_1de0;
  float fStack_1ddc;
  float fStack_1dd8;
  float fStack_1dd4;
  float local_1d80;
  float fStack_1d7c;
  float fStack_1d78;
  float fStack_1d74;
  float fStack_1d70;
  float fStack_1d6c;
  float fStack_1d68;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  undefined1 local_1c80 [8];
  float fStack_1c78;
  float fStack_1c74;
  float fStack_1c70;
  float fStack_1c6c;
  float fStack_1c68;
  undefined4 uStack_1c64;
  undefined1 local_1c00 [8];
  float fStack_1bf8;
  float fStack_1bf4;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined1 local_1b80 [8];
  float fStack_1b78;
  float fStack_1b74;
  float fStack_1b70;
  float fStack_1b6c;
  float fStack_1b68;
  float fStack_1b64;
  float local_1b60;
  float fStack_1b5c;
  float fStack_1b58;
  float fStack_1b54;
  float local_1b20;
  float fStack_1b1c;
  float fStack_1b18;
  float fStack_1b14;
  float fStack_1b10;
  float fStack_1b0c;
  float fStack_1b08;
  float fStack_1b04;
  float local_1b00;
  float fStack_1afc;
  float fStack_1af8;
  float fStack_1af4;
  float fStack_1af0;
  float fStack_1aec;
  float fStack_1ae8;
  float fStack_1ae4;
  float local_1ac0;
  float fStack_1abc;
  float fStack_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  float fStack_1aa8;
  float fStack_1aa4;
  float local_19c0;
  float fStack_19bc;
  float fStack_19b8;
  float fStack_19b4;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  undefined1 local_af0 [8];
  undefined8 uStack_ae8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined8 local_a90;
  undefined8 uStack_a88;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  float local_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float local_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  float local_8c0;
  float fStack_8bc;
  float fStack_8b8;
  float fStack_8b4;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  
  local_a660 = in_RDX;
  local_a658 = in_RSI;
  if (in_R8D == 0x10) {
    local_a670 = 0;
    auVar291 = *in_RDI;
    for (; local_a670 < in_ECX; local_a670 = local_a670 + 1) {
      auVar288 = vbroadcastss_avx512f(ZEXT416(*local_a658));
      uVar26 = vcmpps_avx512f(auVar288,ZEXT1664(ZEXT816(0)),2);
      auVar139._8_4_ = 0x800000;
      auVar139._12_4_ = 0x800000;
      auVar139._0_4_ = 0x800000;
      auVar139._4_4_ = 0x800000;
      auVar139._16_4_ = 0x800000;
      auVar139._20_4_ = 0x800000;
      auVar139._24_4_ = 0x800000;
      auVar139._28_4_ = 0x800000;
      auVar139._32_4_ = 0x800000;
      auVar139._36_4_ = 0x800000;
      auVar139._40_4_ = 0x800000;
      auVar139._44_4_ = 0x800000;
      auVar139._48_4_ = 0x800000;
      auVar139._52_4_ = 0x800000;
      auVar139._56_4_ = 0x800000;
      auVar139._60_4_ = 0x800000;
      auVar289 = vmaxps_avx512f(auVar288,auVar139);
      auVar288 = vmovdqa64_avx512f(auVar289);
      auVar288 = vpsrld_avx512f(auVar288,ZEXT416(0x17));
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar177._8_4_ = -0x7f800001;
      auVar177._12_4_ = -0x7f800001;
      auVar177._0_4_ = -0x7f800001;
      auVar177._4_4_ = -0x7f800001;
      auVar177._16_4_ = -0x7f800001;
      auVar177._20_4_ = -0x7f800001;
      auVar177._24_4_ = -0x7f800001;
      auVar177._28_4_ = -0x7f800001;
      auVar177._32_4_ = -0x7f800001;
      auVar177._36_4_ = -0x7f800001;
      auVar177._40_4_ = -0x7f800001;
      auVar177._44_4_ = -0x7f800001;
      auVar177._48_4_ = -0x7f800001;
      auVar177._52_4_ = -0x7f800001;
      auVar177._56_4_ = -0x7f800001;
      auVar177._60_4_ = -0x7f800001;
      auVar290 = vmovdqa64_avx512f(auVar177);
      auVar289 = vpandd_avx512f(auVar289,auVar290);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar178._8_4_ = 0.5;
      auVar178._12_4_ = 0.5;
      auVar178._0_4_ = 0.5;
      auVar178._4_4_ = 0.5;
      auVar178._16_4_ = 0.5;
      auVar178._20_4_ = 0.5;
      auVar178._24_4_ = 0.5;
      auVar178._28_4_ = 0.5;
      auVar178._32_4_ = 0.5;
      auVar178._36_4_ = 0.5;
      auVar178._40_4_ = 0.5;
      auVar178._44_4_ = 0.5;
      auVar178._48_4_ = 0.5;
      auVar178._52_4_ = 0.5;
      auVar178._56_4_ = 0.5;
      auVar178._60_4_ = 0.5;
      auVar290 = vmovdqa64_avx512f(auVar178);
      auVar289 = vpord_avx512f(auVar289,auVar290);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar290 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar290 = vmovdqa64_avx512f(auVar290);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar290 = vmovdqa64_avx512f(auVar290);
      auVar288 = vpsubd_avx512f(auVar288,auVar290);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vcvtdq2ps_avx512f(auVar288);
      auVar134._8_4_ = 1.0;
      auVar134._12_4_ = 1.0;
      auVar134._0_4_ = 1.0;
      auVar134._4_4_ = 1.0;
      auVar134._16_4_ = 1.0;
      auVar134._20_4_ = 1.0;
      auVar134._24_4_ = 1.0;
      auVar134._28_4_ = 1.0;
      auVar134._32_4_ = 1.0;
      auVar134._36_4_ = 1.0;
      auVar134._40_4_ = 1.0;
      auVar134._44_4_ = 1.0;
      auVar134._48_4_ = 1.0;
      auVar134._52_4_ = 1.0;
      auVar134._56_4_ = 1.0;
      auVar134._60_4_ = 1.0;
      auVar288 = vaddps_avx512f(auVar288,auVar134);
      uVar27 = vcmpps_avx512f(auVar289,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      uVar30 = (ushort)uVar27;
      auVar135._8_4_ = 1.0;
      auVar135._12_4_ = 1.0;
      auVar135._0_4_ = 1.0;
      auVar135._4_4_ = 1.0;
      auVar135._16_4_ = 1.0;
      auVar135._20_4_ = 1.0;
      auVar135._24_4_ = 1.0;
      auVar135._28_4_ = 1.0;
      auVar135._32_4_ = 1.0;
      auVar135._36_4_ = 1.0;
      auVar135._40_4_ = 1.0;
      auVar135._44_4_ = 1.0;
      auVar135._48_4_ = 1.0;
      auVar135._52_4_ = 1.0;
      auVar135._56_4_ = 1.0;
      auVar135._60_4_ = 1.0;
      auVar290 = vsubps_avx512f(auVar289,auVar135);
      auVar169._8_4_ = 1.0;
      auVar169._12_4_ = 1.0;
      auVar169._0_4_ = 1.0;
      auVar169._4_4_ = 1.0;
      auVar169._16_4_ = 1.0;
      auVar169._20_4_ = 1.0;
      auVar169._24_4_ = 1.0;
      auVar169._28_4_ = 1.0;
      auVar169._32_4_ = 1.0;
      auVar169._36_4_ = 1.0;
      auVar169._40_4_ = 1.0;
      auVar169._44_4_ = 1.0;
      auVar169._48_4_ = 1.0;
      auVar169._52_4_ = 1.0;
      auVar169._56_4_ = 1.0;
      auVar169._60_4_ = 1.0;
      local_3f00 = auVar288._0_4_;
      iStack_3efc = auVar288._4_4_;
      iStack_3ef8 = auVar288._8_4_;
      iStack_3ef4 = auVar288._12_4_;
      iStack_3ef0 = auVar288._16_4_;
      iStack_3eec = auVar288._20_4_;
      iStack_3ee8 = auVar288._24_4_;
      iStack_3ee4 = auVar288._28_4_;
      iStack_3ee0 = auVar288._32_4_;
      iStack_3edc = auVar288._36_4_;
      iStack_3ed8 = auVar288._40_4_;
      iStack_3ed4 = auVar288._44_4_;
      iStack_3ed0 = auVar288._48_4_;
      iStack_3ecc = auVar288._52_4_;
      iStack_3ec8 = auVar288._56_4_;
      iStack_3ec4 = auVar288._60_4_;
      auVar288 = vsubps_avx512f(auVar288,auVar169);
      bVar4 = (bool)((byte)uVar27 & 1);
      bVar5 = (bool)((byte)(uVar30 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar30 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar30 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar30 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar30 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar30 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar30 >> 7) & 1);
      bVar12 = (byte)((ulong)uVar27 >> 8);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_51c0._4_4_ = (uint)bVar5 * auVar288._4_4_ | (uint)!bVar5 * iStack_3efc;
      local_51c0._0_4_ = (uint)bVar4 * auVar288._0_4_ | (uint)!bVar4 * local_3f00;
      local_51c0._8_4_ = (uint)bVar6 * auVar288._8_4_ | (uint)!bVar6 * iStack_3ef8;
      local_51c0._12_4_ = (uint)bVar7 * auVar288._12_4_ | (uint)!bVar7 * iStack_3ef4;
      uStack_51b0._0_4_ = (uint)bVar8 * auVar288._16_4_ | (uint)!bVar8 * iStack_3ef0;
      uStack_51b0._4_4_ = (uint)bVar9 * auVar288._20_4_ | (uint)!bVar9 * iStack_3eec;
      uStack_51a8._0_4_ = (uint)bVar10 * auVar288._24_4_ | (uint)!bVar10 * iStack_3ee8;
      uStack_51a8._4_4_ = (uint)bVar11 * auVar288._28_4_ | (uint)!bVar11 * iStack_3ee4;
      auVar19 = _local_51c0;
      uStack_51a0._0_4_ =
           (uint)(bVar12 & 1) * auVar288._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_3ee0;
      uStack_51a0._4_4_ = (uint)bVar13 * auVar288._36_4_ | (uint)!bVar13 * iStack_3edc;
      auVar281 = _local_51c0;
      uStack_5198._0_4_ = (uint)bVar14 * auVar288._40_4_ | (uint)!bVar14 * iStack_3ed8;
      uStack_5198._4_4_ = (uint)bVar15 * auVar288._44_4_ | (uint)!bVar15 * iStack_3ed4;
      auVar282 = _local_51c0;
      uStack_5190._0_4_ = (uint)bVar16 * auVar288._48_4_ | (uint)!bVar16 * iStack_3ed0;
      uStack_5190._4_4_ = (uint)bVar17 * auVar288._52_4_ | (uint)!bVar17 * iStack_3ecc;
      auVar283 = _local_51c0;
      uStack_5188._0_4_ = (uint)bVar18 * auVar288._56_4_ | (uint)!bVar18 * iStack_3ec8;
      uStack_5188._4_4_ =
           (uint)(bVar12 >> 7) * auVar288._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_3ec4;
      auVar288 = _local_51c0;
      local_34c0 = auVar290._0_4_;
      iStack_34bc = auVar290._4_4_;
      iStack_34b8 = auVar290._8_4_;
      iStack_34b4 = auVar290._12_4_;
      iStack_34b0 = auVar290._16_4_;
      iStack_34ac = auVar290._20_4_;
      iStack_34a8 = auVar290._24_4_;
      iStack_34a4 = auVar290._28_4_;
      iStack_34a0 = auVar290._32_4_;
      iStack_349c = auVar290._36_4_;
      iStack_3498 = auVar290._40_4_;
      iStack_3494 = auVar290._44_4_;
      iStack_3490 = auVar290._48_4_;
      iStack_348c = auVar290._52_4_;
      iStack_3488 = auVar290._56_4_;
      iStack_3484 = auVar290._60_4_;
      auVar289 = vaddps_avx512f(auVar290,auVar289);
      bVar4 = (bool)((byte)uVar27 & 1);
      bVar5 = (bool)((byte)(uVar30 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar30 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar30 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar30 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar30 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar30 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar30 >> 7) & 1);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_50c0._4_4_ = (uint)bVar5 * auVar289._4_4_ | (uint)!bVar5 * iStack_34bc;
      local_50c0._0_4_ = (uint)bVar4 * auVar289._0_4_ | (uint)!bVar4 * local_34c0;
      local_50c0._8_4_ = (uint)bVar6 * auVar289._8_4_ | (uint)!bVar6 * iStack_34b8;
      local_50c0._12_4_ = (uint)bVar7 * auVar289._12_4_ | (uint)!bVar7 * iStack_34b4;
      uStack_50b0._0_4_ = (uint)bVar8 * auVar289._16_4_ | (uint)!bVar8 * iStack_34b0;
      uStack_50b0._4_4_ = (uint)bVar9 * auVar289._20_4_ | (uint)!bVar9 * iStack_34ac;
      uStack_50a8._0_4_ = (uint)bVar10 * auVar289._24_4_ | (uint)!bVar10 * iStack_34a8;
      uStack_50a8._4_4_ = (uint)bVar11 * auVar289._28_4_ | (uint)!bVar11 * iStack_34a4;
      auVar293 = _local_50c0;
      uStack_50a0._0_4_ =
           (uint)(bVar12 & 1) * auVar289._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_34a0;
      uStack_50a0._4_4_ = (uint)bVar13 * auVar289._36_4_ | (uint)!bVar13 * iStack_349c;
      auVar284 = _local_50c0;
      uStack_5098._0_4_ = (uint)bVar14 * auVar289._40_4_ | (uint)!bVar14 * iStack_3498;
      uStack_5098._4_4_ = (uint)bVar15 * auVar289._44_4_ | (uint)!bVar15 * iStack_3494;
      auVar285 = _local_50c0;
      uStack_5090._0_4_ = (uint)bVar16 * auVar289._48_4_ | (uint)!bVar16 * iStack_3490;
      uStack_5090._4_4_ = (uint)bVar17 * auVar289._52_4_ | (uint)!bVar17 * iStack_348c;
      auVar286 = _local_50c0;
      uStack_5088._0_4_ = (uint)bVar18 * auVar289._56_4_ | (uint)!bVar18 * iStack_3488;
      uStack_5088._4_4_ =
           (uint)(bVar12 >> 7) * auVar289._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_3484;
      auVar289 = _local_50c0;
      uStack_50a8 = auVar293._24_8_;
      uStack_50a0 = auVar284._32_8_;
      uStack_5098 = auVar285._40_8_;
      uStack_5090 = auVar286._48_8_;
      uStack_5088 = auVar289._56_8_;
      auVar138._16_8_ = uStack_50b0;
      auVar138._0_16_ = local_50c0;
      auVar138._24_8_ = uStack_50a8;
      auVar138._32_8_ = uStack_50a0;
      auVar138._40_8_ = uStack_5098;
      auVar138._48_8_ = uStack_5090;
      auVar138._56_8_ = uStack_5088;
      auVar137._16_8_ = uStack_50b0;
      auVar137._0_16_ = local_50c0;
      auVar137._24_8_ = uStack_50a8;
      auVar137._32_8_ = uStack_50a0;
      auVar137._40_8_ = uStack_5098;
      auVar137._48_8_ = uStack_5090;
      auVar137._56_8_ = uStack_5088;
      auVar289 = vmulps_avx512f(auVar138,auVar137);
      local_52c0._8_4_ = 0.070376836;
      local_52c0._12_4_ = 0.070376836;
      local_52c0._0_4_ = 0.070376836;
      local_52c0._4_4_ = 0.070376836;
      auVar160._16_4_ = 0.070376836;
      auVar160._20_4_ = 0.070376836;
      auVar160._0_16_ = local_52c0._0_16_;
      auVar160._24_4_ = 0.070376836;
      auVar160._28_4_ = 0.070376836;
      auVar160._32_4_ = 0.070376836;
      auVar160._36_4_ = 0.070376836;
      auVar160._40_4_ = 0.070376836;
      auVar160._44_4_ = 0.070376836;
      auVar160._48_4_ = 0.070376836;
      auVar160._52_4_ = 0.070376836;
      auVar160._56_4_ = 0.070376836;
      auVar160._60_4_ = 0.070376836;
      auVar159._16_8_ = uStack_50b0;
      auVar159._0_16_ = local_50c0;
      auVar159._24_8_ = uStack_50a8;
      auVar159._32_8_ = uStack_50a0;
      auVar159._40_8_ = uStack_5098;
      auVar159._48_8_ = uStack_5090;
      auVar159._56_8_ = uStack_5088;
      auVar158._8_4_ = -0.1151461;
      auVar158._12_4_ = -0.1151461;
      auVar158._0_4_ = -0.1151461;
      auVar158._4_4_ = -0.1151461;
      auVar158._16_4_ = -0.1151461;
      auVar158._20_4_ = -0.1151461;
      auVar158._24_4_ = -0.1151461;
      auVar158._28_4_ = -0.1151461;
      auVar158._32_4_ = -0.1151461;
      auVar158._36_4_ = -0.1151461;
      auVar158._40_4_ = -0.1151461;
      auVar158._44_4_ = -0.1151461;
      auVar158._48_4_ = -0.1151461;
      auVar158._52_4_ = -0.1151461;
      auVar158._56_4_ = -0.1151461;
      auVar158._60_4_ = -0.1151461;
      auVar290 = vfmadd213ps_avx512f(auVar159,auVar160,auVar158);
      auVar157._16_8_ = uStack_50b0;
      auVar157._0_16_ = local_50c0;
      auVar157._24_8_ = uStack_50a8;
      auVar157._32_8_ = uStack_50a0;
      auVar157._40_8_ = uStack_5098;
      auVar157._48_8_ = uStack_5090;
      auVar157._56_8_ = uStack_5088;
      auVar156._8_4_ = 0.116769984;
      auVar156._12_4_ = 0.116769984;
      auVar156._0_4_ = 0.116769984;
      auVar156._4_4_ = 0.116769984;
      auVar156._16_4_ = 0.116769984;
      auVar156._20_4_ = 0.116769984;
      auVar156._24_4_ = 0.116769984;
      auVar156._28_4_ = 0.116769984;
      auVar156._32_4_ = 0.116769984;
      auVar156._36_4_ = 0.116769984;
      auVar156._40_4_ = 0.116769984;
      auVar156._44_4_ = 0.116769984;
      auVar156._48_4_ = 0.116769984;
      auVar156._52_4_ = 0.116769984;
      auVar156._56_4_ = 0.116769984;
      auVar156._60_4_ = 0.116769984;
      auVar290 = vfmadd213ps_avx512f(auVar157,auVar290,auVar156);
      auVar155._16_8_ = uStack_50b0;
      auVar155._0_16_ = local_50c0;
      auVar155._24_8_ = uStack_50a8;
      auVar155._32_8_ = uStack_50a0;
      auVar155._40_8_ = uStack_5098;
      auVar155._48_8_ = uStack_5090;
      auVar155._56_8_ = uStack_5088;
      auVar154._8_4_ = -0.12420141;
      auVar154._12_4_ = -0.12420141;
      auVar154._0_4_ = -0.12420141;
      auVar154._4_4_ = -0.12420141;
      auVar154._16_4_ = -0.12420141;
      auVar154._20_4_ = -0.12420141;
      auVar154._24_4_ = -0.12420141;
      auVar154._28_4_ = -0.12420141;
      auVar154._32_4_ = -0.12420141;
      auVar154._36_4_ = -0.12420141;
      auVar154._40_4_ = -0.12420141;
      auVar154._44_4_ = -0.12420141;
      auVar154._48_4_ = -0.12420141;
      auVar154._52_4_ = -0.12420141;
      auVar154._56_4_ = -0.12420141;
      auVar154._60_4_ = -0.12420141;
      auVar290 = vfmadd213ps_avx512f(auVar155,auVar290,auVar154);
      auVar153._16_8_ = uStack_50b0;
      auVar153._0_16_ = local_50c0;
      auVar153._24_8_ = uStack_50a8;
      auVar153._32_8_ = uStack_50a0;
      auVar153._40_8_ = uStack_5098;
      auVar153._48_8_ = uStack_5090;
      auVar153._56_8_ = uStack_5088;
      auVar152._8_4_ = 0.14249323;
      auVar152._12_4_ = 0.14249323;
      auVar152._0_4_ = 0.14249323;
      auVar152._4_4_ = 0.14249323;
      auVar152._16_4_ = 0.14249323;
      auVar152._20_4_ = 0.14249323;
      auVar152._24_4_ = 0.14249323;
      auVar152._28_4_ = 0.14249323;
      auVar152._32_4_ = 0.14249323;
      auVar152._36_4_ = 0.14249323;
      auVar152._40_4_ = 0.14249323;
      auVar152._44_4_ = 0.14249323;
      auVar152._48_4_ = 0.14249323;
      auVar152._52_4_ = 0.14249323;
      auVar152._56_4_ = 0.14249323;
      auVar152._60_4_ = 0.14249323;
      auVar290 = vfmadd213ps_avx512f(auVar153,auVar290,auVar152);
      auVar151._16_8_ = uStack_50b0;
      auVar151._0_16_ = local_50c0;
      auVar151._24_8_ = uStack_50a8;
      auVar151._32_8_ = uStack_50a0;
      auVar151._40_8_ = uStack_5098;
      auVar151._48_8_ = uStack_5090;
      auVar151._56_8_ = uStack_5088;
      auVar150._8_4_ = -0.16668057;
      auVar150._12_4_ = -0.16668057;
      auVar150._0_4_ = -0.16668057;
      auVar150._4_4_ = -0.16668057;
      auVar150._16_4_ = -0.16668057;
      auVar150._20_4_ = -0.16668057;
      auVar150._24_4_ = -0.16668057;
      auVar150._28_4_ = -0.16668057;
      auVar150._32_4_ = -0.16668057;
      auVar150._36_4_ = -0.16668057;
      auVar150._40_4_ = -0.16668057;
      auVar150._44_4_ = -0.16668057;
      auVar150._48_4_ = -0.16668057;
      auVar150._52_4_ = -0.16668057;
      auVar150._56_4_ = -0.16668057;
      auVar150._60_4_ = -0.16668057;
      auVar290 = vfmadd213ps_avx512f(auVar151,auVar290,auVar150);
      auVar149._16_8_ = uStack_50b0;
      auVar149._0_16_ = local_50c0;
      auVar149._24_8_ = uStack_50a8;
      auVar149._32_8_ = uStack_50a0;
      auVar149._40_8_ = uStack_5098;
      auVar149._48_8_ = uStack_5090;
      auVar149._56_8_ = uStack_5088;
      auVar148._8_4_ = 0.20000714;
      auVar148._12_4_ = 0.20000714;
      auVar148._0_4_ = 0.20000714;
      auVar148._4_4_ = 0.20000714;
      auVar148._16_4_ = 0.20000714;
      auVar148._20_4_ = 0.20000714;
      auVar148._24_4_ = 0.20000714;
      auVar148._28_4_ = 0.20000714;
      auVar148._32_4_ = 0.20000714;
      auVar148._36_4_ = 0.20000714;
      auVar148._40_4_ = 0.20000714;
      auVar148._44_4_ = 0.20000714;
      auVar148._48_4_ = 0.20000714;
      auVar148._52_4_ = 0.20000714;
      auVar148._56_4_ = 0.20000714;
      auVar148._60_4_ = 0.20000714;
      auVar290 = vfmadd213ps_avx512f(auVar149,auVar290,auVar148);
      auVar147._16_8_ = uStack_50b0;
      auVar147._0_16_ = local_50c0;
      auVar147._24_8_ = uStack_50a8;
      auVar147._32_8_ = uStack_50a0;
      auVar147._40_8_ = uStack_5098;
      auVar147._48_8_ = uStack_5090;
      auVar147._56_8_ = uStack_5088;
      auVar146._8_4_ = -0.24999994;
      auVar146._12_4_ = -0.24999994;
      auVar146._0_4_ = -0.24999994;
      auVar146._4_4_ = -0.24999994;
      auVar146._16_4_ = -0.24999994;
      auVar146._20_4_ = -0.24999994;
      auVar146._24_4_ = -0.24999994;
      auVar146._28_4_ = -0.24999994;
      auVar146._32_4_ = -0.24999994;
      auVar146._36_4_ = -0.24999994;
      auVar146._40_4_ = -0.24999994;
      auVar146._44_4_ = -0.24999994;
      auVar146._48_4_ = -0.24999994;
      auVar146._52_4_ = -0.24999994;
      auVar146._56_4_ = -0.24999994;
      auVar146._60_4_ = -0.24999994;
      auVar290 = vfmadd213ps_avx512f(auVar147,auVar290,auVar146);
      auVar145._16_8_ = uStack_50b0;
      auVar145._0_16_ = local_50c0;
      auVar145._24_8_ = uStack_50a8;
      auVar145._32_8_ = uStack_50a0;
      auVar145._40_8_ = uStack_5098;
      auVar145._48_8_ = uStack_5090;
      auVar145._56_8_ = uStack_5088;
      auVar144._8_4_ = 0.3333333;
      auVar144._12_4_ = 0.3333333;
      auVar144._0_4_ = 0.3333333;
      auVar144._4_4_ = 0.3333333;
      auVar144._16_4_ = 0.3333333;
      auVar144._20_4_ = 0.3333333;
      auVar144._24_4_ = 0.3333333;
      auVar144._28_4_ = 0.3333333;
      auVar144._32_4_ = 0.3333333;
      auVar144._36_4_ = 0.3333333;
      auVar144._40_4_ = 0.3333333;
      auVar144._44_4_ = 0.3333333;
      auVar144._48_4_ = 0.3333333;
      auVar144._52_4_ = 0.3333333;
      auVar144._56_4_ = 0.3333333;
      auVar144._60_4_ = 0.3333333;
      auVar290 = vfmadd213ps_avx512f(auVar145,auVar290,auVar144);
      auVar136._16_8_ = uStack_50b0;
      auVar136._0_16_ = local_50c0;
      auVar136._24_8_ = uStack_50a8;
      auVar136._32_8_ = uStack_50a0;
      auVar136._40_8_ = uStack_5098;
      auVar136._48_8_ = uStack_5090;
      auVar136._56_8_ = uStack_5088;
      auVar290 = vmulps_avx512f(auVar290,auVar136);
      auVar290 = vmulps_avx512f(auVar290,auVar289);
      uStack_51a8 = auVar19._24_8_;
      uStack_51a0 = auVar281._32_8_;
      uStack_5198 = auVar282._40_8_;
      uStack_5190 = auVar283._48_8_;
      uStack_5188 = auVar288._56_8_;
      auVar143._16_8_ = uStack_51b0;
      auVar143._0_16_ = local_51c0;
      auVar143._24_8_ = uStack_51a8;
      auVar143._32_8_ = uStack_51a0;
      auVar143._40_8_ = uStack_5198;
      auVar143._48_8_ = uStack_5190;
      auVar143._56_8_ = uStack_5188;
      auVar142._8_4_ = -0.00021219444;
      auVar142._12_4_ = -0.00021219444;
      auVar142._0_4_ = -0.00021219444;
      auVar142._4_4_ = -0.00021219444;
      auVar142._16_4_ = -0.00021219444;
      auVar142._20_4_ = -0.00021219444;
      auVar142._24_4_ = -0.00021219444;
      auVar142._28_4_ = -0.00021219444;
      auVar142._32_4_ = -0.00021219444;
      auVar142._36_4_ = -0.00021219444;
      auVar142._40_4_ = -0.00021219444;
      auVar142._44_4_ = -0.00021219444;
      auVar142._48_4_ = -0.00021219444;
      auVar142._52_4_ = -0.00021219444;
      auVar142._56_4_ = -0.00021219444;
      auVar142._60_4_ = -0.00021219444;
      auVar288 = vfmadd213ps_avx512f(auVar142,auVar143,auVar290);
      auVar171._8_4_ = 0.5;
      auVar171._12_4_ = 0.5;
      auVar171._0_4_ = 0.5;
      auVar171._4_4_ = 0.5;
      auVar171._16_4_ = 0.5;
      auVar171._20_4_ = 0.5;
      auVar171._24_4_ = 0.5;
      auVar171._28_4_ = 0.5;
      auVar171._32_4_ = 0.5;
      auVar171._36_4_ = 0.5;
      auVar171._40_4_ = 0.5;
      auVar171._44_4_ = 0.5;
      auVar171._48_4_ = 0.5;
      auVar171._52_4_ = 0.5;
      auVar171._56_4_ = 0.5;
      auVar171._60_4_ = 0.5;
      auVar288 = vfnmadd213ps_avx512f(auVar171,auVar289,auVar288);
      auVar133._16_8_ = uStack_50b0;
      auVar133._0_16_ = local_50c0;
      auVar133._24_8_ = uStack_50a8;
      auVar133._32_8_ = uStack_50a0;
      auVar133._40_8_ = uStack_5098;
      auVar133._48_8_ = uStack_5090;
      auVar133._56_8_ = uStack_5088;
      auVar288 = vaddps_avx512f(auVar133,auVar288);
      auVar141._16_8_ = uStack_51b0;
      auVar141._0_16_ = local_51c0;
      auVar141._24_8_ = uStack_51a8;
      auVar141._32_8_ = uStack_51a0;
      auVar141._40_8_ = uStack_5198;
      auVar141._48_8_ = uStack_5190;
      auVar141._56_8_ = uStack_5188;
      auVar140._8_4_ = 0.6933594;
      auVar140._12_4_ = 0.6933594;
      auVar140._0_4_ = 0.6933594;
      auVar140._4_4_ = 0.6933594;
      auVar140._16_4_ = 0.6933594;
      auVar140._20_4_ = 0.6933594;
      auVar140._24_4_ = 0.6933594;
      auVar140._28_4_ = 0.6933594;
      auVar140._32_4_ = 0.6933594;
      auVar140._36_4_ = 0.6933594;
      auVar140._40_4_ = 0.6933594;
      auVar140._44_4_ = 0.6933594;
      auVar140._48_4_ = 0.6933594;
      auVar140._52_4_ = 0.6933594;
      auVar140._56_4_ = 0.6933594;
      auVar140._60_4_ = 0.6933594;
      auVar289 = vfmadd213ps_avx512f(auVar140,auVar141,auVar288);
      auVar288 = vpmovm2d_avx512dq(uVar26 & 0xffff);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vpord_avx512f(auVar289,auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmulps_avx512f(auVar291,auVar288);
      auVar290._8_4_ = 88.37626;
      auVar290._12_4_ = 88.37626;
      auVar290._0_4_ = 88.37626;
      auVar290._4_4_ = 88.37626;
      auVar290._16_4_ = 88.37626;
      auVar290._20_4_ = 88.37626;
      auVar290._24_4_ = 88.37626;
      auVar290._28_4_ = 88.37626;
      auVar290._32_4_ = 88.37626;
      auVar290._36_4_ = 88.37626;
      auVar290._40_4_ = 88.37626;
      auVar290._44_4_ = 88.37626;
      auVar290._48_4_ = 88.37626;
      auVar290._52_4_ = 88.37626;
      auVar290._56_4_ = 88.37626;
      auVar290._60_4_ = 88.37626;
      auVar288 = vminps_avx512f(auVar288,auVar290);
      auVar289._8_4_ = -88.37626;
      auVar289._12_4_ = -88.37626;
      auVar289._0_4_ = -88.37626;
      auVar289._4_4_ = -88.37626;
      auVar289._16_4_ = -88.37626;
      auVar289._20_4_ = -88.37626;
      auVar289._24_4_ = -88.37626;
      auVar289._28_4_ = -88.37626;
      auVar289._32_4_ = -88.37626;
      auVar289._36_4_ = -88.37626;
      auVar289._40_4_ = -88.37626;
      auVar289._44_4_ = -88.37626;
      auVar289._48_4_ = -88.37626;
      auVar289._52_4_ = -88.37626;
      auVar289._56_4_ = -88.37626;
      auVar289._60_4_ = -88.37626;
      auVar289 = vmaxps_avx512f(auVar288,auVar289);
      auVar168._8_4_ = 1.442695;
      auVar168._12_4_ = 1.442695;
      auVar168._0_4_ = 1.442695;
      auVar168._4_4_ = 1.442695;
      auVar168._16_4_ = 1.442695;
      auVar168._20_4_ = 1.442695;
      auVar168._24_4_ = 1.442695;
      auVar168._28_4_ = 1.442695;
      auVar168._32_4_ = 1.442695;
      auVar168._36_4_ = 1.442695;
      auVar168._40_4_ = 1.442695;
      auVar168._44_4_ = 1.442695;
      auVar168._48_4_ = 1.442695;
      auVar168._52_4_ = 1.442695;
      auVar168._56_4_ = 1.442695;
      auVar168._60_4_ = 1.442695;
      auVar167._8_4_ = 0.5;
      auVar167._12_4_ = 0.5;
      auVar167._0_4_ = 0.5;
      auVar167._4_4_ = 0.5;
      auVar167._16_4_ = 0.5;
      auVar167._20_4_ = 0.5;
      auVar167._24_4_ = 0.5;
      auVar167._28_4_ = 0.5;
      auVar167._32_4_ = 0.5;
      auVar167._36_4_ = 0.5;
      auVar167._40_4_ = 0.5;
      auVar167._44_4_ = 0.5;
      auVar167._48_4_ = 0.5;
      auVar167._52_4_ = 0.5;
      auVar167._56_4_ = 0.5;
      auVar167._60_4_ = 0.5;
      auVar288 = vfmadd213ps_avx512f(auVar168,auVar289,auVar167);
      auVar290 = vrndscaleps_avx512f(auVar288,1);
      uVar27 = vcmpps_avx512f(auVar288,auVar290,1);
      uVar30 = (ushort)uVar27;
      auVar170._8_4_ = 1.0;
      auVar170._12_4_ = 1.0;
      auVar170._0_4_ = 1.0;
      auVar170._4_4_ = 1.0;
      auVar170._16_4_ = 1.0;
      auVar170._20_4_ = 1.0;
      auVar170._24_4_ = 1.0;
      auVar170._28_4_ = 1.0;
      auVar170._32_4_ = 1.0;
      auVar170._36_4_ = 1.0;
      auVar170._40_4_ = 1.0;
      auVar170._44_4_ = 1.0;
      auVar170._48_4_ = 1.0;
      auVar170._52_4_ = 1.0;
      auVar170._56_4_ = 1.0;
      auVar170._60_4_ = 1.0;
      local_3d80 = auVar290._0_4_;
      iStack_3d7c = auVar290._4_4_;
      iStack_3d78 = auVar290._8_4_;
      iStack_3d74 = auVar290._12_4_;
      iStack_3d70 = auVar290._16_4_;
      iStack_3d6c = auVar290._20_4_;
      iStack_3d68 = auVar290._24_4_;
      iStack_3d64 = auVar290._28_4_;
      iStack_3d60 = auVar290._32_4_;
      iStack_3d5c = auVar290._36_4_;
      iStack_3d58 = auVar290._40_4_;
      iStack_3d54 = auVar290._44_4_;
      iStack_3d50 = auVar290._48_4_;
      iStack_3d4c = auVar290._52_4_;
      iStack_3d48 = auVar290._56_4_;
      iStack_3d44 = auVar290._60_4_;
      auVar288 = vsubps_avx512f(auVar290,auVar170);
      bVar4 = (bool)((byte)uVar27 & 1);
      bVar5 = (bool)((byte)(uVar30 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar30 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar30 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar30 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar30 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar30 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar30 >> 7) & 1);
      bVar12 = (byte)((ulong)uVar27 >> 8);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_5600._4_4_ = (uint)bVar5 * auVar288._4_4_ | (uint)!bVar5 * iStack_3d7c;
      local_5600._0_4_ = (uint)bVar4 * auVar288._0_4_ | (uint)!bVar4 * local_3d80;
      local_5600._8_4_ = (uint)bVar6 * auVar288._8_4_ | (uint)!bVar6 * iStack_3d78;
      local_5600._12_4_ = (uint)bVar7 * auVar288._12_4_ | (uint)!bVar7 * iStack_3d74;
      uStack_55f0._0_4_ = (uint)bVar8 * auVar288._16_4_ | (uint)!bVar8 * iStack_3d70;
      uStack_55f0._4_4_ = (uint)bVar9 * auVar288._20_4_ | (uint)!bVar9 * iStack_3d6c;
      uStack_55e8._0_4_ = (uint)bVar10 * auVar288._24_4_ | (uint)!bVar10 * iStack_3d68;
      uStack_55e8._4_4_ = (uint)bVar11 * auVar288._28_4_ | (uint)!bVar11 * iStack_3d64;
      auVar19 = _local_5600;
      uStack_55e0._0_4_ =
           (uint)(bVar12 & 1) * auVar288._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_3d60;
      uStack_55e0._4_4_ = (uint)bVar13 * auVar288._36_4_ | (uint)!bVar13 * iStack_3d5c;
      auVar281 = _local_5600;
      uStack_55d8._0_4_ = (uint)bVar14 * auVar288._40_4_ | (uint)!bVar14 * iStack_3d58;
      uStack_55d8._4_4_ = (uint)bVar15 * auVar288._44_4_ | (uint)!bVar15 * iStack_3d54;
      auVar282 = _local_5600;
      uStack_55d0._0_4_ = (uint)bVar16 * auVar288._48_4_ | (uint)!bVar16 * iStack_3d50;
      uStack_55d0._4_4_ = (uint)bVar17 * auVar288._52_4_ | (uint)!bVar17 * iStack_3d4c;
      auVar283 = _local_5600;
      uStack_55c8._0_4_ = (uint)bVar18 * auVar288._56_4_ | (uint)!bVar18 * iStack_3d48;
      uStack_55c8._4_4_ =
           (uint)(bVar12 >> 7) * auVar288._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_3d44;
      auVar288 = _local_5600;
      uStack_55e8 = auVar19._24_8_;
      uStack_55e0 = auVar281._32_8_;
      uStack_55d8 = auVar282._40_8_;
      uStack_55d0 = auVar283._48_8_;
      uStack_55c8 = auVar288._56_8_;
      auVar175._16_8_ = uStack_55f0;
      auVar175._0_16_ = local_5600;
      auVar175._24_8_ = uStack_55e8;
      auVar175._32_8_ = uStack_55e0;
      auVar175._40_8_ = uStack_55d8;
      auVar175._48_8_ = uStack_55d0;
      auVar175._56_8_ = uStack_55c8;
      auVar174._8_4_ = 0.6933594;
      auVar174._12_4_ = 0.6933594;
      auVar174._0_4_ = 0.6933594;
      auVar174._4_4_ = 0.6933594;
      auVar174._16_4_ = 0.6933594;
      auVar174._20_4_ = 0.6933594;
      auVar174._24_4_ = 0.6933594;
      auVar174._28_4_ = 0.6933594;
      auVar174._32_4_ = 0.6933594;
      auVar174._36_4_ = 0.6933594;
      auVar174._40_4_ = 0.6933594;
      auVar174._44_4_ = 0.6933594;
      auVar174._48_4_ = 0.6933594;
      auVar174._52_4_ = 0.6933594;
      auVar174._56_4_ = 0.6933594;
      auVar174._60_4_ = 0.6933594;
      auVar288 = vfnmadd213ps_avx512f(auVar174,auVar175,auVar289);
      auVar173._16_8_ = uStack_55f0;
      auVar173._0_16_ = local_5600;
      auVar173._24_8_ = uStack_55e8;
      auVar173._32_8_ = uStack_55e0;
      auVar173._40_8_ = uStack_55d8;
      auVar173._48_8_ = uStack_55d0;
      auVar173._56_8_ = uStack_55c8;
      auVar172._8_4_ = -0.00021219444;
      auVar172._12_4_ = -0.00021219444;
      auVar172._0_4_ = -0.00021219444;
      auVar172._4_4_ = -0.00021219444;
      auVar172._16_4_ = -0.00021219444;
      auVar172._20_4_ = -0.00021219444;
      auVar172._24_4_ = -0.00021219444;
      auVar172._28_4_ = -0.00021219444;
      auVar172._32_4_ = -0.00021219444;
      auVar172._36_4_ = -0.00021219444;
      auVar172._40_4_ = -0.00021219444;
      auVar172._44_4_ = -0.00021219444;
      auVar172._48_4_ = -0.00021219444;
      auVar172._52_4_ = -0.00021219444;
      auVar172._56_4_ = -0.00021219444;
      auVar172._60_4_ = -0.00021219444;
      auVar288 = vfnmadd213ps_avx512f(auVar172,auVar173,auVar288);
      auVar289 = vmulps_avx512f(auVar288,auVar288);
      uStack_56f8._0_4_ = 0.00019875691;
      uStack_56f8._4_4_ = 0.00019875691;
      local_5700._0_4_ = 0.00019875691;
      local_5700._4_4_ = 0.00019875691;
      auVar166._16_4_ = 0.00019875691;
      auVar166._20_4_ = 0.00019875691;
      auVar166._0_16_ = _local_5700;
      auVar166._24_4_ = 0.00019875691;
      auVar166._28_4_ = 0.00019875691;
      auVar166._32_4_ = 0.00019875691;
      auVar166._36_4_ = 0.00019875691;
      auVar166._40_4_ = 0.00019875691;
      auVar166._44_4_ = 0.00019875691;
      auVar166._48_4_ = 0.00019875691;
      auVar166._52_4_ = 0.00019875691;
      auVar166._56_4_ = 0.00019875691;
      auVar166._60_4_ = 0.00019875691;
      auVar165._8_4_ = 0.0013981999;
      auVar165._12_4_ = 0.0013981999;
      auVar165._0_4_ = 0.0013981999;
      auVar165._4_4_ = 0.0013981999;
      auVar165._16_4_ = 0.0013981999;
      auVar165._20_4_ = 0.0013981999;
      auVar165._24_4_ = 0.0013981999;
      auVar165._28_4_ = 0.0013981999;
      auVar165._32_4_ = 0.0013981999;
      auVar165._36_4_ = 0.0013981999;
      auVar165._40_4_ = 0.0013981999;
      auVar165._44_4_ = 0.0013981999;
      auVar165._48_4_ = 0.0013981999;
      auVar165._52_4_ = 0.0013981999;
      auVar165._56_4_ = 0.0013981999;
      auVar165._60_4_ = 0.0013981999;
      auVar290 = vfmadd213ps_avx512f(auVar288,auVar166,auVar165);
      auVar164._8_4_ = 0.008333452;
      auVar164._12_4_ = 0.008333452;
      auVar164._0_4_ = 0.008333452;
      auVar164._4_4_ = 0.008333452;
      auVar164._16_4_ = 0.008333452;
      auVar164._20_4_ = 0.008333452;
      auVar164._24_4_ = 0.008333452;
      auVar164._28_4_ = 0.008333452;
      auVar164._32_4_ = 0.008333452;
      auVar164._36_4_ = 0.008333452;
      auVar164._40_4_ = 0.008333452;
      auVar164._44_4_ = 0.008333452;
      auVar164._48_4_ = 0.008333452;
      auVar164._52_4_ = 0.008333452;
      auVar164._56_4_ = 0.008333452;
      auVar164._60_4_ = 0.008333452;
      auVar290 = vfmadd213ps_avx512f(auVar288,auVar290,auVar164);
      auVar163._8_4_ = 0.041665796;
      auVar163._12_4_ = 0.041665796;
      auVar163._0_4_ = 0.041665796;
      auVar163._4_4_ = 0.041665796;
      auVar163._16_4_ = 0.041665796;
      auVar163._20_4_ = 0.041665796;
      auVar163._24_4_ = 0.041665796;
      auVar163._28_4_ = 0.041665796;
      auVar163._32_4_ = 0.041665796;
      auVar163._36_4_ = 0.041665796;
      auVar163._40_4_ = 0.041665796;
      auVar163._44_4_ = 0.041665796;
      auVar163._48_4_ = 0.041665796;
      auVar163._52_4_ = 0.041665796;
      auVar163._56_4_ = 0.041665796;
      auVar163._60_4_ = 0.041665796;
      auVar290 = vfmadd213ps_avx512f(auVar288,auVar290,auVar163);
      auVar162._8_4_ = 0.16666666;
      auVar162._12_4_ = 0.16666666;
      auVar162._0_4_ = 0.16666666;
      auVar162._4_4_ = 0.16666666;
      auVar162._16_4_ = 0.16666666;
      auVar162._20_4_ = 0.16666666;
      auVar162._24_4_ = 0.16666666;
      auVar162._28_4_ = 0.16666666;
      auVar162._32_4_ = 0.16666666;
      auVar162._36_4_ = 0.16666666;
      auVar162._40_4_ = 0.16666666;
      auVar162._44_4_ = 0.16666666;
      auVar162._48_4_ = 0.16666666;
      auVar162._52_4_ = 0.16666666;
      auVar162._56_4_ = 0.16666666;
      auVar162._60_4_ = 0.16666666;
      auVar290 = vfmadd213ps_avx512f(auVar288,auVar290,auVar162);
      auVar161._8_4_ = 0.5;
      auVar161._12_4_ = 0.5;
      auVar161._0_4_ = 0.5;
      auVar161._4_4_ = 0.5;
      auVar161._16_4_ = 0.5;
      auVar161._20_4_ = 0.5;
      auVar161._24_4_ = 0.5;
      auVar161._28_4_ = 0.5;
      auVar161._32_4_ = 0.5;
      auVar161._36_4_ = 0.5;
      auVar161._40_4_ = 0.5;
      auVar161._44_4_ = 0.5;
      auVar161._48_4_ = 0.5;
      auVar161._52_4_ = 0.5;
      auVar161._56_4_ = 0.5;
      auVar161._60_4_ = 0.5;
      auVar290 = vfmadd213ps_avx512f(auVar288,auVar290,auVar161);
      auVar289 = vfmadd213ps_avx512f(auVar289,auVar290,auVar288);
      auVar288._8_4_ = 1.0;
      auVar288._12_4_ = 1.0;
      auVar288._0_4_ = 1.0;
      auVar288._4_4_ = 1.0;
      auVar288._16_4_ = 1.0;
      auVar288._20_4_ = 1.0;
      auVar288._24_4_ = 1.0;
      auVar288._28_4_ = 1.0;
      auVar288._32_4_ = 1.0;
      auVar288._36_4_ = 1.0;
      auVar288._40_4_ = 1.0;
      auVar288._44_4_ = 1.0;
      auVar288._48_4_ = 1.0;
      auVar288._52_4_ = 1.0;
      auVar288._56_4_ = 1.0;
      auVar288._60_4_ = 1.0;
      auVar290 = vaddps_avx512f(auVar289,auVar288);
      auVar176._16_8_ = uStack_55f0;
      auVar176._0_16_ = local_5600;
      auVar176._24_8_ = uStack_55e8;
      auVar176._32_8_ = uStack_55e0;
      auVar176._40_8_ = uStack_55d8;
      auVar176._48_8_ = uStack_55d0;
      auVar176._56_8_ = uStack_55c8;
      auVar288 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(auVar288);
      auVar288 = vcvttps2dq_avx512f(auVar176);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar289 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar288 = vpaddd_avx512f(auVar288,auVar289);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vpslld_avx512f(auVar288,ZEXT416(0x17));
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmulps_avx512f(auVar290,auVar288);
      local_5700 = auVar288._0_8_;
      uStack_56f8 = auVar288._8_8_;
      uStack_56f0 = auVar288._16_8_;
      uStack_56e8 = auVar288._24_8_;
      uStack_56e0 = auVar288._32_8_;
      uStack_56d8 = auVar288._40_8_;
      uStack_56d0 = auVar288._48_8_;
      uStack_56c8 = auVar288._56_8_;
      *local_a660 = local_5700;
      local_a660[1] = uStack_56f8;
      local_a660[2] = uStack_56f0;
      local_a660[3] = uStack_56e8;
      local_a660[4] = uStack_56e0;
      local_a660[5] = uStack_56d8;
      local_a660[6] = uStack_56d0;
      local_a660[7] = uStack_56c8;
      local_a658 = local_a658 + 1;
      local_a660 = local_a660 + 8;
    }
  }
  if (in_R8D == 8) {
    local_a744 = 0;
    uVar27 = *(undefined8 *)*in_RDI;
    uVar31 = *(undefined8 *)(*in_RDI + 8);
    uVar29 = *(undefined8 *)(*in_RDI + 0x10);
    uVar32 = *(undefined8 *)(*in_RDI + 0x18);
    auVar291 = vinsertf64x4_avx512f
                         (ZEXT3264(*(undefined1 (*) [32])*in_RDI),*(undefined1 (*) [32])*in_RDI,1);
    for (; local_a744 + 1 < in_ECX; local_a744 = local_a744 + 2) {
      uVar1 = *local_a658;
      auVar20 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(uVar1),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(uVar1),0x30);
      auVar21 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(uVar1),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(uVar1),0x30);
      uStack_a210 = auVar21._0_8_;
      uStack_a208 = auVar21._8_8_;
      uVar1 = local_a658[1];
      auVar21 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(uVar1),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(uVar1),0x30);
      auVar22 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(uVar1),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(uVar1),0x30);
      uStack_a1d0 = auVar22._0_8_;
      uStack_a1c8 = auVar22._8_8_;
      auVar19._16_8_ = uStack_a1d0;
      auVar19._0_16_ = auVar21;
      auVar19._24_8_ = uStack_a1c8;
      auVar288 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_a208,CONCAT816(uStack_a210,auVar20))),auVar19,
                            1);
      uVar26 = vcmpps_avx512f(auVar288,ZEXT1664(ZEXT816(0)),2);
      auVar93._8_4_ = 0x800000;
      auVar93._12_4_ = 0x800000;
      auVar93._0_4_ = 0x800000;
      auVar93._4_4_ = 0x800000;
      auVar93._16_4_ = 0x800000;
      auVar93._20_4_ = 0x800000;
      auVar93._24_4_ = 0x800000;
      auVar93._28_4_ = 0x800000;
      auVar93._32_4_ = 0x800000;
      auVar93._36_4_ = 0x800000;
      auVar93._40_4_ = 0x800000;
      auVar93._44_4_ = 0x800000;
      auVar93._48_4_ = 0x800000;
      auVar93._52_4_ = 0x800000;
      auVar93._56_4_ = 0x800000;
      auVar93._60_4_ = 0x800000;
      auVar289 = vmaxps_avx512f(auVar288,auVar93);
      auVar288 = vmovdqa64_avx512f(auVar289);
      auVar288 = vpsrld_avx512f(auVar288,ZEXT416(0x17));
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar131._8_4_ = -0x7f800001;
      auVar131._12_4_ = -0x7f800001;
      auVar131._0_4_ = -0x7f800001;
      auVar131._4_4_ = -0x7f800001;
      auVar131._16_4_ = -0x7f800001;
      auVar131._20_4_ = -0x7f800001;
      auVar131._24_4_ = -0x7f800001;
      auVar131._28_4_ = -0x7f800001;
      auVar131._32_4_ = -0x7f800001;
      auVar131._36_4_ = -0x7f800001;
      auVar131._40_4_ = -0x7f800001;
      auVar131._44_4_ = -0x7f800001;
      auVar131._48_4_ = -0x7f800001;
      auVar131._52_4_ = -0x7f800001;
      auVar131._56_4_ = -0x7f800001;
      auVar131._60_4_ = -0x7f800001;
      auVar290 = vmovdqa64_avx512f(auVar131);
      auVar289 = vpandd_avx512f(auVar289,auVar290);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar132._8_4_ = 0.5;
      auVar132._12_4_ = 0.5;
      auVar132._0_4_ = 0.5;
      auVar132._4_4_ = 0.5;
      auVar132._16_4_ = 0.5;
      auVar132._20_4_ = 0.5;
      auVar132._24_4_ = 0.5;
      auVar132._28_4_ = 0.5;
      auVar132._32_4_ = 0.5;
      auVar132._36_4_ = 0.5;
      auVar132._40_4_ = 0.5;
      auVar132._44_4_ = 0.5;
      auVar132._48_4_ = 0.5;
      auVar132._52_4_ = 0.5;
      auVar132._56_4_ = 0.5;
      auVar132._60_4_ = 0.5;
      auVar290 = vmovdqa64_avx512f(auVar132);
      auVar289 = vpord_avx512f(auVar289,auVar290);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar290 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar290 = vmovdqa64_avx512f(auVar290);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar290 = vmovdqa64_avx512f(auVar290);
      auVar288 = vpsubd_avx512f(auVar288,auVar290);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vcvtdq2ps_avx512f(auVar288);
      auVar88._8_4_ = 1.0;
      auVar88._12_4_ = 1.0;
      auVar88._0_4_ = 1.0;
      auVar88._4_4_ = 1.0;
      auVar88._16_4_ = 1.0;
      auVar88._20_4_ = 1.0;
      auVar88._24_4_ = 1.0;
      auVar88._28_4_ = 1.0;
      auVar88._32_4_ = 1.0;
      auVar88._36_4_ = 1.0;
      auVar88._40_4_ = 1.0;
      auVar88._44_4_ = 1.0;
      auVar88._48_4_ = 1.0;
      auVar88._52_4_ = 1.0;
      auVar88._56_4_ = 1.0;
      auVar88._60_4_ = 1.0;
      auVar288 = vaddps_avx512f(auVar288,auVar88);
      uVar28 = vcmpps_avx512f(auVar289,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      uVar30 = (ushort)uVar28;
      auVar89._8_4_ = 1.0;
      auVar89._12_4_ = 1.0;
      auVar89._0_4_ = 1.0;
      auVar89._4_4_ = 1.0;
      auVar89._16_4_ = 1.0;
      auVar89._20_4_ = 1.0;
      auVar89._24_4_ = 1.0;
      auVar89._28_4_ = 1.0;
      auVar89._32_4_ = 1.0;
      auVar89._36_4_ = 1.0;
      auVar89._40_4_ = 1.0;
      auVar89._44_4_ = 1.0;
      auVar89._48_4_ = 1.0;
      auVar89._52_4_ = 1.0;
      auVar89._56_4_ = 1.0;
      auVar89._60_4_ = 1.0;
      auVar290 = vsubps_avx512f(auVar289,auVar89);
      auVar123._8_4_ = 1.0;
      auVar123._12_4_ = 1.0;
      auVar123._0_4_ = 1.0;
      auVar123._4_4_ = 1.0;
      auVar123._16_4_ = 1.0;
      auVar123._20_4_ = 1.0;
      auVar123._24_4_ = 1.0;
      auVar123._28_4_ = 1.0;
      auVar123._32_4_ = 1.0;
      auVar123._36_4_ = 1.0;
      auVar123._40_4_ = 1.0;
      auVar123._44_4_ = 1.0;
      auVar123._48_4_ = 1.0;
      auVar123._52_4_ = 1.0;
      auVar123._56_4_ = 1.0;
      auVar123._60_4_ = 1.0;
      local_6380 = auVar288._0_4_;
      iStack_637c = auVar288._4_4_;
      iStack_6378 = auVar288._8_4_;
      iStack_6374 = auVar288._12_4_;
      iStack_6370 = auVar288._16_4_;
      iStack_636c = auVar288._20_4_;
      iStack_6368 = auVar288._24_4_;
      iStack_6364 = auVar288._28_4_;
      iStack_6360 = auVar288._32_4_;
      iStack_635c = auVar288._36_4_;
      iStack_6358 = auVar288._40_4_;
      iStack_6354 = auVar288._44_4_;
      iStack_6350 = auVar288._48_4_;
      iStack_634c = auVar288._52_4_;
      iStack_6348 = auVar288._56_4_;
      iStack_6344 = auVar288._60_4_;
      auVar288 = vsubps_avx512f(auVar288,auVar123);
      bVar4 = (bool)((byte)uVar28 & 1);
      bVar5 = (bool)((byte)(uVar30 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar30 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar30 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar30 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar30 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar30 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar30 >> 7) & 1);
      bVar12 = (byte)((ulong)uVar28 >> 8);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_7640._4_4_ = (uint)bVar5 * auVar288._4_4_ | (uint)!bVar5 * iStack_637c;
      local_7640._0_4_ = (uint)bVar4 * auVar288._0_4_ | (uint)!bVar4 * local_6380;
      local_7640._8_4_ = (uint)bVar6 * auVar288._8_4_ | (uint)!bVar6 * iStack_6378;
      local_7640._12_4_ = (uint)bVar7 * auVar288._12_4_ | (uint)!bVar7 * iStack_6374;
      uStack_7630._0_4_ = (uint)bVar8 * auVar288._16_4_ | (uint)!bVar8 * iStack_6370;
      uStack_7630._4_4_ = (uint)bVar9 * auVar288._20_4_ | (uint)!bVar9 * iStack_636c;
      uStack_7628._0_4_ = (uint)bVar10 * auVar288._24_4_ | (uint)!bVar10 * iStack_6368;
      uStack_7628._4_4_ = (uint)bVar11 * auVar288._28_4_ | (uint)!bVar11 * iStack_6364;
      auVar19 = _local_7640;
      uStack_7620._0_4_ =
           (uint)(bVar12 & 1) * auVar288._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_6360;
      uStack_7620._4_4_ = (uint)bVar13 * auVar288._36_4_ | (uint)!bVar13 * iStack_635c;
      auVar281 = _local_7640;
      uStack_7618._0_4_ = (uint)bVar14 * auVar288._40_4_ | (uint)!bVar14 * iStack_6358;
      uStack_7618._4_4_ = (uint)bVar15 * auVar288._44_4_ | (uint)!bVar15 * iStack_6354;
      auVar282 = _local_7640;
      uStack_7610._0_4_ = (uint)bVar16 * auVar288._48_4_ | (uint)!bVar16 * iStack_6350;
      uStack_7610._4_4_ = (uint)bVar17 * auVar288._52_4_ | (uint)!bVar17 * iStack_634c;
      auVar283 = _local_7640;
      uStack_7608._0_4_ = (uint)bVar18 * auVar288._56_4_ | (uint)!bVar18 * iStack_6348;
      uStack_7608._4_4_ =
           (uint)(bVar12 >> 7) * auVar288._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_6344;
      auVar288 = _local_7640;
      local_5940 = auVar290._0_4_;
      iStack_593c = auVar290._4_4_;
      iStack_5938 = auVar290._8_4_;
      iStack_5934 = auVar290._12_4_;
      iStack_5930 = auVar290._16_4_;
      iStack_592c = auVar290._20_4_;
      iStack_5928 = auVar290._24_4_;
      iStack_5924 = auVar290._28_4_;
      iStack_5920 = auVar290._32_4_;
      iStack_591c = auVar290._36_4_;
      iStack_5918 = auVar290._40_4_;
      iStack_5914 = auVar290._44_4_;
      iStack_5910 = auVar290._48_4_;
      iStack_590c = auVar290._52_4_;
      iStack_5908 = auVar290._56_4_;
      iStack_5904 = auVar290._60_4_;
      auVar289 = vaddps_avx512f(auVar290,auVar289);
      bVar4 = (bool)((byte)uVar28 & 1);
      bVar5 = (bool)((byte)(uVar30 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar30 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar30 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar30 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar30 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar30 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar30 >> 7) & 1);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_7540._4_4_ = (uint)bVar5 * auVar289._4_4_ | (uint)!bVar5 * iStack_593c;
      local_7540._0_4_ = (uint)bVar4 * auVar289._0_4_ | (uint)!bVar4 * local_5940;
      local_7540._8_4_ = (uint)bVar6 * auVar289._8_4_ | (uint)!bVar6 * iStack_5938;
      local_7540._12_4_ = (uint)bVar7 * auVar289._12_4_ | (uint)!bVar7 * iStack_5934;
      uStack_7530._0_4_ = (uint)bVar8 * auVar289._16_4_ | (uint)!bVar8 * iStack_5930;
      uStack_7530._4_4_ = (uint)bVar9 * auVar289._20_4_ | (uint)!bVar9 * iStack_592c;
      uStack_7528._0_4_ = (uint)bVar10 * auVar289._24_4_ | (uint)!bVar10 * iStack_5928;
      uStack_7528._4_4_ = (uint)bVar11 * auVar289._28_4_ | (uint)!bVar11 * iStack_5924;
      auVar293 = _local_7540;
      uStack_7520._0_4_ =
           (uint)(bVar12 & 1) * auVar289._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_5920;
      uStack_7520._4_4_ = (uint)bVar13 * auVar289._36_4_ | (uint)!bVar13 * iStack_591c;
      auVar284 = _local_7540;
      uStack_7518._0_4_ = (uint)bVar14 * auVar289._40_4_ | (uint)!bVar14 * iStack_5918;
      uStack_7518._4_4_ = (uint)bVar15 * auVar289._44_4_ | (uint)!bVar15 * iStack_5914;
      auVar285 = _local_7540;
      uStack_7510._0_4_ = (uint)bVar16 * auVar289._48_4_ | (uint)!bVar16 * iStack_5910;
      uStack_7510._4_4_ = (uint)bVar17 * auVar289._52_4_ | (uint)!bVar17 * iStack_590c;
      auVar286 = _local_7540;
      uStack_7508._0_4_ = (uint)bVar18 * auVar289._56_4_ | (uint)!bVar18 * iStack_5908;
      uStack_7508._4_4_ =
           (uint)(bVar12 >> 7) * auVar289._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_5904;
      auVar289 = _local_7540;
      uStack_7528 = auVar293._24_8_;
      uStack_7520 = auVar284._32_8_;
      uStack_7518 = auVar285._40_8_;
      uStack_7510 = auVar286._48_8_;
      uStack_7508 = auVar289._56_8_;
      auVar92._16_8_ = uStack_7530;
      auVar92._0_16_ = local_7540;
      auVar92._24_8_ = uStack_7528;
      auVar92._32_8_ = uStack_7520;
      auVar92._40_8_ = uStack_7518;
      auVar92._48_8_ = uStack_7510;
      auVar92._56_8_ = uStack_7508;
      auVar91._16_8_ = uStack_7530;
      auVar91._0_16_ = local_7540;
      auVar91._24_8_ = uStack_7528;
      auVar91._32_8_ = uStack_7520;
      auVar91._40_8_ = uStack_7518;
      auVar91._48_8_ = uStack_7510;
      auVar91._56_8_ = uStack_7508;
      auVar289 = vmulps_avx512f(auVar92,auVar91);
      local_7740._8_4_ = 0.070376836;
      local_7740._12_4_ = 0.070376836;
      local_7740._0_4_ = 0.070376836;
      local_7740._4_4_ = 0.070376836;
      auVar114._16_4_ = 0.070376836;
      auVar114._20_4_ = 0.070376836;
      auVar114._0_16_ = local_7740._0_16_;
      auVar114._24_4_ = 0.070376836;
      auVar114._28_4_ = 0.070376836;
      auVar114._32_4_ = 0.070376836;
      auVar114._36_4_ = 0.070376836;
      auVar114._40_4_ = 0.070376836;
      auVar114._44_4_ = 0.070376836;
      auVar114._48_4_ = 0.070376836;
      auVar114._52_4_ = 0.070376836;
      auVar114._56_4_ = 0.070376836;
      auVar114._60_4_ = 0.070376836;
      auVar113._16_8_ = uStack_7530;
      auVar113._0_16_ = local_7540;
      auVar113._24_8_ = uStack_7528;
      auVar113._32_8_ = uStack_7520;
      auVar113._40_8_ = uStack_7518;
      auVar113._48_8_ = uStack_7510;
      auVar113._56_8_ = uStack_7508;
      auVar112._8_4_ = -0.1151461;
      auVar112._12_4_ = -0.1151461;
      auVar112._0_4_ = -0.1151461;
      auVar112._4_4_ = -0.1151461;
      auVar112._16_4_ = -0.1151461;
      auVar112._20_4_ = -0.1151461;
      auVar112._24_4_ = -0.1151461;
      auVar112._28_4_ = -0.1151461;
      auVar112._32_4_ = -0.1151461;
      auVar112._36_4_ = -0.1151461;
      auVar112._40_4_ = -0.1151461;
      auVar112._44_4_ = -0.1151461;
      auVar112._48_4_ = -0.1151461;
      auVar112._52_4_ = -0.1151461;
      auVar112._56_4_ = -0.1151461;
      auVar112._60_4_ = -0.1151461;
      auVar290 = vfmadd213ps_avx512f(auVar113,auVar114,auVar112);
      auVar111._16_8_ = uStack_7530;
      auVar111._0_16_ = local_7540;
      auVar111._24_8_ = uStack_7528;
      auVar111._32_8_ = uStack_7520;
      auVar111._40_8_ = uStack_7518;
      auVar111._48_8_ = uStack_7510;
      auVar111._56_8_ = uStack_7508;
      auVar110._8_4_ = 0.116769984;
      auVar110._12_4_ = 0.116769984;
      auVar110._0_4_ = 0.116769984;
      auVar110._4_4_ = 0.116769984;
      auVar110._16_4_ = 0.116769984;
      auVar110._20_4_ = 0.116769984;
      auVar110._24_4_ = 0.116769984;
      auVar110._28_4_ = 0.116769984;
      auVar110._32_4_ = 0.116769984;
      auVar110._36_4_ = 0.116769984;
      auVar110._40_4_ = 0.116769984;
      auVar110._44_4_ = 0.116769984;
      auVar110._48_4_ = 0.116769984;
      auVar110._52_4_ = 0.116769984;
      auVar110._56_4_ = 0.116769984;
      auVar110._60_4_ = 0.116769984;
      auVar290 = vfmadd213ps_avx512f(auVar111,auVar290,auVar110);
      auVar109._16_8_ = uStack_7530;
      auVar109._0_16_ = local_7540;
      auVar109._24_8_ = uStack_7528;
      auVar109._32_8_ = uStack_7520;
      auVar109._40_8_ = uStack_7518;
      auVar109._48_8_ = uStack_7510;
      auVar109._56_8_ = uStack_7508;
      auVar108._8_4_ = -0.12420141;
      auVar108._12_4_ = -0.12420141;
      auVar108._0_4_ = -0.12420141;
      auVar108._4_4_ = -0.12420141;
      auVar108._16_4_ = -0.12420141;
      auVar108._20_4_ = -0.12420141;
      auVar108._24_4_ = -0.12420141;
      auVar108._28_4_ = -0.12420141;
      auVar108._32_4_ = -0.12420141;
      auVar108._36_4_ = -0.12420141;
      auVar108._40_4_ = -0.12420141;
      auVar108._44_4_ = -0.12420141;
      auVar108._48_4_ = -0.12420141;
      auVar108._52_4_ = -0.12420141;
      auVar108._56_4_ = -0.12420141;
      auVar108._60_4_ = -0.12420141;
      auVar290 = vfmadd213ps_avx512f(auVar109,auVar290,auVar108);
      auVar107._16_8_ = uStack_7530;
      auVar107._0_16_ = local_7540;
      auVar107._24_8_ = uStack_7528;
      auVar107._32_8_ = uStack_7520;
      auVar107._40_8_ = uStack_7518;
      auVar107._48_8_ = uStack_7510;
      auVar107._56_8_ = uStack_7508;
      auVar106._8_4_ = 0.14249323;
      auVar106._12_4_ = 0.14249323;
      auVar106._0_4_ = 0.14249323;
      auVar106._4_4_ = 0.14249323;
      auVar106._16_4_ = 0.14249323;
      auVar106._20_4_ = 0.14249323;
      auVar106._24_4_ = 0.14249323;
      auVar106._28_4_ = 0.14249323;
      auVar106._32_4_ = 0.14249323;
      auVar106._36_4_ = 0.14249323;
      auVar106._40_4_ = 0.14249323;
      auVar106._44_4_ = 0.14249323;
      auVar106._48_4_ = 0.14249323;
      auVar106._52_4_ = 0.14249323;
      auVar106._56_4_ = 0.14249323;
      auVar106._60_4_ = 0.14249323;
      auVar290 = vfmadd213ps_avx512f(auVar107,auVar290,auVar106);
      auVar105._16_8_ = uStack_7530;
      auVar105._0_16_ = local_7540;
      auVar105._24_8_ = uStack_7528;
      auVar105._32_8_ = uStack_7520;
      auVar105._40_8_ = uStack_7518;
      auVar105._48_8_ = uStack_7510;
      auVar105._56_8_ = uStack_7508;
      auVar104._8_4_ = -0.16668057;
      auVar104._12_4_ = -0.16668057;
      auVar104._0_4_ = -0.16668057;
      auVar104._4_4_ = -0.16668057;
      auVar104._16_4_ = -0.16668057;
      auVar104._20_4_ = -0.16668057;
      auVar104._24_4_ = -0.16668057;
      auVar104._28_4_ = -0.16668057;
      auVar104._32_4_ = -0.16668057;
      auVar104._36_4_ = -0.16668057;
      auVar104._40_4_ = -0.16668057;
      auVar104._44_4_ = -0.16668057;
      auVar104._48_4_ = -0.16668057;
      auVar104._52_4_ = -0.16668057;
      auVar104._56_4_ = -0.16668057;
      auVar104._60_4_ = -0.16668057;
      auVar290 = vfmadd213ps_avx512f(auVar105,auVar290,auVar104);
      auVar103._16_8_ = uStack_7530;
      auVar103._0_16_ = local_7540;
      auVar103._24_8_ = uStack_7528;
      auVar103._32_8_ = uStack_7520;
      auVar103._40_8_ = uStack_7518;
      auVar103._48_8_ = uStack_7510;
      auVar103._56_8_ = uStack_7508;
      auVar102._8_4_ = 0.20000714;
      auVar102._12_4_ = 0.20000714;
      auVar102._0_4_ = 0.20000714;
      auVar102._4_4_ = 0.20000714;
      auVar102._16_4_ = 0.20000714;
      auVar102._20_4_ = 0.20000714;
      auVar102._24_4_ = 0.20000714;
      auVar102._28_4_ = 0.20000714;
      auVar102._32_4_ = 0.20000714;
      auVar102._36_4_ = 0.20000714;
      auVar102._40_4_ = 0.20000714;
      auVar102._44_4_ = 0.20000714;
      auVar102._48_4_ = 0.20000714;
      auVar102._52_4_ = 0.20000714;
      auVar102._56_4_ = 0.20000714;
      auVar102._60_4_ = 0.20000714;
      auVar290 = vfmadd213ps_avx512f(auVar103,auVar290,auVar102);
      auVar101._16_8_ = uStack_7530;
      auVar101._0_16_ = local_7540;
      auVar101._24_8_ = uStack_7528;
      auVar101._32_8_ = uStack_7520;
      auVar101._40_8_ = uStack_7518;
      auVar101._48_8_ = uStack_7510;
      auVar101._56_8_ = uStack_7508;
      auVar100._8_4_ = -0.24999994;
      auVar100._12_4_ = -0.24999994;
      auVar100._0_4_ = -0.24999994;
      auVar100._4_4_ = -0.24999994;
      auVar100._16_4_ = -0.24999994;
      auVar100._20_4_ = -0.24999994;
      auVar100._24_4_ = -0.24999994;
      auVar100._28_4_ = -0.24999994;
      auVar100._32_4_ = -0.24999994;
      auVar100._36_4_ = -0.24999994;
      auVar100._40_4_ = -0.24999994;
      auVar100._44_4_ = -0.24999994;
      auVar100._48_4_ = -0.24999994;
      auVar100._52_4_ = -0.24999994;
      auVar100._56_4_ = -0.24999994;
      auVar100._60_4_ = -0.24999994;
      auVar290 = vfmadd213ps_avx512f(auVar101,auVar290,auVar100);
      auVar99._16_8_ = uStack_7530;
      auVar99._0_16_ = local_7540;
      auVar99._24_8_ = uStack_7528;
      auVar99._32_8_ = uStack_7520;
      auVar99._40_8_ = uStack_7518;
      auVar99._48_8_ = uStack_7510;
      auVar99._56_8_ = uStack_7508;
      auVar98._8_4_ = 0.3333333;
      auVar98._12_4_ = 0.3333333;
      auVar98._0_4_ = 0.3333333;
      auVar98._4_4_ = 0.3333333;
      auVar98._16_4_ = 0.3333333;
      auVar98._20_4_ = 0.3333333;
      auVar98._24_4_ = 0.3333333;
      auVar98._28_4_ = 0.3333333;
      auVar98._32_4_ = 0.3333333;
      auVar98._36_4_ = 0.3333333;
      auVar98._40_4_ = 0.3333333;
      auVar98._44_4_ = 0.3333333;
      auVar98._48_4_ = 0.3333333;
      auVar98._52_4_ = 0.3333333;
      auVar98._56_4_ = 0.3333333;
      auVar98._60_4_ = 0.3333333;
      auVar290 = vfmadd213ps_avx512f(auVar99,auVar290,auVar98);
      auVar90._16_8_ = uStack_7530;
      auVar90._0_16_ = local_7540;
      auVar90._24_8_ = uStack_7528;
      auVar90._32_8_ = uStack_7520;
      auVar90._40_8_ = uStack_7518;
      auVar90._48_8_ = uStack_7510;
      auVar90._56_8_ = uStack_7508;
      auVar290 = vmulps_avx512f(auVar290,auVar90);
      auVar290 = vmulps_avx512f(auVar290,auVar289);
      uStack_7628 = auVar19._24_8_;
      uStack_7620 = auVar281._32_8_;
      uStack_7618 = auVar282._40_8_;
      uStack_7610 = auVar283._48_8_;
      uStack_7608 = auVar288._56_8_;
      auVar97._16_8_ = uStack_7630;
      auVar97._0_16_ = local_7640;
      auVar97._24_8_ = uStack_7628;
      auVar97._32_8_ = uStack_7620;
      auVar97._40_8_ = uStack_7618;
      auVar97._48_8_ = uStack_7610;
      auVar97._56_8_ = uStack_7608;
      auVar96._8_4_ = -0.00021219444;
      auVar96._12_4_ = -0.00021219444;
      auVar96._0_4_ = -0.00021219444;
      auVar96._4_4_ = -0.00021219444;
      auVar96._16_4_ = -0.00021219444;
      auVar96._20_4_ = -0.00021219444;
      auVar96._24_4_ = -0.00021219444;
      auVar96._28_4_ = -0.00021219444;
      auVar96._32_4_ = -0.00021219444;
      auVar96._36_4_ = -0.00021219444;
      auVar96._40_4_ = -0.00021219444;
      auVar96._44_4_ = -0.00021219444;
      auVar96._48_4_ = -0.00021219444;
      auVar96._52_4_ = -0.00021219444;
      auVar96._56_4_ = -0.00021219444;
      auVar96._60_4_ = -0.00021219444;
      auVar288 = vfmadd213ps_avx512f(auVar96,auVar97,auVar290);
      auVar125._8_4_ = 0.5;
      auVar125._12_4_ = 0.5;
      auVar125._0_4_ = 0.5;
      auVar125._4_4_ = 0.5;
      auVar125._16_4_ = 0.5;
      auVar125._20_4_ = 0.5;
      auVar125._24_4_ = 0.5;
      auVar125._28_4_ = 0.5;
      auVar125._32_4_ = 0.5;
      auVar125._36_4_ = 0.5;
      auVar125._40_4_ = 0.5;
      auVar125._44_4_ = 0.5;
      auVar125._48_4_ = 0.5;
      auVar125._52_4_ = 0.5;
      auVar125._56_4_ = 0.5;
      auVar125._60_4_ = 0.5;
      auVar288 = vfnmadd213ps_avx512f(auVar125,auVar289,auVar288);
      auVar87._16_8_ = uStack_7530;
      auVar87._0_16_ = local_7540;
      auVar87._24_8_ = uStack_7528;
      auVar87._32_8_ = uStack_7520;
      auVar87._40_8_ = uStack_7518;
      auVar87._48_8_ = uStack_7510;
      auVar87._56_8_ = uStack_7508;
      auVar288 = vaddps_avx512f(auVar87,auVar288);
      auVar95._16_8_ = uStack_7630;
      auVar95._0_16_ = local_7640;
      auVar95._24_8_ = uStack_7628;
      auVar95._32_8_ = uStack_7620;
      auVar95._40_8_ = uStack_7618;
      auVar95._48_8_ = uStack_7610;
      auVar95._56_8_ = uStack_7608;
      auVar94._8_4_ = 0.6933594;
      auVar94._12_4_ = 0.6933594;
      auVar94._0_4_ = 0.6933594;
      auVar94._4_4_ = 0.6933594;
      auVar94._16_4_ = 0.6933594;
      auVar94._20_4_ = 0.6933594;
      auVar94._24_4_ = 0.6933594;
      auVar94._28_4_ = 0.6933594;
      auVar94._32_4_ = 0.6933594;
      auVar94._36_4_ = 0.6933594;
      auVar94._40_4_ = 0.6933594;
      auVar94._44_4_ = 0.6933594;
      auVar94._48_4_ = 0.6933594;
      auVar94._52_4_ = 0.6933594;
      auVar94._56_4_ = 0.6933594;
      auVar94._60_4_ = 0.6933594;
      auVar289 = vfmadd213ps_avx512f(auVar94,auVar95,auVar288);
      auVar288 = vpmovm2d_avx512dq(uVar26 & 0xffff);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vpord_avx512f(auVar289,auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmulps_avx512f(auVar291,auVar288);
      auVar86._8_4_ = 88.37626;
      auVar86._12_4_ = 88.37626;
      auVar86._0_4_ = 88.37626;
      auVar86._4_4_ = 88.37626;
      auVar86._16_4_ = 88.37626;
      auVar86._20_4_ = 88.37626;
      auVar86._24_4_ = 88.37626;
      auVar86._28_4_ = 88.37626;
      auVar86._32_4_ = 88.37626;
      auVar86._36_4_ = 88.37626;
      auVar86._40_4_ = 88.37626;
      auVar86._44_4_ = 88.37626;
      auVar86._48_4_ = 88.37626;
      auVar86._52_4_ = 88.37626;
      auVar86._56_4_ = 88.37626;
      auVar86._60_4_ = 88.37626;
      auVar288 = vminps_avx512f(auVar288,auVar86);
      auVar85._8_4_ = -88.37626;
      auVar85._12_4_ = -88.37626;
      auVar85._0_4_ = -88.37626;
      auVar85._4_4_ = -88.37626;
      auVar85._16_4_ = -88.37626;
      auVar85._20_4_ = -88.37626;
      auVar85._24_4_ = -88.37626;
      auVar85._28_4_ = -88.37626;
      auVar85._32_4_ = -88.37626;
      auVar85._36_4_ = -88.37626;
      auVar85._40_4_ = -88.37626;
      auVar85._44_4_ = -88.37626;
      auVar85._48_4_ = -88.37626;
      auVar85._52_4_ = -88.37626;
      auVar85._56_4_ = -88.37626;
      auVar85._60_4_ = -88.37626;
      auVar289 = vmaxps_avx512f(auVar288,auVar85);
      auVar122._8_4_ = 1.442695;
      auVar122._12_4_ = 1.442695;
      auVar122._0_4_ = 1.442695;
      auVar122._4_4_ = 1.442695;
      auVar122._16_4_ = 1.442695;
      auVar122._20_4_ = 1.442695;
      auVar122._24_4_ = 1.442695;
      auVar122._28_4_ = 1.442695;
      auVar122._32_4_ = 1.442695;
      auVar122._36_4_ = 1.442695;
      auVar122._40_4_ = 1.442695;
      auVar122._44_4_ = 1.442695;
      auVar122._48_4_ = 1.442695;
      auVar122._52_4_ = 1.442695;
      auVar122._56_4_ = 1.442695;
      auVar122._60_4_ = 1.442695;
      auVar121._8_4_ = 0.5;
      auVar121._12_4_ = 0.5;
      auVar121._0_4_ = 0.5;
      auVar121._4_4_ = 0.5;
      auVar121._16_4_ = 0.5;
      auVar121._20_4_ = 0.5;
      auVar121._24_4_ = 0.5;
      auVar121._28_4_ = 0.5;
      auVar121._32_4_ = 0.5;
      auVar121._36_4_ = 0.5;
      auVar121._40_4_ = 0.5;
      auVar121._44_4_ = 0.5;
      auVar121._48_4_ = 0.5;
      auVar121._52_4_ = 0.5;
      auVar121._56_4_ = 0.5;
      auVar121._60_4_ = 0.5;
      auVar288 = vfmadd213ps_avx512f(auVar122,auVar289,auVar121);
      auVar290 = vrndscaleps_avx512f(auVar288,1);
      uVar28 = vcmpps_avx512f(auVar288,auVar290,1);
      uVar30 = (ushort)uVar28;
      auVar124._8_4_ = 1.0;
      auVar124._12_4_ = 1.0;
      auVar124._0_4_ = 1.0;
      auVar124._4_4_ = 1.0;
      auVar124._16_4_ = 1.0;
      auVar124._20_4_ = 1.0;
      auVar124._24_4_ = 1.0;
      auVar124._28_4_ = 1.0;
      auVar124._32_4_ = 1.0;
      auVar124._36_4_ = 1.0;
      auVar124._40_4_ = 1.0;
      auVar124._44_4_ = 1.0;
      auVar124._48_4_ = 1.0;
      auVar124._52_4_ = 1.0;
      auVar124._56_4_ = 1.0;
      auVar124._60_4_ = 1.0;
      local_6200 = auVar290._0_4_;
      iStack_61fc = auVar290._4_4_;
      iStack_61f8 = auVar290._8_4_;
      iStack_61f4 = auVar290._12_4_;
      iStack_61f0 = auVar290._16_4_;
      iStack_61ec = auVar290._20_4_;
      iStack_61e8 = auVar290._24_4_;
      iStack_61e4 = auVar290._28_4_;
      iStack_61e0 = auVar290._32_4_;
      iStack_61dc = auVar290._36_4_;
      iStack_61d8 = auVar290._40_4_;
      iStack_61d4 = auVar290._44_4_;
      iStack_61d0 = auVar290._48_4_;
      iStack_61cc = auVar290._52_4_;
      iStack_61c8 = auVar290._56_4_;
      iStack_61c4 = auVar290._60_4_;
      auVar288 = vsubps_avx512f(auVar290,auVar124);
      bVar4 = (bool)((byte)uVar28 & 1);
      bVar5 = (bool)((byte)(uVar30 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar30 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar30 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar30 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar30 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar30 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar30 >> 7) & 1);
      bVar12 = (byte)((ulong)uVar28 >> 8);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_7a80._4_4_ = (uint)bVar5 * auVar288._4_4_ | (uint)!bVar5 * iStack_61fc;
      local_7a80._0_4_ = (uint)bVar4 * auVar288._0_4_ | (uint)!bVar4 * local_6200;
      local_7a80._8_4_ = (uint)bVar6 * auVar288._8_4_ | (uint)!bVar6 * iStack_61f8;
      local_7a80._12_4_ = (uint)bVar7 * auVar288._12_4_ | (uint)!bVar7 * iStack_61f4;
      uStack_7a70._0_4_ = (uint)bVar8 * auVar288._16_4_ | (uint)!bVar8 * iStack_61f0;
      uStack_7a70._4_4_ = (uint)bVar9 * auVar288._20_4_ | (uint)!bVar9 * iStack_61ec;
      uStack_7a68._0_4_ = (uint)bVar10 * auVar288._24_4_ | (uint)!bVar10 * iStack_61e8;
      uStack_7a68._4_4_ = (uint)bVar11 * auVar288._28_4_ | (uint)!bVar11 * iStack_61e4;
      auVar19 = _local_7a80;
      uStack_7a60._0_4_ =
           (uint)(bVar12 & 1) * auVar288._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_61e0;
      uStack_7a60._4_4_ = (uint)bVar13 * auVar288._36_4_ | (uint)!bVar13 * iStack_61dc;
      auVar281 = _local_7a80;
      uStack_7a58._0_4_ = (uint)bVar14 * auVar288._40_4_ | (uint)!bVar14 * iStack_61d8;
      uStack_7a58._4_4_ = (uint)bVar15 * auVar288._44_4_ | (uint)!bVar15 * iStack_61d4;
      auVar282 = _local_7a80;
      uStack_7a50._0_4_ = (uint)bVar16 * auVar288._48_4_ | (uint)!bVar16 * iStack_61d0;
      uStack_7a50._4_4_ = (uint)bVar17 * auVar288._52_4_ | (uint)!bVar17 * iStack_61cc;
      auVar283 = _local_7a80;
      uStack_7a48._0_4_ = (uint)bVar18 * auVar288._56_4_ | (uint)!bVar18 * iStack_61c8;
      uStack_7a48._4_4_ =
           (uint)(bVar12 >> 7) * auVar288._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_61c4;
      auVar288 = _local_7a80;
      uStack_7a68 = auVar19._24_8_;
      uStack_7a60 = auVar281._32_8_;
      uStack_7a58 = auVar282._40_8_;
      uStack_7a50 = auVar283._48_8_;
      uStack_7a48 = auVar288._56_8_;
      auVar129._16_8_ = uStack_7a70;
      auVar129._0_16_ = local_7a80;
      auVar129._24_8_ = uStack_7a68;
      auVar129._32_8_ = uStack_7a60;
      auVar129._40_8_ = uStack_7a58;
      auVar129._48_8_ = uStack_7a50;
      auVar129._56_8_ = uStack_7a48;
      auVar128._8_4_ = 0.6933594;
      auVar128._12_4_ = 0.6933594;
      auVar128._0_4_ = 0.6933594;
      auVar128._4_4_ = 0.6933594;
      auVar128._16_4_ = 0.6933594;
      auVar128._20_4_ = 0.6933594;
      auVar128._24_4_ = 0.6933594;
      auVar128._28_4_ = 0.6933594;
      auVar128._32_4_ = 0.6933594;
      auVar128._36_4_ = 0.6933594;
      auVar128._40_4_ = 0.6933594;
      auVar128._44_4_ = 0.6933594;
      auVar128._48_4_ = 0.6933594;
      auVar128._52_4_ = 0.6933594;
      auVar128._56_4_ = 0.6933594;
      auVar128._60_4_ = 0.6933594;
      auVar288 = vfnmadd213ps_avx512f(auVar128,auVar129,auVar289);
      auVar127._16_8_ = uStack_7a70;
      auVar127._0_16_ = local_7a80;
      auVar127._24_8_ = uStack_7a68;
      auVar127._32_8_ = uStack_7a60;
      auVar127._40_8_ = uStack_7a58;
      auVar127._48_8_ = uStack_7a50;
      auVar127._56_8_ = uStack_7a48;
      auVar126._8_4_ = -0.00021219444;
      auVar126._12_4_ = -0.00021219444;
      auVar126._0_4_ = -0.00021219444;
      auVar126._4_4_ = -0.00021219444;
      auVar126._16_4_ = -0.00021219444;
      auVar126._20_4_ = -0.00021219444;
      auVar126._24_4_ = -0.00021219444;
      auVar126._28_4_ = -0.00021219444;
      auVar126._32_4_ = -0.00021219444;
      auVar126._36_4_ = -0.00021219444;
      auVar126._40_4_ = -0.00021219444;
      auVar126._44_4_ = -0.00021219444;
      auVar126._48_4_ = -0.00021219444;
      auVar126._52_4_ = -0.00021219444;
      auVar126._56_4_ = -0.00021219444;
      auVar126._60_4_ = -0.00021219444;
      auVar288 = vfnmadd213ps_avx512f(auVar126,auVar127,auVar288);
      auVar289 = vmulps_avx512f(auVar288,auVar288);
      uStack_7b78._0_4_ = 0.00019875691;
      uStack_7b78._4_4_ = 0.00019875691;
      local_7b80._0_4_ = 0.00019875691;
      local_7b80._4_4_ = 0.00019875691;
      auVar120._16_4_ = 0.00019875691;
      auVar120._20_4_ = 0.00019875691;
      auVar120._0_16_ = _local_7b80;
      auVar120._24_4_ = 0.00019875691;
      auVar120._28_4_ = 0.00019875691;
      auVar120._32_4_ = 0.00019875691;
      auVar120._36_4_ = 0.00019875691;
      auVar120._40_4_ = 0.00019875691;
      auVar120._44_4_ = 0.00019875691;
      auVar120._48_4_ = 0.00019875691;
      auVar120._52_4_ = 0.00019875691;
      auVar120._56_4_ = 0.00019875691;
      auVar120._60_4_ = 0.00019875691;
      auVar119._8_4_ = 0.0013981999;
      auVar119._12_4_ = 0.0013981999;
      auVar119._0_4_ = 0.0013981999;
      auVar119._4_4_ = 0.0013981999;
      auVar119._16_4_ = 0.0013981999;
      auVar119._20_4_ = 0.0013981999;
      auVar119._24_4_ = 0.0013981999;
      auVar119._28_4_ = 0.0013981999;
      auVar119._32_4_ = 0.0013981999;
      auVar119._36_4_ = 0.0013981999;
      auVar119._40_4_ = 0.0013981999;
      auVar119._44_4_ = 0.0013981999;
      auVar119._48_4_ = 0.0013981999;
      auVar119._52_4_ = 0.0013981999;
      auVar119._56_4_ = 0.0013981999;
      auVar119._60_4_ = 0.0013981999;
      auVar290 = vfmadd213ps_avx512f(auVar288,auVar120,auVar119);
      auVar118._8_4_ = 0.008333452;
      auVar118._12_4_ = 0.008333452;
      auVar118._0_4_ = 0.008333452;
      auVar118._4_4_ = 0.008333452;
      auVar118._16_4_ = 0.008333452;
      auVar118._20_4_ = 0.008333452;
      auVar118._24_4_ = 0.008333452;
      auVar118._28_4_ = 0.008333452;
      auVar118._32_4_ = 0.008333452;
      auVar118._36_4_ = 0.008333452;
      auVar118._40_4_ = 0.008333452;
      auVar118._44_4_ = 0.008333452;
      auVar118._48_4_ = 0.008333452;
      auVar118._52_4_ = 0.008333452;
      auVar118._56_4_ = 0.008333452;
      auVar118._60_4_ = 0.008333452;
      auVar290 = vfmadd213ps_avx512f(auVar288,auVar290,auVar118);
      auVar117._8_4_ = 0.041665796;
      auVar117._12_4_ = 0.041665796;
      auVar117._0_4_ = 0.041665796;
      auVar117._4_4_ = 0.041665796;
      auVar117._16_4_ = 0.041665796;
      auVar117._20_4_ = 0.041665796;
      auVar117._24_4_ = 0.041665796;
      auVar117._28_4_ = 0.041665796;
      auVar117._32_4_ = 0.041665796;
      auVar117._36_4_ = 0.041665796;
      auVar117._40_4_ = 0.041665796;
      auVar117._44_4_ = 0.041665796;
      auVar117._48_4_ = 0.041665796;
      auVar117._52_4_ = 0.041665796;
      auVar117._56_4_ = 0.041665796;
      auVar117._60_4_ = 0.041665796;
      auVar290 = vfmadd213ps_avx512f(auVar288,auVar290,auVar117);
      auVar116._8_4_ = 0.16666666;
      auVar116._12_4_ = 0.16666666;
      auVar116._0_4_ = 0.16666666;
      auVar116._4_4_ = 0.16666666;
      auVar116._16_4_ = 0.16666666;
      auVar116._20_4_ = 0.16666666;
      auVar116._24_4_ = 0.16666666;
      auVar116._28_4_ = 0.16666666;
      auVar116._32_4_ = 0.16666666;
      auVar116._36_4_ = 0.16666666;
      auVar116._40_4_ = 0.16666666;
      auVar116._44_4_ = 0.16666666;
      auVar116._48_4_ = 0.16666666;
      auVar116._52_4_ = 0.16666666;
      auVar116._56_4_ = 0.16666666;
      auVar116._60_4_ = 0.16666666;
      auVar290 = vfmadd213ps_avx512f(auVar288,auVar290,auVar116);
      auVar115._8_4_ = 0.5;
      auVar115._12_4_ = 0.5;
      auVar115._0_4_ = 0.5;
      auVar115._4_4_ = 0.5;
      auVar115._16_4_ = 0.5;
      auVar115._20_4_ = 0.5;
      auVar115._24_4_ = 0.5;
      auVar115._28_4_ = 0.5;
      auVar115._32_4_ = 0.5;
      auVar115._36_4_ = 0.5;
      auVar115._40_4_ = 0.5;
      auVar115._44_4_ = 0.5;
      auVar115._48_4_ = 0.5;
      auVar115._52_4_ = 0.5;
      auVar115._56_4_ = 0.5;
      auVar115._60_4_ = 0.5;
      auVar290 = vfmadd213ps_avx512f(auVar288,auVar290,auVar115);
      auVar288 = vfmadd213ps_avx512f(auVar289,auVar290,auVar288);
      auVar84._8_4_ = 1.0;
      auVar84._12_4_ = 1.0;
      auVar84._0_4_ = 1.0;
      auVar84._4_4_ = 1.0;
      auVar84._16_4_ = 1.0;
      auVar84._20_4_ = 1.0;
      auVar84._24_4_ = 1.0;
      auVar84._28_4_ = 1.0;
      auVar84._32_4_ = 1.0;
      auVar84._36_4_ = 1.0;
      auVar84._40_4_ = 1.0;
      auVar84._44_4_ = 1.0;
      auVar84._48_4_ = 1.0;
      auVar84._52_4_ = 1.0;
      auVar84._56_4_ = 1.0;
      auVar84._60_4_ = 1.0;
      auVar290 = vaddps_avx512f(auVar288,auVar84);
      auVar130._16_8_ = uStack_7a70;
      auVar130._0_16_ = local_7a80;
      auVar130._24_8_ = uStack_7a68;
      auVar130._32_8_ = uStack_7a60;
      auVar130._40_8_ = uStack_7a58;
      auVar130._48_8_ = uStack_7a50;
      auVar130._56_8_ = uStack_7a48;
      auVar288 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(auVar288);
      auVar288 = vcvttps2dq_avx512f(auVar130);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar289 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar288 = vpaddd_avx512f(auVar288,auVar289);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vpslld_avx512f(auVar288,ZEXT416(0x17));
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmulps_avx512f(auVar290,auVar288);
      local_7b80 = auVar288._0_8_;
      uStack_7b78 = auVar288._8_8_;
      uStack_7b70 = auVar288._16_8_;
      uStack_7b68 = auVar288._24_8_;
      uStack_7b60 = auVar288._32_8_;
      uStack_7b58 = auVar288._40_8_;
      uStack_7b50 = auVar288._48_8_;
      uStack_7b48 = auVar288._56_8_;
      *local_a660 = local_7b80;
      local_a660[1] = uStack_7b78;
      local_a660[2] = uStack_7b70;
      local_a660[3] = uStack_7b68;
      local_a660[4] = uStack_7b60;
      local_a660[5] = uStack_7b58;
      local_a660[6] = uStack_7b50;
      local_a660[7] = uStack_7b48;
      local_a658 = local_a658 + 2;
      local_a660 = local_a660 + 8;
    }
    for (; local_a744 < in_ECX; local_a744 = local_a744 + 1) {
      uVar1 = *local_a658;
      auVar20 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(uVar1),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(uVar1),0x30);
      auVar21 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(uVar1),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(uVar1),0x30);
      uStack_a190 = auVar21._0_8_;
      uStack_a188 = auVar21._8_8_;
      auVar277._16_8_ = uStack_a190;
      auVar277._0_16_ = auVar20;
      auVar277._24_8_ = uStack_a188;
      auVar276._16_8_ = uStack_a190;
      auVar276._0_16_ = auVar20;
      auVar276._24_8_ = uStack_a188;
      auVar19 = vcmpps_avx(auVar276,ZEXT1632(ZEXT816(0)),2);
      auVar214._8_4_ = 0x800000;
      auVar214._0_8_ = 0x80000000800000;
      auVar214._12_4_ = 0x800000;
      auVar214._16_4_ = 0x800000;
      auVar214._20_4_ = 0x800000;
      auVar214._24_4_ = 0x800000;
      auVar214._28_4_ = 0x800000;
      auVar293 = vmaxps_avx(auVar277,auVar214);
      auVar25 = vpsrld_avx2(auVar293,ZEXT416(0x17));
      auVar216._8_4_ = 0x807fffff;
      auVar216._0_8_ = 0x807fffff807fffff;
      auVar216._12_4_ = 0x807fffff;
      auVar216._16_4_ = 0x807fffff;
      auVar216._20_4_ = 0x807fffff;
      auVar216._24_4_ = 0x807fffff;
      auVar216._28_4_ = 0x807fffff;
      auVar293 = vpand_avx2(auVar293,auVar216);
      auVar240._8_4_ = 0x3f000000;
      auVar240._0_8_ = 0x3f0000003f000000;
      auVar240._12_4_ = 0x3f000000;
      auVar240._16_4_ = 0x3f000000;
      auVar240._20_4_ = 0x3f000000;
      auVar240._24_4_ = 0x3f000000;
      auVar240._28_4_ = 0x3f000000;
      auVar24 = vpor_avx2(auVar293,auVar240);
      auVar241._8_8_ = 0x7f0000007f;
      auVar241._0_8_ = 0x7f0000007f;
      auVar241._16_8_ = 0x7f0000007f;
      auVar241._24_8_ = 0x7f0000007f;
      auVar293 = vpsubd_avx2(auVar25,auVar241);
      auVar293 = vcvtdq2ps_avx(auVar293);
      local_1ac0 = auVar293._0_4_;
      fStack_1abc = auVar293._4_4_;
      fStack_1ab8 = auVar293._8_4_;
      fStack_1ab4 = auVar293._12_4_;
      fStack_1ab0 = auVar293._16_4_;
      fStack_1aac = auVar293._20_4_;
      fStack_1aa8 = auVar293._24_4_;
      fStack_1aa4 = auVar293._28_4_;
      local_1c00._4_4_ = fStack_1abc + 1.0;
      local_1c00._0_4_ = local_1ac0 + 1.0;
      fStack_1bf8 = fStack_1ab8 + 1.0;
      fStack_1bf4 = fStack_1ab4 + 1.0;
      uStack_1bf0._0_4_ = fStack_1ab0 + 1.0;
      uStack_1bf0._4_4_ = fStack_1aac + 1.0;
      uStack_1be8._0_4_ = fStack_1aa8 + 1.0;
      uStack_1be8._4_4_ = fStack_1aa4 + 1.0;
      auVar212 = _local_1c00;
      auVar297._8_4_ = 0x3f3504f3;
      auVar297._0_8_ = 0x3f3504f33f3504f3;
      auVar297._12_4_ = 0x3f3504f3;
      auVar297._16_4_ = 0x3f3504f3;
      auVar297._20_4_ = 0x3f3504f3;
      auVar297._24_4_ = 0x3f3504f3;
      auVar297._28_4_ = 0x3f3504f3;
      auVar293 = vcmpps_avx(auVar24,auVar297,1);
      auVar25 = vpand_avx2(auVar24,auVar293);
      auVar213._8_8_ = 0x3f8000003f800000;
      auVar213._0_8_ = 0x3f8000003f800000;
      auVar213._16_8_ = 0x3f8000003f800000;
      auVar213._24_8_ = 0x3f8000003f800000;
      auVar24 = vsubps_avx(auVar24,auVar213);
      uStack_1be8 = auVar212._24_8_;
      auVar215._8_8_ = 0x3f8000003f800000;
      auVar215._0_8_ = 0x3f8000003f800000;
      auVar215._16_8_ = 0x3f8000003f800000;
      auVar215._24_8_ = 0x3f8000003f800000;
      auVar293 = vpand_avx2(auVar215,auVar293);
      auVar212._16_8_ = uStack_1bf0;
      auVar212._0_16_ = _local_1c00;
      auVar212._24_8_ = uStack_1be8;
      auVar293 = vsubps_avx(auVar212,auVar293);
      local_1b00 = auVar24._0_4_;
      fStack_1afc = auVar24._4_4_;
      fStack_1af8 = auVar24._8_4_;
      fStack_1af4 = auVar24._12_4_;
      fStack_1af0 = auVar24._16_4_;
      fStack_1aec = auVar24._20_4_;
      fStack_1ae8 = auVar24._24_4_;
      fStack_1ae4 = auVar24._28_4_;
      local_1b20 = auVar25._0_4_;
      fStack_1b1c = auVar25._4_4_;
      fStack_1b18 = auVar25._8_4_;
      fStack_1b14 = auVar25._12_4_;
      fStack_1b10 = auVar25._16_4_;
      fStack_1b0c = auVar25._20_4_;
      fStack_1b08 = auVar25._24_4_;
      fStack_1b04 = auVar25._28_4_;
      local_1b80._0_4_ = local_1b00 + local_1b20;
      local_1b80._4_4_ = fStack_1afc + fStack_1b1c;
      fStack_1b78 = fStack_1af8 + fStack_1b18;
      fStack_1b74 = fStack_1af4 + fStack_1b14;
      fStack_1b70 = fStack_1af0 + fStack_1b10;
      fStack_1b6c = fStack_1aec + fStack_1b0c;
      fStack_1b68 = fStack_1ae8 + fStack_1b08;
      fStack_1b64 = fStack_1ae4 + fStack_1b04;
      fStack_1c78 = 0.070376836;
      local_1c80 = (undefined1  [8])0x3d9021bb3d9021bb;
      fStack_1c74 = 0.070376836;
      fStack_1c70 = 0.070376836;
      fStack_1c6c = 0.070376836;
      fStack_1c68 = 0.070376836;
      uStack_1c64 = 0x3d9021bb;
      auVar225._8_4_ = -0.1151461;
      auVar225._12_4_ = -0.1151461;
      auVar225._0_4_ = -0.1151461;
      auVar225._4_4_ = -0.1151461;
      auVar225._16_4_ = -0.1151461;
      auVar225._20_4_ = -0.1151461;
      auVar225._24_4_ = -0.1151461;
      auVar225._28_4_ = -0.1151461;
      auVar20 = vfmadd213ps_fma(_local_1b80,_local_1c80,auVar225);
      auVar226._8_4_ = 0.116769984;
      auVar226._12_4_ = 0.116769984;
      auVar226._0_4_ = 0.116769984;
      auVar226._4_4_ = 0.116769984;
      auVar226._16_4_ = 0.116769984;
      auVar226._20_4_ = 0.116769984;
      auVar226._24_4_ = 0.116769984;
      auVar226._28_4_ = 0.116769984;
      auVar20 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar20),auVar226);
      auVar227._8_4_ = -0.12420141;
      auVar227._12_4_ = -0.12420141;
      auVar227._0_4_ = -0.12420141;
      auVar227._4_4_ = -0.12420141;
      auVar227._16_4_ = -0.12420141;
      auVar227._20_4_ = -0.12420141;
      auVar227._24_4_ = -0.12420141;
      auVar227._28_4_ = -0.12420141;
      auVar20 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar20),auVar227);
      auVar228._8_4_ = 0.14249323;
      auVar228._12_4_ = 0.14249323;
      auVar228._0_4_ = 0.14249323;
      auVar228._4_4_ = 0.14249323;
      auVar228._16_4_ = 0.14249323;
      auVar228._20_4_ = 0.14249323;
      auVar228._24_4_ = 0.14249323;
      auVar228._28_4_ = 0.14249323;
      auVar20 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar20),auVar228);
      auVar229._8_4_ = -0.16668057;
      auVar229._12_4_ = -0.16668057;
      auVar229._0_4_ = -0.16668057;
      auVar229._4_4_ = -0.16668057;
      auVar229._16_4_ = -0.16668057;
      auVar229._20_4_ = -0.16668057;
      auVar229._24_4_ = -0.16668057;
      auVar229._28_4_ = -0.16668057;
      auVar20 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar20),auVar229);
      auVar230._8_4_ = 0.20000714;
      auVar230._12_4_ = 0.20000714;
      auVar230._0_4_ = 0.20000714;
      auVar230._4_4_ = 0.20000714;
      auVar230._16_4_ = 0.20000714;
      auVar230._20_4_ = 0.20000714;
      auVar230._24_4_ = 0.20000714;
      auVar230._28_4_ = 0.20000714;
      auVar20 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar20),auVar230);
      auVar231._8_4_ = -0.24999994;
      auVar231._12_4_ = -0.24999994;
      auVar231._0_4_ = -0.24999994;
      auVar231._4_4_ = -0.24999994;
      auVar231._16_4_ = -0.24999994;
      auVar231._20_4_ = -0.24999994;
      auVar231._24_4_ = -0.24999994;
      auVar231._28_4_ = -0.24999994;
      auVar20 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar20),auVar231);
      auVar232._8_4_ = 0.3333333;
      auVar232._12_4_ = 0.3333333;
      auVar232._0_4_ = 0.3333333;
      auVar232._4_4_ = 0.3333333;
      auVar232._16_4_ = 0.3333333;
      auVar232._20_4_ = 0.3333333;
      auVar232._24_4_ = 0.3333333;
      auVar232._28_4_ = 0.3333333;
      auVar20 = vfmadd213ps_fma(_local_1b80,ZEXT1632(auVar20),auVar232);
      local_19c0 = auVar20._0_4_;
      fStack_19bc = auVar20._4_4_;
      fStack_19b8 = auVar20._8_4_;
      fStack_19b4 = auVar20._12_4_;
      local_1c80._4_4_ =
           fStack_19bc * (float)local_1b80._4_4_ * (float)local_1b80._4_4_ * (float)local_1b80._4_4_
      ;
      local_1c80._0_4_ =
           local_19c0 * (float)local_1b80._0_4_ * (float)local_1b80._0_4_ * (float)local_1b80._0_4_;
      fStack_1c78 = fStack_19b8 * fStack_1b78 * fStack_1b78 * fStack_1b78;
      fStack_1c74 = fStack_19b4 * fStack_1b74 * fStack_1b74 * fStack_1b74;
      fStack_1c70 = fStack_1b70 * 0.0 * fStack_1b70 * fStack_1b70;
      fStack_1c6c = fStack_1b6c * 0.0 * fStack_1b6c * fStack_1b6c;
      fStack_1c68 = fStack_1b68 * 0.0 * fStack_1b68 * fStack_1b68;
      uStack_1c64 = 0;
      auVar233._8_4_ = -0.00021219444;
      auVar233._12_4_ = -0.00021219444;
      auVar233._0_4_ = -0.00021219444;
      auVar233._4_4_ = -0.00021219444;
      auVar233._16_4_ = -0.00021219444;
      auVar233._20_4_ = -0.00021219444;
      auVar233._24_4_ = -0.00021219444;
      auVar233._28_4_ = -0.00021219444;
      auVar20 = vfmadd213ps_fma(auVar233,auVar293,_local_1c80);
      auVar279._4_4_ = (float)local_1b80._4_4_ * (float)local_1b80._4_4_;
      auVar279._0_4_ = (float)local_1b80._0_4_ * (float)local_1b80._0_4_;
      auVar279._8_4_ = fStack_1b78 * fStack_1b78;
      auVar279._12_4_ = fStack_1b74 * fStack_1b74;
      auVar279._16_4_ = fStack_1b70 * fStack_1b70;
      auVar279._20_4_ = fStack_1b6c * fStack_1b6c;
      auVar279._24_4_ = fStack_1b68 * fStack_1b68;
      auVar279._28_4_ = fStack_1b64;
      auVar237._8_4_ = 0.5;
      auVar237._12_4_ = 0.5;
      auVar237._0_4_ = 0.5;
      auVar237._4_4_ = 0.5;
      auVar237._16_4_ = 0.5;
      auVar237._20_4_ = 0.5;
      auVar237._24_4_ = 0.5;
      auVar237._28_4_ = 0.5;
      auVar20 = vfnmadd213ps_fma(auVar237,auVar279,ZEXT1632(auVar20));
      local_1b60 = auVar20._0_4_;
      fStack_1b5c = auVar20._4_4_;
      fStack_1b58 = auVar20._8_4_;
      fStack_1b54 = auVar20._12_4_;
      local_1b80._4_4_ = (float)local_1b80._4_4_ + fStack_1b5c;
      local_1b80._0_4_ = (float)local_1b80._0_4_ + local_1b60;
      fStack_1b78 = fStack_1b78 + fStack_1b58;
      fStack_1b74 = fStack_1b74 + fStack_1b54;
      fStack_1b70 = fStack_1b70 + 0.0;
      fStack_1b6c = fStack_1b6c + 0.0;
      fStack_1b68 = fStack_1b68 + 0.0;
      fStack_1b64 = fStack_1b64 + 0.0;
      auVar234._8_4_ = 0.6933594;
      auVar234._12_4_ = 0.6933594;
      auVar234._0_4_ = 0.6933594;
      auVar234._4_4_ = 0.6933594;
      auVar234._16_4_ = 0.6933594;
      auVar234._20_4_ = 0.6933594;
      auVar234._24_4_ = 0.6933594;
      auVar234._28_4_ = 0.6933594;
      auVar20 = vfmadd213ps_fma(auVar234,auVar293,_local_1b80);
      auVar19 = vpor_avx2(ZEXT1632(auVar20),auVar19);
      local_1f20 = (float)uVar27;
      fStack_1f1c = (float)((ulong)uVar27 >> 0x20);
      fStack_1f18 = (float)uVar31;
      fStack_1f14 = (float)((ulong)uVar31 >> 0x20);
      fStack_1f10 = (float)uVar29;
      fStack_1f0c = (float)((ulong)uVar29 >> 0x20);
      fStack_1f08 = (float)uVar32;
      uStack_1f04 = (undefined4)((ulong)uVar32 >> 0x20);
      local_1f40 = auVar19._0_4_;
      fStack_1f3c = auVar19._4_4_;
      fStack_1f38 = auVar19._8_4_;
      fStack_1f34 = auVar19._12_4_;
      fStack_1f30 = auVar19._16_4_;
      fStack_1f2c = auVar19._20_4_;
      fStack_1f28 = auVar19._24_4_;
      local_1e20._4_4_ = fStack_1f1c * fStack_1f3c;
      local_1e20._0_4_ = local_1f20 * local_1f40;
      fStack_1e18 = fStack_1f18 * fStack_1f38;
      fStack_1e14 = fStack_1f14 * fStack_1f34;
      uStack_1e10._0_4_ = fStack_1f10 * fStack_1f30;
      uStack_1e10._4_4_ = fStack_1f0c * fStack_1f2c;
      uStack_1e08._0_4_ = fStack_1f08 * fStack_1f28;
      uStack_1e08._4_4_ = uStack_1f04;
      auVar19 = _local_1e20;
      uStack_1e08 = auVar19._24_8_;
      auVar25._16_8_ = uStack_1e10;
      auVar25._0_16_ = _local_1e20;
      auVar25._24_8_ = uStack_1e08;
      auVar24._8_4_ = 0x42b0c0a5;
      auVar24._0_8_ = 0x42b0c0a542b0c0a5;
      auVar24._12_4_ = 0x42b0c0a5;
      auVar24._16_4_ = 0x42b0c0a5;
      auVar24._20_4_ = 0x42b0c0a5;
      auVar24._24_4_ = 0x42b0c0a5;
      auVar24._28_4_ = 0x42b0c0a5;
      auVar19 = vminps_avx(auVar25,auVar24);
      auVar293._8_4_ = 0xc2b0c0a5;
      auVar293._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar293._12_4_ = 0xc2b0c0a5;
      auVar293._16_4_ = 0xc2b0c0a5;
      auVar293._20_4_ = 0xc2b0c0a5;
      auVar293._24_4_ = 0xc2b0c0a5;
      auVar293._28_4_ = 0xc2b0c0a5;
      auVar293 = vmaxps_avx(auVar19,auVar293);
      auVar219._8_4_ = 1.442695;
      auVar219._12_4_ = 1.442695;
      auVar219._0_4_ = 1.442695;
      auVar219._4_4_ = 1.442695;
      auVar219._16_4_ = 1.442695;
      auVar219._20_4_ = 1.442695;
      auVar219._24_4_ = 1.442695;
      auVar219._28_4_ = 1.442695;
      auVar218._8_4_ = 0.5;
      auVar218._12_4_ = 0.5;
      auVar218._0_4_ = 0.5;
      auVar218._4_4_ = 0.5;
      auVar218._16_4_ = 0.5;
      auVar218._20_4_ = 0.5;
      auVar218._24_4_ = 0.5;
      auVar218._28_4_ = 0.5;
      auVar20 = vfmadd213ps_fma(auVar219,auVar293,auVar218);
      auVar24 = vroundps_avx(ZEXT1632(auVar20),1);
      auVar19 = vcmpps_avx(ZEXT1632(auVar20),auVar24,1);
      auVar217._8_8_ = 0x3f8000003f800000;
      auVar217._0_8_ = 0x3f8000003f800000;
      auVar217._16_8_ = 0x3f8000003f800000;
      auVar217._24_8_ = 0x3f8000003f800000;
      auVar19 = vpand_avx2(auVar19,auVar217);
      auVar19 = vsubps_avx(auVar24,auVar19);
      auVar235._8_4_ = 0.6933594;
      auVar235._12_4_ = 0.6933594;
      auVar235._0_4_ = 0.6933594;
      auVar235._4_4_ = 0.6933594;
      auVar235._16_4_ = 0.6933594;
      auVar235._20_4_ = 0.6933594;
      auVar235._24_4_ = 0.6933594;
      auVar235._28_4_ = 0.6933594;
      auVar20 = vfnmadd213ps_fma(auVar235,auVar19,auVar293);
      auVar236._8_4_ = -0.00021219444;
      auVar236._12_4_ = -0.00021219444;
      auVar236._0_4_ = -0.00021219444;
      auVar236._4_4_ = -0.00021219444;
      auVar236._16_4_ = -0.00021219444;
      auVar236._20_4_ = -0.00021219444;
      auVar236._24_4_ = -0.00021219444;
      auVar236._28_4_ = -0.00021219444;
      auVar20 = vfnmadd213ps_fma(auVar236,auVar19,ZEXT1632(auVar20));
      auVar293 = ZEXT1632(auVar20);
      local_1d20 = auVar20._0_4_;
      fStack_1d1c = auVar20._4_4_;
      fStack_1d18 = auVar20._8_4_;
      fStack_1d14 = auVar20._12_4_;
      _local_1e40 = ZEXT1632(CONCAT412(fStack_1d14 * fStack_1d14,
                                       CONCAT48(fStack_1d18 * fStack_1d18,
                                                CONCAT44(fStack_1d1c * fStack_1d1c,
                                                         local_1d20 * local_1d20))));
      uStack_1ed8._0_4_ = 0x39506967;
      local_1ee0 = (undefined1  [8])0x3950696739506967;
      uStack_1ed8._4_4_ = 0x39506967;
      uStack_1ed0._0_4_ = 0x39506967;
      uStack_1ed0._4_4_ = 0x39506967;
      uStack_1ec8._0_4_ = 0x39506967;
      uStack_1ec8._4_4_ = 0x39506967;
      auVar220._8_4_ = 0.0013981999;
      auVar220._12_4_ = 0.0013981999;
      auVar220._0_4_ = 0.0013981999;
      auVar220._4_4_ = 0.0013981999;
      auVar220._16_4_ = 0.0013981999;
      auVar220._20_4_ = 0.0013981999;
      auVar220._24_4_ = 0.0013981999;
      auVar220._28_4_ = 0.0013981999;
      auVar20 = vfmadd213ps_fma(auVar293,_local_1ee0,auVar220);
      auVar221._8_4_ = 0.008333452;
      auVar221._12_4_ = 0.008333452;
      auVar221._0_4_ = 0.008333452;
      auVar221._4_4_ = 0.008333452;
      auVar221._16_4_ = 0.008333452;
      auVar221._20_4_ = 0.008333452;
      auVar221._24_4_ = 0.008333452;
      auVar221._28_4_ = 0.008333452;
      auVar20 = vfmadd213ps_fma(auVar293,ZEXT1632(auVar20),auVar221);
      auVar222._8_4_ = 0.041665796;
      auVar222._12_4_ = 0.041665796;
      auVar222._0_4_ = 0.041665796;
      auVar222._4_4_ = 0.041665796;
      auVar222._16_4_ = 0.041665796;
      auVar222._20_4_ = 0.041665796;
      auVar222._24_4_ = 0.041665796;
      auVar222._28_4_ = 0.041665796;
      auVar20 = vfmadd213ps_fma(auVar293,ZEXT1632(auVar20),auVar222);
      auVar223._8_4_ = 0.16666666;
      auVar223._12_4_ = 0.16666666;
      auVar223._0_4_ = 0.16666666;
      auVar223._4_4_ = 0.16666666;
      auVar223._16_4_ = 0.16666666;
      auVar223._20_4_ = 0.16666666;
      auVar223._24_4_ = 0.16666666;
      auVar223._28_4_ = 0.16666666;
      auVar20 = vfmadd213ps_fma(auVar293,ZEXT1632(auVar20),auVar223);
      auVar224._8_4_ = 0.5;
      auVar224._12_4_ = 0.5;
      auVar224._0_4_ = 0.5;
      auVar224._4_4_ = 0.5;
      auVar224._16_4_ = 0.5;
      auVar224._20_4_ = 0.5;
      auVar224._24_4_ = 0.5;
      auVar224._28_4_ = 0.5;
      auVar20 = vfmadd213ps_fma(auVar293,ZEXT1632(auVar20),auVar224);
      auVar20 = vfmadd213ps_fma(_local_1e40,ZEXT1632(auVar20),auVar293);
      local_1de0 = auVar20._0_4_;
      fStack_1ddc = auVar20._4_4_;
      fStack_1dd8 = auVar20._8_4_;
      fStack_1dd4 = auVar20._12_4_;
      local_15e0 = auVar19._0_4_;
      fStack_15dc = auVar19._4_4_;
      fStack_15d8 = auVar19._8_4_;
      fStack_15d4 = auVar19._12_4_;
      fStack_15d0 = auVar19._16_4_;
      fStack_15cc = auVar19._20_4_;
      fStack_15c8 = auVar19._24_4_;
      fStack_15c4 = auVar19._28_4_;
      local_1e80._4_4_ = (int)fStack_15dc;
      local_1e80._0_4_ = (int)local_15e0;
      local_1e80._8_4_ = (int)fStack_15d8;
      local_1e80._12_4_ = (int)fStack_15d4;
      uStack_1e70._0_4_ = (int)fStack_15d0;
      uStack_1e70._4_4_ = (int)fStack_15cc;
      uStack_1e68._0_4_ = (int)fStack_15c8;
      uStack_1e68._4_4_ = (int)fStack_15c4;
      auVar19 = _local_1e80;
      uStack_1e68 = auVar19._24_8_;
      auVar239._16_8_ = uStack_1e70;
      auVar239._0_16_ = local_1e80;
      auVar239._24_8_ = uStack_1e68;
      auVar238._8_8_ = 0x7f0000007f;
      auVar238._0_8_ = 0x7f0000007f;
      auVar238._16_8_ = 0x7f0000007f;
      auVar238._24_8_ = 0x7f0000007f;
      auVar19 = vpaddd_avx2(auVar239,auVar238);
      auVar19 = vpslld_avx2(auVar19,ZEXT416(0x17));
      local_1d80 = auVar19._0_4_;
      fStack_1d7c = auVar19._4_4_;
      fStack_1d78 = auVar19._8_4_;
      fStack_1d74 = auVar19._12_4_;
      fStack_1d70 = auVar19._16_4_;
      fStack_1d6c = auVar19._20_4_;
      fStack_1d68 = auVar19._24_4_;
      local_1ee0._4_4_ = (fStack_1ddc + 1.0) * fStack_1d7c;
      local_1ee0._0_4_ = (local_1de0 + 1.0) * local_1d80;
      uStack_1ed8._0_4_ = (fStack_1dd8 + 1.0) * fStack_1d78;
      uStack_1ed8._4_4_ = (fStack_1dd4 + 1.0) * fStack_1d74;
      uStack_1ed0._0_4_ = fStack_1d70 * 1.0;
      uStack_1ed0._4_4_ = fStack_1d6c * 1.0;
      auVar287 = _local_1ee0;
      uStack_1ec8._0_4_ = fStack_1d68 * 1.0;
      uStack_1ec8._4_4_ = 0x3f800000;
      auVar19 = _local_1ee0;
      uStack_1ed0 = auVar287._16_8_;
      uStack_1ec8 = auVar19._24_8_;
      *local_a660 = local_1ee0;
      local_a660[1] = uStack_1ed8;
      local_a660[2] = uStack_1ed0;
      local_a660[3] = uStack_1ec8;
      local_a658 = local_a658 + 1;
      local_a660 = local_a660 + 4;
    }
  }
  if (in_R8D == 4) {
    local_a8c4 = 0;
    uVar27 = *(undefined8 *)*in_RDI;
    uVar31 = *(undefined8 *)(*in_RDI + 8);
    auVar34._16_8_ = uVar27;
    auVar34._0_16_ = *(undefined1 (*) [16])*in_RDI;
    auVar34._24_8_ = uVar31;
    auVar291 = vinsertf64x4_avx512f
                         (ZEXT3264(CONCAT824(uVar31,CONCAT816(uVar27,*(undefined1 (*) [16])*in_RDI))
                                  ),auVar34,1);
    for (; local_a8c4 + 3 < in_ECX; local_a8c4 = local_a8c4 + 4) {
      uVar1 = *local_a658;
      uVar2 = local_a658[1];
      uVar3 = local_a658[2];
      auVar33._4_4_ = uVar3;
      auVar33._0_4_ = uVar3;
      auVar33._12_4_ = uVar3;
      auVar33._8_4_ = uVar3;
      uVar3 = local_a658[3];
      auVar33._20_4_ = uVar3;
      auVar33._16_4_ = uVar3;
      auVar33._28_4_ = uVar3;
      auVar33._24_4_ = uVar3;
      auVar288 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(CONCAT44(uVar2,uVar2),
                                               CONCAT816(CONCAT44(uVar2,uVar2),
                                                         CONCAT88(CONCAT44(uVar1,uVar1),
                                                                  CONCAT44(uVar1,uVar1))))),auVar33,
                            1);
      uVar26 = vcmpps_avx512f(auVar288,ZEXT1664(ZEXT816(0)),2);
      auVar44._8_4_ = 0x800000;
      auVar44._12_4_ = 0x800000;
      auVar44._0_4_ = 0x800000;
      auVar44._4_4_ = 0x800000;
      auVar44._16_4_ = 0x800000;
      auVar44._20_4_ = 0x800000;
      auVar44._24_4_ = 0x800000;
      auVar44._28_4_ = 0x800000;
      auVar44._32_4_ = 0x800000;
      auVar44._36_4_ = 0x800000;
      auVar44._40_4_ = 0x800000;
      auVar44._44_4_ = 0x800000;
      auVar44._48_4_ = 0x800000;
      auVar44._52_4_ = 0x800000;
      auVar44._56_4_ = 0x800000;
      auVar44._60_4_ = 0x800000;
      auVar289 = vmaxps_avx512f(auVar288,auVar44);
      auVar288 = vmovdqa64_avx512f(auVar289);
      auVar288 = vpsrld_avx512f(auVar288,ZEXT416(0x17));
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar82._8_4_ = -0x7f800001;
      auVar82._12_4_ = -0x7f800001;
      auVar82._0_4_ = -0x7f800001;
      auVar82._4_4_ = -0x7f800001;
      auVar82._16_4_ = -0x7f800001;
      auVar82._20_4_ = -0x7f800001;
      auVar82._24_4_ = -0x7f800001;
      auVar82._28_4_ = -0x7f800001;
      auVar82._32_4_ = -0x7f800001;
      auVar82._36_4_ = -0x7f800001;
      auVar82._40_4_ = -0x7f800001;
      auVar82._44_4_ = -0x7f800001;
      auVar82._48_4_ = -0x7f800001;
      auVar82._52_4_ = -0x7f800001;
      auVar82._56_4_ = -0x7f800001;
      auVar82._60_4_ = -0x7f800001;
      auVar290 = vmovdqa64_avx512f(auVar82);
      auVar289 = vpandd_avx512f(auVar289,auVar290);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar83._8_4_ = 0.5;
      auVar83._12_4_ = 0.5;
      auVar83._0_4_ = 0.5;
      auVar83._4_4_ = 0.5;
      auVar83._16_4_ = 0.5;
      auVar83._20_4_ = 0.5;
      auVar83._24_4_ = 0.5;
      auVar83._28_4_ = 0.5;
      auVar83._32_4_ = 0.5;
      auVar83._36_4_ = 0.5;
      auVar83._40_4_ = 0.5;
      auVar83._44_4_ = 0.5;
      auVar83._48_4_ = 0.5;
      auVar83._52_4_ = 0.5;
      auVar83._56_4_ = 0.5;
      auVar83._60_4_ = 0.5;
      auVar290 = vmovdqa64_avx512f(auVar83);
      auVar289 = vpord_avx512f(auVar289,auVar290);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar290 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar290 = vmovdqa64_avx512f(auVar290);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar290 = vmovdqa64_avx512f(auVar290);
      auVar288 = vpsubd_avx512f(auVar288,auVar290);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vcvtdq2ps_avx512f(auVar288);
      auVar39._8_4_ = 1.0;
      auVar39._12_4_ = 1.0;
      auVar39._0_4_ = 1.0;
      auVar39._4_4_ = 1.0;
      auVar39._16_4_ = 1.0;
      auVar39._20_4_ = 1.0;
      auVar39._24_4_ = 1.0;
      auVar39._28_4_ = 1.0;
      auVar39._32_4_ = 1.0;
      auVar39._36_4_ = 1.0;
      auVar39._40_4_ = 1.0;
      auVar39._44_4_ = 1.0;
      auVar39._48_4_ = 1.0;
      auVar39._52_4_ = 1.0;
      auVar39._56_4_ = 1.0;
      auVar39._60_4_ = 1.0;
      auVar288 = vaddps_avx512f(auVar288,auVar39);
      uVar29 = vcmpps_avx512f(auVar289,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      uVar30 = (ushort)uVar29;
      auVar40._8_4_ = 1.0;
      auVar40._12_4_ = 1.0;
      auVar40._0_4_ = 1.0;
      auVar40._4_4_ = 1.0;
      auVar40._16_4_ = 1.0;
      auVar40._20_4_ = 1.0;
      auVar40._24_4_ = 1.0;
      auVar40._28_4_ = 1.0;
      auVar40._32_4_ = 1.0;
      auVar40._36_4_ = 1.0;
      auVar40._40_4_ = 1.0;
      auVar40._44_4_ = 1.0;
      auVar40._48_4_ = 1.0;
      auVar40._52_4_ = 1.0;
      auVar40._56_4_ = 1.0;
      auVar40._60_4_ = 1.0;
      auVar290 = vsubps_avx512f(auVar289,auVar40);
      auVar74._8_4_ = 1.0;
      auVar74._12_4_ = 1.0;
      auVar74._0_4_ = 1.0;
      auVar74._4_4_ = 1.0;
      auVar74._16_4_ = 1.0;
      auVar74._20_4_ = 1.0;
      auVar74._24_4_ = 1.0;
      auVar74._28_4_ = 1.0;
      auVar74._32_4_ = 1.0;
      auVar74._36_4_ = 1.0;
      auVar74._40_4_ = 1.0;
      auVar74._44_4_ = 1.0;
      auVar74._48_4_ = 1.0;
      auVar74._52_4_ = 1.0;
      auVar74._56_4_ = 1.0;
      auVar74._60_4_ = 1.0;
      local_8800 = auVar288._0_4_;
      iStack_87fc = auVar288._4_4_;
      iStack_87f8 = auVar288._8_4_;
      iStack_87f4 = auVar288._12_4_;
      iStack_87f0 = auVar288._16_4_;
      iStack_87ec = auVar288._20_4_;
      iStack_87e8 = auVar288._24_4_;
      iStack_87e4 = auVar288._28_4_;
      iStack_87e0 = auVar288._32_4_;
      iStack_87dc = auVar288._36_4_;
      iStack_87d8 = auVar288._40_4_;
      iStack_87d4 = auVar288._44_4_;
      iStack_87d0 = auVar288._48_4_;
      iStack_87cc = auVar288._52_4_;
      iStack_87c8 = auVar288._56_4_;
      iStack_87c4 = auVar288._60_4_;
      auVar288 = vsubps_avx512f(auVar288,auVar74);
      bVar4 = (bool)((byte)uVar29 & 1);
      bVar5 = (bool)((byte)(uVar30 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar30 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar30 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar30 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar30 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar30 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar30 >> 7) & 1);
      bVar12 = (byte)((ulong)uVar29 >> 8);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_9ac0._4_4_ = (uint)bVar5 * auVar288._4_4_ | (uint)!bVar5 * iStack_87fc;
      local_9ac0._0_4_ = (uint)bVar4 * auVar288._0_4_ | (uint)!bVar4 * local_8800;
      local_9ac0._8_4_ = (uint)bVar6 * auVar288._8_4_ | (uint)!bVar6 * iStack_87f8;
      local_9ac0._12_4_ = (uint)bVar7 * auVar288._12_4_ | (uint)!bVar7 * iStack_87f4;
      uStack_9ab0._0_4_ = (uint)bVar8 * auVar288._16_4_ | (uint)!bVar8 * iStack_87f0;
      uStack_9ab0._4_4_ = (uint)bVar9 * auVar288._20_4_ | (uint)!bVar9 * iStack_87ec;
      uStack_9aa8._0_4_ = (uint)bVar10 * auVar288._24_4_ | (uint)!bVar10 * iStack_87e8;
      uStack_9aa8._4_4_ = (uint)bVar11 * auVar288._28_4_ | (uint)!bVar11 * iStack_87e4;
      auVar19 = _local_9ac0;
      uStack_9aa0._0_4_ =
           (uint)(bVar12 & 1) * auVar288._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_87e0;
      uStack_9aa0._4_4_ = (uint)bVar13 * auVar288._36_4_ | (uint)!bVar13 * iStack_87dc;
      auVar281 = _local_9ac0;
      uStack_9a98._0_4_ = (uint)bVar14 * auVar288._40_4_ | (uint)!bVar14 * iStack_87d8;
      uStack_9a98._4_4_ = (uint)bVar15 * auVar288._44_4_ | (uint)!bVar15 * iStack_87d4;
      auVar282 = _local_9ac0;
      uStack_9a90._0_4_ = (uint)bVar16 * auVar288._48_4_ | (uint)!bVar16 * iStack_87d0;
      uStack_9a90._4_4_ = (uint)bVar17 * auVar288._52_4_ | (uint)!bVar17 * iStack_87cc;
      auVar283 = _local_9ac0;
      uStack_9a88._0_4_ = (uint)bVar18 * auVar288._56_4_ | (uint)!bVar18 * iStack_87c8;
      uStack_9a88._4_4_ =
           (uint)(bVar12 >> 7) * auVar288._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_87c4;
      auVar288 = _local_9ac0;
      local_7dc0 = auVar290._0_4_;
      iStack_7dbc = auVar290._4_4_;
      iStack_7db8 = auVar290._8_4_;
      iStack_7db4 = auVar290._12_4_;
      iStack_7db0 = auVar290._16_4_;
      iStack_7dac = auVar290._20_4_;
      iStack_7da8 = auVar290._24_4_;
      iStack_7da4 = auVar290._28_4_;
      iStack_7da0 = auVar290._32_4_;
      iStack_7d9c = auVar290._36_4_;
      iStack_7d98 = auVar290._40_4_;
      iStack_7d94 = auVar290._44_4_;
      iStack_7d90 = auVar290._48_4_;
      iStack_7d8c = auVar290._52_4_;
      iStack_7d88 = auVar290._56_4_;
      iStack_7d84 = auVar290._60_4_;
      auVar289 = vaddps_avx512f(auVar290,auVar289);
      bVar4 = (bool)((byte)uVar29 & 1);
      bVar5 = (bool)((byte)(uVar30 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar30 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar30 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar30 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar30 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar30 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar30 >> 7) & 1);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_99c0._4_4_ = (uint)bVar5 * auVar289._4_4_ | (uint)!bVar5 * iStack_7dbc;
      local_99c0._0_4_ = (uint)bVar4 * auVar289._0_4_ | (uint)!bVar4 * local_7dc0;
      local_99c0._8_4_ = (uint)bVar6 * auVar289._8_4_ | (uint)!bVar6 * iStack_7db8;
      local_99c0._12_4_ = (uint)bVar7 * auVar289._12_4_ | (uint)!bVar7 * iStack_7db4;
      uStack_99b0._0_4_ = (uint)bVar8 * auVar289._16_4_ | (uint)!bVar8 * iStack_7db0;
      uStack_99b0._4_4_ = (uint)bVar9 * auVar289._20_4_ | (uint)!bVar9 * iStack_7dac;
      uStack_99a8._0_4_ = (uint)bVar10 * auVar289._24_4_ | (uint)!bVar10 * iStack_7da8;
      uStack_99a8._4_4_ = (uint)bVar11 * auVar289._28_4_ | (uint)!bVar11 * iStack_7da4;
      auVar293 = _local_99c0;
      uStack_99a0._0_4_ =
           (uint)(bVar12 & 1) * auVar289._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_7da0;
      uStack_99a0._4_4_ = (uint)bVar13 * auVar289._36_4_ | (uint)!bVar13 * iStack_7d9c;
      auVar284 = _local_99c0;
      uStack_9998._0_4_ = (uint)bVar14 * auVar289._40_4_ | (uint)!bVar14 * iStack_7d98;
      uStack_9998._4_4_ = (uint)bVar15 * auVar289._44_4_ | (uint)!bVar15 * iStack_7d94;
      auVar285 = _local_99c0;
      uStack_9990._0_4_ = (uint)bVar16 * auVar289._48_4_ | (uint)!bVar16 * iStack_7d90;
      uStack_9990._4_4_ = (uint)bVar17 * auVar289._52_4_ | (uint)!bVar17 * iStack_7d8c;
      auVar286 = _local_99c0;
      uStack_9988._0_4_ = (uint)bVar18 * auVar289._56_4_ | (uint)!bVar18 * iStack_7d88;
      uStack_9988._4_4_ =
           (uint)(bVar12 >> 7) * auVar289._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_7d84;
      auVar289 = _local_99c0;
      uStack_99a8 = auVar293._24_8_;
      uStack_99a0 = auVar284._32_8_;
      uStack_9998 = auVar285._40_8_;
      uStack_9990 = auVar286._48_8_;
      uStack_9988 = auVar289._56_8_;
      auVar43._16_8_ = uStack_99b0;
      auVar43._0_16_ = local_99c0;
      auVar43._24_8_ = uStack_99a8;
      auVar43._32_8_ = uStack_99a0;
      auVar43._40_8_ = uStack_9998;
      auVar43._48_8_ = uStack_9990;
      auVar43._56_8_ = uStack_9988;
      auVar42._16_8_ = uStack_99b0;
      auVar42._0_16_ = local_99c0;
      auVar42._24_8_ = uStack_99a8;
      auVar42._32_8_ = uStack_99a0;
      auVar42._40_8_ = uStack_9998;
      auVar42._48_8_ = uStack_9990;
      auVar42._56_8_ = uStack_9988;
      auVar289 = vmulps_avx512f(auVar43,auVar42);
      local_9bc0._8_4_ = 0.070376836;
      local_9bc0._12_4_ = 0.070376836;
      local_9bc0._0_4_ = 0.070376836;
      local_9bc0._4_4_ = 0.070376836;
      auVar65._16_4_ = 0.070376836;
      auVar65._20_4_ = 0.070376836;
      auVar65._0_16_ = local_9bc0._0_16_;
      auVar65._24_4_ = 0.070376836;
      auVar65._28_4_ = 0.070376836;
      auVar65._32_4_ = 0.070376836;
      auVar65._36_4_ = 0.070376836;
      auVar65._40_4_ = 0.070376836;
      auVar65._44_4_ = 0.070376836;
      auVar65._48_4_ = 0.070376836;
      auVar65._52_4_ = 0.070376836;
      auVar65._56_4_ = 0.070376836;
      auVar65._60_4_ = 0.070376836;
      auVar64._16_8_ = uStack_99b0;
      auVar64._0_16_ = local_99c0;
      auVar64._24_8_ = uStack_99a8;
      auVar64._32_8_ = uStack_99a0;
      auVar64._40_8_ = uStack_9998;
      auVar64._48_8_ = uStack_9990;
      auVar64._56_8_ = uStack_9988;
      auVar63._8_4_ = -0.1151461;
      auVar63._12_4_ = -0.1151461;
      auVar63._0_4_ = -0.1151461;
      auVar63._4_4_ = -0.1151461;
      auVar63._16_4_ = -0.1151461;
      auVar63._20_4_ = -0.1151461;
      auVar63._24_4_ = -0.1151461;
      auVar63._28_4_ = -0.1151461;
      auVar63._32_4_ = -0.1151461;
      auVar63._36_4_ = -0.1151461;
      auVar63._40_4_ = -0.1151461;
      auVar63._44_4_ = -0.1151461;
      auVar63._48_4_ = -0.1151461;
      auVar63._52_4_ = -0.1151461;
      auVar63._56_4_ = -0.1151461;
      auVar63._60_4_ = -0.1151461;
      auVar290 = vfmadd213ps_avx512f(auVar64,auVar65,auVar63);
      auVar62._16_8_ = uStack_99b0;
      auVar62._0_16_ = local_99c0;
      auVar62._24_8_ = uStack_99a8;
      auVar62._32_8_ = uStack_99a0;
      auVar62._40_8_ = uStack_9998;
      auVar62._48_8_ = uStack_9990;
      auVar62._56_8_ = uStack_9988;
      auVar61._8_4_ = 0.116769984;
      auVar61._12_4_ = 0.116769984;
      auVar61._0_4_ = 0.116769984;
      auVar61._4_4_ = 0.116769984;
      auVar61._16_4_ = 0.116769984;
      auVar61._20_4_ = 0.116769984;
      auVar61._24_4_ = 0.116769984;
      auVar61._28_4_ = 0.116769984;
      auVar61._32_4_ = 0.116769984;
      auVar61._36_4_ = 0.116769984;
      auVar61._40_4_ = 0.116769984;
      auVar61._44_4_ = 0.116769984;
      auVar61._48_4_ = 0.116769984;
      auVar61._52_4_ = 0.116769984;
      auVar61._56_4_ = 0.116769984;
      auVar61._60_4_ = 0.116769984;
      auVar290 = vfmadd213ps_avx512f(auVar62,auVar290,auVar61);
      auVar60._16_8_ = uStack_99b0;
      auVar60._0_16_ = local_99c0;
      auVar60._24_8_ = uStack_99a8;
      auVar60._32_8_ = uStack_99a0;
      auVar60._40_8_ = uStack_9998;
      auVar60._48_8_ = uStack_9990;
      auVar60._56_8_ = uStack_9988;
      auVar59._8_4_ = -0.12420141;
      auVar59._12_4_ = -0.12420141;
      auVar59._0_4_ = -0.12420141;
      auVar59._4_4_ = -0.12420141;
      auVar59._16_4_ = -0.12420141;
      auVar59._20_4_ = -0.12420141;
      auVar59._24_4_ = -0.12420141;
      auVar59._28_4_ = -0.12420141;
      auVar59._32_4_ = -0.12420141;
      auVar59._36_4_ = -0.12420141;
      auVar59._40_4_ = -0.12420141;
      auVar59._44_4_ = -0.12420141;
      auVar59._48_4_ = -0.12420141;
      auVar59._52_4_ = -0.12420141;
      auVar59._56_4_ = -0.12420141;
      auVar59._60_4_ = -0.12420141;
      auVar290 = vfmadd213ps_avx512f(auVar60,auVar290,auVar59);
      auVar58._16_8_ = uStack_99b0;
      auVar58._0_16_ = local_99c0;
      auVar58._24_8_ = uStack_99a8;
      auVar58._32_8_ = uStack_99a0;
      auVar58._40_8_ = uStack_9998;
      auVar58._48_8_ = uStack_9990;
      auVar58._56_8_ = uStack_9988;
      auVar57._8_4_ = 0.14249323;
      auVar57._12_4_ = 0.14249323;
      auVar57._0_4_ = 0.14249323;
      auVar57._4_4_ = 0.14249323;
      auVar57._16_4_ = 0.14249323;
      auVar57._20_4_ = 0.14249323;
      auVar57._24_4_ = 0.14249323;
      auVar57._28_4_ = 0.14249323;
      auVar57._32_4_ = 0.14249323;
      auVar57._36_4_ = 0.14249323;
      auVar57._40_4_ = 0.14249323;
      auVar57._44_4_ = 0.14249323;
      auVar57._48_4_ = 0.14249323;
      auVar57._52_4_ = 0.14249323;
      auVar57._56_4_ = 0.14249323;
      auVar57._60_4_ = 0.14249323;
      auVar290 = vfmadd213ps_avx512f(auVar58,auVar290,auVar57);
      auVar56._16_8_ = uStack_99b0;
      auVar56._0_16_ = local_99c0;
      auVar56._24_8_ = uStack_99a8;
      auVar56._32_8_ = uStack_99a0;
      auVar56._40_8_ = uStack_9998;
      auVar56._48_8_ = uStack_9990;
      auVar56._56_8_ = uStack_9988;
      auVar55._8_4_ = -0.16668057;
      auVar55._12_4_ = -0.16668057;
      auVar55._0_4_ = -0.16668057;
      auVar55._4_4_ = -0.16668057;
      auVar55._16_4_ = -0.16668057;
      auVar55._20_4_ = -0.16668057;
      auVar55._24_4_ = -0.16668057;
      auVar55._28_4_ = -0.16668057;
      auVar55._32_4_ = -0.16668057;
      auVar55._36_4_ = -0.16668057;
      auVar55._40_4_ = -0.16668057;
      auVar55._44_4_ = -0.16668057;
      auVar55._48_4_ = -0.16668057;
      auVar55._52_4_ = -0.16668057;
      auVar55._56_4_ = -0.16668057;
      auVar55._60_4_ = -0.16668057;
      auVar290 = vfmadd213ps_avx512f(auVar56,auVar290,auVar55);
      auVar54._16_8_ = uStack_99b0;
      auVar54._0_16_ = local_99c0;
      auVar54._24_8_ = uStack_99a8;
      auVar54._32_8_ = uStack_99a0;
      auVar54._40_8_ = uStack_9998;
      auVar54._48_8_ = uStack_9990;
      auVar54._56_8_ = uStack_9988;
      auVar53._8_4_ = 0.20000714;
      auVar53._12_4_ = 0.20000714;
      auVar53._0_4_ = 0.20000714;
      auVar53._4_4_ = 0.20000714;
      auVar53._16_4_ = 0.20000714;
      auVar53._20_4_ = 0.20000714;
      auVar53._24_4_ = 0.20000714;
      auVar53._28_4_ = 0.20000714;
      auVar53._32_4_ = 0.20000714;
      auVar53._36_4_ = 0.20000714;
      auVar53._40_4_ = 0.20000714;
      auVar53._44_4_ = 0.20000714;
      auVar53._48_4_ = 0.20000714;
      auVar53._52_4_ = 0.20000714;
      auVar53._56_4_ = 0.20000714;
      auVar53._60_4_ = 0.20000714;
      auVar290 = vfmadd213ps_avx512f(auVar54,auVar290,auVar53);
      auVar52._16_8_ = uStack_99b0;
      auVar52._0_16_ = local_99c0;
      auVar52._24_8_ = uStack_99a8;
      auVar52._32_8_ = uStack_99a0;
      auVar52._40_8_ = uStack_9998;
      auVar52._48_8_ = uStack_9990;
      auVar52._56_8_ = uStack_9988;
      auVar51._8_4_ = -0.24999994;
      auVar51._12_4_ = -0.24999994;
      auVar51._0_4_ = -0.24999994;
      auVar51._4_4_ = -0.24999994;
      auVar51._16_4_ = -0.24999994;
      auVar51._20_4_ = -0.24999994;
      auVar51._24_4_ = -0.24999994;
      auVar51._28_4_ = -0.24999994;
      auVar51._32_4_ = -0.24999994;
      auVar51._36_4_ = -0.24999994;
      auVar51._40_4_ = -0.24999994;
      auVar51._44_4_ = -0.24999994;
      auVar51._48_4_ = -0.24999994;
      auVar51._52_4_ = -0.24999994;
      auVar51._56_4_ = -0.24999994;
      auVar51._60_4_ = -0.24999994;
      auVar290 = vfmadd213ps_avx512f(auVar52,auVar290,auVar51);
      auVar50._16_8_ = uStack_99b0;
      auVar50._0_16_ = local_99c0;
      auVar50._24_8_ = uStack_99a8;
      auVar50._32_8_ = uStack_99a0;
      auVar50._40_8_ = uStack_9998;
      auVar50._48_8_ = uStack_9990;
      auVar50._56_8_ = uStack_9988;
      auVar49._8_4_ = 0.3333333;
      auVar49._12_4_ = 0.3333333;
      auVar49._0_4_ = 0.3333333;
      auVar49._4_4_ = 0.3333333;
      auVar49._16_4_ = 0.3333333;
      auVar49._20_4_ = 0.3333333;
      auVar49._24_4_ = 0.3333333;
      auVar49._28_4_ = 0.3333333;
      auVar49._32_4_ = 0.3333333;
      auVar49._36_4_ = 0.3333333;
      auVar49._40_4_ = 0.3333333;
      auVar49._44_4_ = 0.3333333;
      auVar49._48_4_ = 0.3333333;
      auVar49._52_4_ = 0.3333333;
      auVar49._56_4_ = 0.3333333;
      auVar49._60_4_ = 0.3333333;
      auVar290 = vfmadd213ps_avx512f(auVar50,auVar290,auVar49);
      auVar41._16_8_ = uStack_99b0;
      auVar41._0_16_ = local_99c0;
      auVar41._24_8_ = uStack_99a8;
      auVar41._32_8_ = uStack_99a0;
      auVar41._40_8_ = uStack_9998;
      auVar41._48_8_ = uStack_9990;
      auVar41._56_8_ = uStack_9988;
      auVar290 = vmulps_avx512f(auVar290,auVar41);
      auVar290 = vmulps_avx512f(auVar290,auVar289);
      uStack_9aa8 = auVar19._24_8_;
      uStack_9aa0 = auVar281._32_8_;
      uStack_9a98 = auVar282._40_8_;
      uStack_9a90 = auVar283._48_8_;
      uStack_9a88 = auVar288._56_8_;
      auVar48._16_8_ = uStack_9ab0;
      auVar48._0_16_ = local_9ac0;
      auVar48._24_8_ = uStack_9aa8;
      auVar48._32_8_ = uStack_9aa0;
      auVar48._40_8_ = uStack_9a98;
      auVar48._48_8_ = uStack_9a90;
      auVar48._56_8_ = uStack_9a88;
      auVar47._8_4_ = -0.00021219444;
      auVar47._12_4_ = -0.00021219444;
      auVar47._0_4_ = -0.00021219444;
      auVar47._4_4_ = -0.00021219444;
      auVar47._16_4_ = -0.00021219444;
      auVar47._20_4_ = -0.00021219444;
      auVar47._24_4_ = -0.00021219444;
      auVar47._28_4_ = -0.00021219444;
      auVar47._32_4_ = -0.00021219444;
      auVar47._36_4_ = -0.00021219444;
      auVar47._40_4_ = -0.00021219444;
      auVar47._44_4_ = -0.00021219444;
      auVar47._48_4_ = -0.00021219444;
      auVar47._52_4_ = -0.00021219444;
      auVar47._56_4_ = -0.00021219444;
      auVar47._60_4_ = -0.00021219444;
      auVar288 = vfmadd213ps_avx512f(auVar47,auVar48,auVar290);
      auVar76._8_4_ = 0.5;
      auVar76._12_4_ = 0.5;
      auVar76._0_4_ = 0.5;
      auVar76._4_4_ = 0.5;
      auVar76._16_4_ = 0.5;
      auVar76._20_4_ = 0.5;
      auVar76._24_4_ = 0.5;
      auVar76._28_4_ = 0.5;
      auVar76._32_4_ = 0.5;
      auVar76._36_4_ = 0.5;
      auVar76._40_4_ = 0.5;
      auVar76._44_4_ = 0.5;
      auVar76._48_4_ = 0.5;
      auVar76._52_4_ = 0.5;
      auVar76._56_4_ = 0.5;
      auVar76._60_4_ = 0.5;
      auVar288 = vfnmadd213ps_avx512f(auVar76,auVar289,auVar288);
      auVar38._16_8_ = uStack_99b0;
      auVar38._0_16_ = local_99c0;
      auVar38._24_8_ = uStack_99a8;
      auVar38._32_8_ = uStack_99a0;
      auVar38._40_8_ = uStack_9998;
      auVar38._48_8_ = uStack_9990;
      auVar38._56_8_ = uStack_9988;
      auVar288 = vaddps_avx512f(auVar38,auVar288);
      auVar46._16_8_ = uStack_9ab0;
      auVar46._0_16_ = local_9ac0;
      auVar46._24_8_ = uStack_9aa8;
      auVar46._32_8_ = uStack_9aa0;
      auVar46._40_8_ = uStack_9a98;
      auVar46._48_8_ = uStack_9a90;
      auVar46._56_8_ = uStack_9a88;
      auVar45._8_4_ = 0.6933594;
      auVar45._12_4_ = 0.6933594;
      auVar45._0_4_ = 0.6933594;
      auVar45._4_4_ = 0.6933594;
      auVar45._16_4_ = 0.6933594;
      auVar45._20_4_ = 0.6933594;
      auVar45._24_4_ = 0.6933594;
      auVar45._28_4_ = 0.6933594;
      auVar45._32_4_ = 0.6933594;
      auVar45._36_4_ = 0.6933594;
      auVar45._40_4_ = 0.6933594;
      auVar45._44_4_ = 0.6933594;
      auVar45._48_4_ = 0.6933594;
      auVar45._52_4_ = 0.6933594;
      auVar45._56_4_ = 0.6933594;
      auVar45._60_4_ = 0.6933594;
      auVar289 = vfmadd213ps_avx512f(auVar45,auVar46,auVar288);
      auVar288 = vpmovm2d_avx512dq(uVar26 & 0xffff);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vpord_avx512f(auVar289,auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmulps_avx512f(auVar291,auVar288);
      auVar37._8_4_ = 88.37626;
      auVar37._12_4_ = 88.37626;
      auVar37._0_4_ = 88.37626;
      auVar37._4_4_ = 88.37626;
      auVar37._16_4_ = 88.37626;
      auVar37._20_4_ = 88.37626;
      auVar37._24_4_ = 88.37626;
      auVar37._28_4_ = 88.37626;
      auVar37._32_4_ = 88.37626;
      auVar37._36_4_ = 88.37626;
      auVar37._40_4_ = 88.37626;
      auVar37._44_4_ = 88.37626;
      auVar37._48_4_ = 88.37626;
      auVar37._52_4_ = 88.37626;
      auVar37._56_4_ = 88.37626;
      auVar37._60_4_ = 88.37626;
      auVar288 = vminps_avx512f(auVar288,auVar37);
      auVar36._8_4_ = -88.37626;
      auVar36._12_4_ = -88.37626;
      auVar36._0_4_ = -88.37626;
      auVar36._4_4_ = -88.37626;
      auVar36._16_4_ = -88.37626;
      auVar36._20_4_ = -88.37626;
      auVar36._24_4_ = -88.37626;
      auVar36._28_4_ = -88.37626;
      auVar36._32_4_ = -88.37626;
      auVar36._36_4_ = -88.37626;
      auVar36._40_4_ = -88.37626;
      auVar36._44_4_ = -88.37626;
      auVar36._48_4_ = -88.37626;
      auVar36._52_4_ = -88.37626;
      auVar36._56_4_ = -88.37626;
      auVar36._60_4_ = -88.37626;
      auVar289 = vmaxps_avx512f(auVar288,auVar36);
      auVar73._8_4_ = 1.442695;
      auVar73._12_4_ = 1.442695;
      auVar73._0_4_ = 1.442695;
      auVar73._4_4_ = 1.442695;
      auVar73._16_4_ = 1.442695;
      auVar73._20_4_ = 1.442695;
      auVar73._24_4_ = 1.442695;
      auVar73._28_4_ = 1.442695;
      auVar73._32_4_ = 1.442695;
      auVar73._36_4_ = 1.442695;
      auVar73._40_4_ = 1.442695;
      auVar73._44_4_ = 1.442695;
      auVar73._48_4_ = 1.442695;
      auVar73._52_4_ = 1.442695;
      auVar73._56_4_ = 1.442695;
      auVar73._60_4_ = 1.442695;
      auVar72._8_4_ = 0.5;
      auVar72._12_4_ = 0.5;
      auVar72._0_4_ = 0.5;
      auVar72._4_4_ = 0.5;
      auVar72._16_4_ = 0.5;
      auVar72._20_4_ = 0.5;
      auVar72._24_4_ = 0.5;
      auVar72._28_4_ = 0.5;
      auVar72._32_4_ = 0.5;
      auVar72._36_4_ = 0.5;
      auVar72._40_4_ = 0.5;
      auVar72._44_4_ = 0.5;
      auVar72._48_4_ = 0.5;
      auVar72._52_4_ = 0.5;
      auVar72._56_4_ = 0.5;
      auVar72._60_4_ = 0.5;
      auVar288 = vfmadd213ps_avx512f(auVar73,auVar289,auVar72);
      auVar290 = vrndscaleps_avx512f(auVar288,1);
      uVar29 = vcmpps_avx512f(auVar288,auVar290,1);
      uVar30 = (ushort)uVar29;
      auVar75._8_4_ = 1.0;
      auVar75._12_4_ = 1.0;
      auVar75._0_4_ = 1.0;
      auVar75._4_4_ = 1.0;
      auVar75._16_4_ = 1.0;
      auVar75._20_4_ = 1.0;
      auVar75._24_4_ = 1.0;
      auVar75._28_4_ = 1.0;
      auVar75._32_4_ = 1.0;
      auVar75._36_4_ = 1.0;
      auVar75._40_4_ = 1.0;
      auVar75._44_4_ = 1.0;
      auVar75._48_4_ = 1.0;
      auVar75._52_4_ = 1.0;
      auVar75._56_4_ = 1.0;
      auVar75._60_4_ = 1.0;
      local_8680 = auVar290._0_4_;
      iStack_867c = auVar290._4_4_;
      iStack_8678 = auVar290._8_4_;
      iStack_8674 = auVar290._12_4_;
      iStack_8670 = auVar290._16_4_;
      iStack_866c = auVar290._20_4_;
      iStack_8668 = auVar290._24_4_;
      iStack_8664 = auVar290._28_4_;
      iStack_8660 = auVar290._32_4_;
      iStack_865c = auVar290._36_4_;
      iStack_8658 = auVar290._40_4_;
      iStack_8654 = auVar290._44_4_;
      iStack_8650 = auVar290._48_4_;
      iStack_864c = auVar290._52_4_;
      iStack_8648 = auVar290._56_4_;
      iStack_8644 = auVar290._60_4_;
      auVar288 = vsubps_avx512f(auVar290,auVar75);
      bVar4 = (bool)((byte)uVar29 & 1);
      bVar5 = (bool)((byte)(uVar30 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar30 >> 2) & 1);
      bVar7 = (bool)((byte)(uVar30 >> 3) & 1);
      bVar8 = (bool)((byte)(uVar30 >> 4) & 1);
      bVar9 = (bool)((byte)(uVar30 >> 5) & 1);
      bVar10 = (bool)((byte)(uVar30 >> 6) & 1);
      bVar11 = (bool)((byte)(uVar30 >> 7) & 1);
      bVar12 = (byte)((ulong)uVar29 >> 8);
      bVar13 = (bool)(bVar12 >> 1 & 1);
      bVar14 = (bool)(bVar12 >> 2 & 1);
      bVar15 = (bool)(bVar12 >> 3 & 1);
      bVar16 = (bool)(bVar12 >> 4 & 1);
      bVar17 = (bool)(bVar12 >> 5 & 1);
      bVar18 = (bool)(bVar12 >> 6 & 1);
      local_9f00._4_4_ = (uint)bVar5 * auVar288._4_4_ | (uint)!bVar5 * iStack_867c;
      local_9f00._0_4_ = (uint)bVar4 * auVar288._0_4_ | (uint)!bVar4 * local_8680;
      local_9f00._8_4_ = (uint)bVar6 * auVar288._8_4_ | (uint)!bVar6 * iStack_8678;
      local_9f00._12_4_ = (uint)bVar7 * auVar288._12_4_ | (uint)!bVar7 * iStack_8674;
      uStack_9ef0._0_4_ = (uint)bVar8 * auVar288._16_4_ | (uint)!bVar8 * iStack_8670;
      uStack_9ef0._4_4_ = (uint)bVar9 * auVar288._20_4_ | (uint)!bVar9 * iStack_866c;
      uStack_9ee8._0_4_ = (uint)bVar10 * auVar288._24_4_ | (uint)!bVar10 * iStack_8668;
      uStack_9ee8._4_4_ = (uint)bVar11 * auVar288._28_4_ | (uint)!bVar11 * iStack_8664;
      auVar19 = _local_9f00;
      uStack_9ee0._0_4_ =
           (uint)(bVar12 & 1) * auVar288._32_4_ | (uint)!(bool)(bVar12 & 1) * iStack_8660;
      uStack_9ee0._4_4_ = (uint)bVar13 * auVar288._36_4_ | (uint)!bVar13 * iStack_865c;
      auVar281 = _local_9f00;
      uStack_9ed8._0_4_ = (uint)bVar14 * auVar288._40_4_ | (uint)!bVar14 * iStack_8658;
      uStack_9ed8._4_4_ = (uint)bVar15 * auVar288._44_4_ | (uint)!bVar15 * iStack_8654;
      auVar282 = _local_9f00;
      uStack_9ed0._0_4_ = (uint)bVar16 * auVar288._48_4_ | (uint)!bVar16 * iStack_8650;
      uStack_9ed0._4_4_ = (uint)bVar17 * auVar288._52_4_ | (uint)!bVar17 * iStack_864c;
      auVar283 = _local_9f00;
      uStack_9ec8._0_4_ = (uint)bVar18 * auVar288._56_4_ | (uint)!bVar18 * iStack_8648;
      uStack_9ec8._4_4_ =
           (uint)(bVar12 >> 7) * auVar288._60_4_ | (uint)!(bool)(bVar12 >> 7) * iStack_8644;
      auVar288 = _local_9f00;
      uStack_9ee8 = auVar19._24_8_;
      uStack_9ee0 = auVar281._32_8_;
      uStack_9ed8 = auVar282._40_8_;
      uStack_9ed0 = auVar283._48_8_;
      uStack_9ec8 = auVar288._56_8_;
      auVar80._16_8_ = uStack_9ef0;
      auVar80._0_16_ = local_9f00;
      auVar80._24_8_ = uStack_9ee8;
      auVar80._32_8_ = uStack_9ee0;
      auVar80._40_8_ = uStack_9ed8;
      auVar80._48_8_ = uStack_9ed0;
      auVar80._56_8_ = uStack_9ec8;
      auVar79._8_4_ = 0.6933594;
      auVar79._12_4_ = 0.6933594;
      auVar79._0_4_ = 0.6933594;
      auVar79._4_4_ = 0.6933594;
      auVar79._16_4_ = 0.6933594;
      auVar79._20_4_ = 0.6933594;
      auVar79._24_4_ = 0.6933594;
      auVar79._28_4_ = 0.6933594;
      auVar79._32_4_ = 0.6933594;
      auVar79._36_4_ = 0.6933594;
      auVar79._40_4_ = 0.6933594;
      auVar79._44_4_ = 0.6933594;
      auVar79._48_4_ = 0.6933594;
      auVar79._52_4_ = 0.6933594;
      auVar79._56_4_ = 0.6933594;
      auVar79._60_4_ = 0.6933594;
      auVar288 = vfnmadd213ps_avx512f(auVar79,auVar80,auVar289);
      auVar78._16_8_ = uStack_9ef0;
      auVar78._0_16_ = local_9f00;
      auVar78._24_8_ = uStack_9ee8;
      auVar78._32_8_ = uStack_9ee0;
      auVar78._40_8_ = uStack_9ed8;
      auVar78._48_8_ = uStack_9ed0;
      auVar78._56_8_ = uStack_9ec8;
      auVar77._8_4_ = -0.00021219444;
      auVar77._12_4_ = -0.00021219444;
      auVar77._0_4_ = -0.00021219444;
      auVar77._4_4_ = -0.00021219444;
      auVar77._16_4_ = -0.00021219444;
      auVar77._20_4_ = -0.00021219444;
      auVar77._24_4_ = -0.00021219444;
      auVar77._28_4_ = -0.00021219444;
      auVar77._32_4_ = -0.00021219444;
      auVar77._36_4_ = -0.00021219444;
      auVar77._40_4_ = -0.00021219444;
      auVar77._44_4_ = -0.00021219444;
      auVar77._48_4_ = -0.00021219444;
      auVar77._52_4_ = -0.00021219444;
      auVar77._56_4_ = -0.00021219444;
      auVar77._60_4_ = -0.00021219444;
      auVar288 = vfnmadd213ps_avx512f(auVar77,auVar78,auVar288);
      auVar289 = vmulps_avx512f(auVar288,auVar288);
      uStack_9ff8._0_4_ = 0.00019875691;
      uStack_9ff8._4_4_ = 0.00019875691;
      local_a000._0_4_ = 0.00019875691;
      local_a000._4_4_ = 0.00019875691;
      auVar71._16_4_ = 0.00019875691;
      auVar71._20_4_ = 0.00019875691;
      auVar71._0_16_ = _local_a000;
      auVar71._24_4_ = 0.00019875691;
      auVar71._28_4_ = 0.00019875691;
      auVar71._32_4_ = 0.00019875691;
      auVar71._36_4_ = 0.00019875691;
      auVar71._40_4_ = 0.00019875691;
      auVar71._44_4_ = 0.00019875691;
      auVar71._48_4_ = 0.00019875691;
      auVar71._52_4_ = 0.00019875691;
      auVar71._56_4_ = 0.00019875691;
      auVar71._60_4_ = 0.00019875691;
      auVar70._8_4_ = 0.0013981999;
      auVar70._12_4_ = 0.0013981999;
      auVar70._0_4_ = 0.0013981999;
      auVar70._4_4_ = 0.0013981999;
      auVar70._16_4_ = 0.0013981999;
      auVar70._20_4_ = 0.0013981999;
      auVar70._24_4_ = 0.0013981999;
      auVar70._28_4_ = 0.0013981999;
      auVar70._32_4_ = 0.0013981999;
      auVar70._36_4_ = 0.0013981999;
      auVar70._40_4_ = 0.0013981999;
      auVar70._44_4_ = 0.0013981999;
      auVar70._48_4_ = 0.0013981999;
      auVar70._52_4_ = 0.0013981999;
      auVar70._56_4_ = 0.0013981999;
      auVar70._60_4_ = 0.0013981999;
      auVar290 = vfmadd213ps_avx512f(auVar288,auVar71,auVar70);
      auVar69._8_4_ = 0.008333452;
      auVar69._12_4_ = 0.008333452;
      auVar69._0_4_ = 0.008333452;
      auVar69._4_4_ = 0.008333452;
      auVar69._16_4_ = 0.008333452;
      auVar69._20_4_ = 0.008333452;
      auVar69._24_4_ = 0.008333452;
      auVar69._28_4_ = 0.008333452;
      auVar69._32_4_ = 0.008333452;
      auVar69._36_4_ = 0.008333452;
      auVar69._40_4_ = 0.008333452;
      auVar69._44_4_ = 0.008333452;
      auVar69._48_4_ = 0.008333452;
      auVar69._52_4_ = 0.008333452;
      auVar69._56_4_ = 0.008333452;
      auVar69._60_4_ = 0.008333452;
      auVar290 = vfmadd213ps_avx512f(auVar288,auVar290,auVar69);
      auVar68._8_4_ = 0.041665796;
      auVar68._12_4_ = 0.041665796;
      auVar68._0_4_ = 0.041665796;
      auVar68._4_4_ = 0.041665796;
      auVar68._16_4_ = 0.041665796;
      auVar68._20_4_ = 0.041665796;
      auVar68._24_4_ = 0.041665796;
      auVar68._28_4_ = 0.041665796;
      auVar68._32_4_ = 0.041665796;
      auVar68._36_4_ = 0.041665796;
      auVar68._40_4_ = 0.041665796;
      auVar68._44_4_ = 0.041665796;
      auVar68._48_4_ = 0.041665796;
      auVar68._52_4_ = 0.041665796;
      auVar68._56_4_ = 0.041665796;
      auVar68._60_4_ = 0.041665796;
      auVar290 = vfmadd213ps_avx512f(auVar288,auVar290,auVar68);
      auVar67._8_4_ = 0.16666666;
      auVar67._12_4_ = 0.16666666;
      auVar67._0_4_ = 0.16666666;
      auVar67._4_4_ = 0.16666666;
      auVar67._16_4_ = 0.16666666;
      auVar67._20_4_ = 0.16666666;
      auVar67._24_4_ = 0.16666666;
      auVar67._28_4_ = 0.16666666;
      auVar67._32_4_ = 0.16666666;
      auVar67._36_4_ = 0.16666666;
      auVar67._40_4_ = 0.16666666;
      auVar67._44_4_ = 0.16666666;
      auVar67._48_4_ = 0.16666666;
      auVar67._52_4_ = 0.16666666;
      auVar67._56_4_ = 0.16666666;
      auVar67._60_4_ = 0.16666666;
      auVar290 = vfmadd213ps_avx512f(auVar288,auVar290,auVar67);
      auVar66._8_4_ = 0.5;
      auVar66._12_4_ = 0.5;
      auVar66._0_4_ = 0.5;
      auVar66._4_4_ = 0.5;
      auVar66._16_4_ = 0.5;
      auVar66._20_4_ = 0.5;
      auVar66._24_4_ = 0.5;
      auVar66._28_4_ = 0.5;
      auVar66._32_4_ = 0.5;
      auVar66._36_4_ = 0.5;
      auVar66._40_4_ = 0.5;
      auVar66._44_4_ = 0.5;
      auVar66._48_4_ = 0.5;
      auVar66._52_4_ = 0.5;
      auVar66._56_4_ = 0.5;
      auVar66._60_4_ = 0.5;
      auVar290 = vfmadd213ps_avx512f(auVar288,auVar290,auVar66);
      auVar288 = vfmadd213ps_avx512f(auVar289,auVar290,auVar288);
      auVar35._8_4_ = 1.0;
      auVar35._12_4_ = 1.0;
      auVar35._0_4_ = 1.0;
      auVar35._4_4_ = 1.0;
      auVar35._16_4_ = 1.0;
      auVar35._20_4_ = 1.0;
      auVar35._24_4_ = 1.0;
      auVar35._28_4_ = 1.0;
      auVar35._32_4_ = 1.0;
      auVar35._36_4_ = 1.0;
      auVar35._40_4_ = 1.0;
      auVar35._44_4_ = 1.0;
      auVar35._48_4_ = 1.0;
      auVar35._52_4_ = 1.0;
      auVar35._56_4_ = 1.0;
      auVar35._60_4_ = 1.0;
      auVar290 = vaddps_avx512f(auVar288,auVar35);
      auVar81._16_8_ = uStack_9ef0;
      auVar81._0_16_ = local_9f00;
      auVar81._24_8_ = uStack_9ee8;
      auVar81._32_8_ = uStack_9ee0;
      auVar81._40_8_ = uStack_9ed8;
      auVar81._48_8_ = uStack_9ed0;
      auVar81._56_8_ = uStack_9ec8;
      auVar288 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(auVar288);
      auVar288 = vcvttps2dq_avx512f(auVar81);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar289 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar289 = vmovdqa64_avx512f(auVar289);
      auVar288 = vpaddd_avx512f(auVar288,auVar289);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vpslld_avx512f(auVar288,ZEXT416(0x17));
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmovdqa64_avx512f(auVar288);
      auVar288 = vmulps_avx512f(auVar290,auVar288);
      local_a000 = auVar288._0_8_;
      uStack_9ff8 = auVar288._8_8_;
      uStack_9ff0 = auVar288._16_8_;
      uStack_9fe8 = auVar288._24_8_;
      uStack_9fe0 = auVar288._32_8_;
      uStack_9fd8 = auVar288._40_8_;
      uStack_9fd0 = auVar288._48_8_;
      uStack_9fc8 = auVar288._56_8_;
      *local_a660 = local_a000;
      local_a660[1] = uStack_9ff8;
      local_a660[2] = uStack_9ff0;
      local_a660[3] = uStack_9fe8;
      local_a660[4] = uStack_9fe0;
      local_a660[5] = uStack_9fd8;
      local_a660[6] = uStack_9fd0;
      local_a660[7] = uStack_9fc8;
      local_a658 = local_a658 + 4;
      local_a660 = local_a660 + 8;
    }
    while( true ) {
      local_3360 = (float)uVar27;
      fStack_335c = (float)((ulong)uVar27 >> 0x20);
      fStack_3358 = (float)uVar31;
      fStack_3354 = (float)((ulong)uVar31 >> 0x20);
      if (in_ECX <= local_a8c4 + 1) break;
      uVar1 = *local_a658;
      uVar2 = local_a658[1];
      auVar275._8_8_ = CONCAT44(uVar1,uVar1);
      auVar275._0_8_ = CONCAT44(uVar1,uVar1);
      auVar275._16_8_ = CONCAT44(uVar2,uVar2);
      auVar275._24_8_ = CONCAT44(uVar2,uVar2);
      auVar274._8_8_ = CONCAT44(uVar1,uVar1);
      auVar274._0_8_ = CONCAT44(uVar1,uVar1);
      auVar274._16_8_ = CONCAT44(uVar2,uVar2);
      auVar274._24_8_ = CONCAT44(uVar2,uVar2);
      auVar19 = vcmpps_avx(auVar274,ZEXT1632(ZEXT816(0)),2);
      auVar184._8_4_ = 0x800000;
      auVar184._0_8_ = 0x80000000800000;
      auVar184._12_4_ = 0x800000;
      auVar184._16_4_ = 0x800000;
      auVar184._20_4_ = 0x800000;
      auVar184._24_4_ = 0x800000;
      auVar184._28_4_ = 0x800000;
      auVar293 = vmaxps_avx(auVar275,auVar184);
      auVar25 = vpsrld_avx2(auVar293,ZEXT416(0x17));
      auVar186._8_4_ = 0x807fffff;
      auVar186._0_8_ = 0x807fffff807fffff;
      auVar186._12_4_ = 0x807fffff;
      auVar186._16_4_ = 0x807fffff;
      auVar186._20_4_ = 0x807fffff;
      auVar186._24_4_ = 0x807fffff;
      auVar186._28_4_ = 0x807fffff;
      auVar293 = vpand_avx2(auVar293,auVar186);
      auVar210._8_4_ = 0x3f000000;
      auVar210._0_8_ = 0x3f0000003f000000;
      auVar210._12_4_ = 0x3f000000;
      auVar210._16_4_ = 0x3f000000;
      auVar210._20_4_ = 0x3f000000;
      auVar210._24_4_ = 0x3f000000;
      auVar210._28_4_ = 0x3f000000;
      auVar24 = vpor_avx2(auVar293,auVar210);
      auVar211._8_8_ = 0x7f0000007f;
      auVar211._0_8_ = 0x7f0000007f;
      auVar211._16_8_ = 0x7f0000007f;
      auVar211._24_8_ = 0x7f0000007f;
      auVar293 = vpsubd_avx2(auVar25,auVar211);
      auVar293 = vcvtdq2ps_avx(auVar293);
      local_2f00 = auVar293._0_4_;
      fStack_2efc = auVar293._4_4_;
      fStack_2ef8 = auVar293._8_4_;
      fStack_2ef4 = auVar293._12_4_;
      fStack_2ef0 = auVar293._16_4_;
      fStack_2eec = auVar293._20_4_;
      fStack_2ee8 = auVar293._24_4_;
      fStack_2ee4 = auVar293._28_4_;
      local_3040._4_4_ = fStack_2efc + 1.0;
      local_3040._0_4_ = local_2f00 + 1.0;
      fStack_3038 = fStack_2ef8 + 1.0;
      fStack_3034 = fStack_2ef4 + 1.0;
      uStack_3030._0_4_ = fStack_2ef0 + 1.0;
      uStack_3030._4_4_ = fStack_2eec + 1.0;
      uStack_3028._0_4_ = fStack_2ee8 + 1.0;
      uStack_3028._4_4_ = fStack_2ee4 + 1.0;
      auVar212 = _local_3040;
      auVar298._8_4_ = 0x3f3504f3;
      auVar298._0_8_ = 0x3f3504f33f3504f3;
      auVar298._12_4_ = 0x3f3504f3;
      auVar298._16_4_ = 0x3f3504f3;
      auVar298._20_4_ = 0x3f3504f3;
      auVar298._24_4_ = 0x3f3504f3;
      auVar298._28_4_ = 0x3f3504f3;
      auVar293 = vcmpps_avx(auVar24,auVar298,1);
      auVar25 = vpand_avx2(auVar24,auVar293);
      auVar183._8_8_ = 0x3f8000003f800000;
      auVar183._0_8_ = 0x3f8000003f800000;
      auVar183._16_8_ = 0x3f8000003f800000;
      auVar183._24_8_ = 0x3f8000003f800000;
      auVar24 = vsubps_avx(auVar24,auVar183);
      uStack_3028 = auVar212._24_8_;
      auVar185._8_8_ = 0x3f8000003f800000;
      auVar185._0_8_ = 0x3f8000003f800000;
      auVar185._16_8_ = 0x3f8000003f800000;
      auVar185._24_8_ = 0x3f8000003f800000;
      auVar293 = vpand_avx2(auVar185,auVar293);
      auVar182._16_8_ = uStack_3030;
      auVar182._0_16_ = _local_3040;
      auVar182._24_8_ = uStack_3028;
      auVar293 = vsubps_avx(auVar182,auVar293);
      local_2f40 = auVar24._0_4_;
      fStack_2f3c = auVar24._4_4_;
      fStack_2f38 = auVar24._8_4_;
      fStack_2f34 = auVar24._12_4_;
      fStack_2f30 = auVar24._16_4_;
      fStack_2f2c = auVar24._20_4_;
      fStack_2f28 = auVar24._24_4_;
      fStack_2f24 = auVar24._28_4_;
      local_2f60 = auVar25._0_4_;
      fStack_2f5c = auVar25._4_4_;
      fStack_2f58 = auVar25._8_4_;
      fStack_2f54 = auVar25._12_4_;
      fStack_2f50 = auVar25._16_4_;
      fStack_2f4c = auVar25._20_4_;
      fStack_2f48 = auVar25._24_4_;
      fStack_2f44 = auVar25._28_4_;
      local_2fc0._0_4_ = local_2f40 + local_2f60;
      local_2fc0._4_4_ = fStack_2f3c + fStack_2f5c;
      fStack_2fb8 = fStack_2f38 + fStack_2f58;
      fStack_2fb4 = fStack_2f34 + fStack_2f54;
      fStack_2fb0 = fStack_2f30 + fStack_2f50;
      fStack_2fac = fStack_2f2c + fStack_2f4c;
      fStack_2fa8 = fStack_2f28 + fStack_2f48;
      fStack_2fa4 = fStack_2f24 + fStack_2f44;
      fStack_30b8 = 0.070376836;
      local_30c0 = (undefined1  [8])0x3d9021bb3d9021bb;
      fStack_30b4 = 0.070376836;
      fStack_30b0 = 0.070376836;
      fStack_30ac = 0.070376836;
      fStack_30a8 = 0.070376836;
      uStack_30a4 = 0x3d9021bb;
      auVar195._8_4_ = -0.1151461;
      auVar195._12_4_ = -0.1151461;
      auVar195._0_4_ = -0.1151461;
      auVar195._4_4_ = -0.1151461;
      auVar195._16_4_ = -0.1151461;
      auVar195._20_4_ = -0.1151461;
      auVar195._24_4_ = -0.1151461;
      auVar195._28_4_ = -0.1151461;
      auVar20 = vfmadd213ps_fma(_local_2fc0,_local_30c0,auVar195);
      auVar196._8_4_ = 0.116769984;
      auVar196._12_4_ = 0.116769984;
      auVar196._0_4_ = 0.116769984;
      auVar196._4_4_ = 0.116769984;
      auVar196._16_4_ = 0.116769984;
      auVar196._20_4_ = 0.116769984;
      auVar196._24_4_ = 0.116769984;
      auVar196._28_4_ = 0.116769984;
      auVar20 = vfmadd213ps_fma(_local_2fc0,ZEXT1632(auVar20),auVar196);
      auVar197._8_4_ = -0.12420141;
      auVar197._12_4_ = -0.12420141;
      auVar197._0_4_ = -0.12420141;
      auVar197._4_4_ = -0.12420141;
      auVar197._16_4_ = -0.12420141;
      auVar197._20_4_ = -0.12420141;
      auVar197._24_4_ = -0.12420141;
      auVar197._28_4_ = -0.12420141;
      auVar20 = vfmadd213ps_fma(_local_2fc0,ZEXT1632(auVar20),auVar197);
      auVar198._8_4_ = 0.14249323;
      auVar198._12_4_ = 0.14249323;
      auVar198._0_4_ = 0.14249323;
      auVar198._4_4_ = 0.14249323;
      auVar198._16_4_ = 0.14249323;
      auVar198._20_4_ = 0.14249323;
      auVar198._24_4_ = 0.14249323;
      auVar198._28_4_ = 0.14249323;
      auVar20 = vfmadd213ps_fma(_local_2fc0,ZEXT1632(auVar20),auVar198);
      auVar199._8_4_ = -0.16668057;
      auVar199._12_4_ = -0.16668057;
      auVar199._0_4_ = -0.16668057;
      auVar199._4_4_ = -0.16668057;
      auVar199._16_4_ = -0.16668057;
      auVar199._20_4_ = -0.16668057;
      auVar199._24_4_ = -0.16668057;
      auVar199._28_4_ = -0.16668057;
      auVar20 = vfmadd213ps_fma(_local_2fc0,ZEXT1632(auVar20),auVar199);
      auVar200._8_4_ = 0.20000714;
      auVar200._12_4_ = 0.20000714;
      auVar200._0_4_ = 0.20000714;
      auVar200._4_4_ = 0.20000714;
      auVar200._16_4_ = 0.20000714;
      auVar200._20_4_ = 0.20000714;
      auVar200._24_4_ = 0.20000714;
      auVar200._28_4_ = 0.20000714;
      auVar20 = vfmadd213ps_fma(_local_2fc0,ZEXT1632(auVar20),auVar200);
      auVar201._8_4_ = -0.24999994;
      auVar201._12_4_ = -0.24999994;
      auVar201._0_4_ = -0.24999994;
      auVar201._4_4_ = -0.24999994;
      auVar201._16_4_ = -0.24999994;
      auVar201._20_4_ = -0.24999994;
      auVar201._24_4_ = -0.24999994;
      auVar201._28_4_ = -0.24999994;
      auVar20 = vfmadd213ps_fma(_local_2fc0,ZEXT1632(auVar20),auVar201);
      auVar202._8_4_ = 0.3333333;
      auVar202._12_4_ = 0.3333333;
      auVar202._0_4_ = 0.3333333;
      auVar202._4_4_ = 0.3333333;
      auVar202._16_4_ = 0.3333333;
      auVar202._20_4_ = 0.3333333;
      auVar202._24_4_ = 0.3333333;
      auVar202._28_4_ = 0.3333333;
      auVar20 = vfmadd213ps_fma(_local_2fc0,ZEXT1632(auVar20),auVar202);
      local_2e00 = auVar20._0_4_;
      fStack_2dfc = auVar20._4_4_;
      fStack_2df8 = auVar20._8_4_;
      fStack_2df4 = auVar20._12_4_;
      local_30c0._4_4_ =
           fStack_2dfc * (float)local_2fc0._4_4_ * (float)local_2fc0._4_4_ * (float)local_2fc0._4_4_
      ;
      local_30c0._0_4_ =
           local_2e00 * (float)local_2fc0._0_4_ * (float)local_2fc0._0_4_ * (float)local_2fc0._0_4_;
      fStack_30b8 = fStack_2df8 * fStack_2fb8 * fStack_2fb8 * fStack_2fb8;
      fStack_30b4 = fStack_2df4 * fStack_2fb4 * fStack_2fb4 * fStack_2fb4;
      fStack_30b0 = fStack_2fb0 * 0.0 * fStack_2fb0 * fStack_2fb0;
      fStack_30ac = fStack_2fac * 0.0 * fStack_2fac * fStack_2fac;
      fStack_30a8 = fStack_2fa8 * 0.0 * fStack_2fa8 * fStack_2fa8;
      uStack_30a4 = 0;
      auVar203._8_4_ = -0.00021219444;
      auVar203._12_4_ = -0.00021219444;
      auVar203._0_4_ = -0.00021219444;
      auVar203._4_4_ = -0.00021219444;
      auVar203._16_4_ = -0.00021219444;
      auVar203._20_4_ = -0.00021219444;
      auVar203._24_4_ = -0.00021219444;
      auVar203._28_4_ = -0.00021219444;
      auVar20 = vfmadd213ps_fma(auVar203,auVar293,_local_30c0);
      auVar278._4_4_ = (float)local_2fc0._4_4_ * (float)local_2fc0._4_4_;
      auVar278._0_4_ = (float)local_2fc0._0_4_ * (float)local_2fc0._0_4_;
      auVar278._8_4_ = fStack_2fb8 * fStack_2fb8;
      auVar278._12_4_ = fStack_2fb4 * fStack_2fb4;
      auVar278._16_4_ = fStack_2fb0 * fStack_2fb0;
      auVar278._20_4_ = fStack_2fac * fStack_2fac;
      auVar278._24_4_ = fStack_2fa8 * fStack_2fa8;
      auVar278._28_4_ = fStack_2fa4;
      auVar207._8_4_ = 0.5;
      auVar207._12_4_ = 0.5;
      auVar207._0_4_ = 0.5;
      auVar207._4_4_ = 0.5;
      auVar207._16_4_ = 0.5;
      auVar207._20_4_ = 0.5;
      auVar207._24_4_ = 0.5;
      auVar207._28_4_ = 0.5;
      auVar20 = vfnmadd213ps_fma(auVar207,auVar278,ZEXT1632(auVar20));
      local_2fa0 = auVar20._0_4_;
      fStack_2f9c = auVar20._4_4_;
      fStack_2f98 = auVar20._8_4_;
      fStack_2f94 = auVar20._12_4_;
      local_2fc0._4_4_ = (float)local_2fc0._4_4_ + fStack_2f9c;
      local_2fc0._0_4_ = (float)local_2fc0._0_4_ + local_2fa0;
      fStack_2fb8 = fStack_2fb8 + fStack_2f98;
      fStack_2fb4 = fStack_2fb4 + fStack_2f94;
      fStack_2fb0 = fStack_2fb0 + 0.0;
      fStack_2fac = fStack_2fac + 0.0;
      fStack_2fa8 = fStack_2fa8 + 0.0;
      fStack_2fa4 = fStack_2fa4 + 0.0;
      auVar204._8_4_ = 0.6933594;
      auVar204._12_4_ = 0.6933594;
      auVar204._0_4_ = 0.6933594;
      auVar204._4_4_ = 0.6933594;
      auVar204._16_4_ = 0.6933594;
      auVar204._20_4_ = 0.6933594;
      auVar204._24_4_ = 0.6933594;
      auVar204._28_4_ = 0.6933594;
      auVar20 = vfmadd213ps_fma(auVar204,auVar293,_local_2fc0);
      auVar19 = vpor_avx2(ZEXT1632(auVar20),auVar19);
      local_3380 = auVar19._0_4_;
      fStack_337c = auVar19._4_4_;
      fStack_3378 = auVar19._8_4_;
      fStack_3374 = auVar19._12_4_;
      fStack_3370 = auVar19._16_4_;
      fStack_336c = auVar19._20_4_;
      fStack_3368 = auVar19._24_4_;
      local_3260._4_4_ = fStack_335c * fStack_337c;
      local_3260._0_4_ = local_3360 * local_3380;
      fStack_3258 = fStack_3358 * fStack_3378;
      fStack_3254 = fStack_3354 * fStack_3374;
      uStack_3250._0_4_ = local_3360 * fStack_3370;
      uStack_3250._4_4_ = fStack_335c * fStack_336c;
      uStack_3248._0_4_ = fStack_3358 * fStack_3368;
      uStack_3248._4_4_ = fStack_3354;
      auVar19 = _local_3260;
      uStack_3248 = auVar19._24_8_;
      auVar181._16_8_ = uStack_3250;
      auVar181._0_16_ = _local_3260;
      auVar181._24_8_ = uStack_3248;
      auVar180._8_4_ = 0x42b0c0a5;
      auVar180._0_8_ = 0x42b0c0a542b0c0a5;
      auVar180._12_4_ = 0x42b0c0a5;
      auVar180._16_4_ = 0x42b0c0a5;
      auVar180._20_4_ = 0x42b0c0a5;
      auVar180._24_4_ = 0x42b0c0a5;
      auVar180._28_4_ = 0x42b0c0a5;
      auVar19 = vminps_avx(auVar181,auVar180);
      auVar179._8_4_ = 0xc2b0c0a5;
      auVar179._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar179._12_4_ = 0xc2b0c0a5;
      auVar179._16_4_ = 0xc2b0c0a5;
      auVar179._20_4_ = 0xc2b0c0a5;
      auVar179._24_4_ = 0xc2b0c0a5;
      auVar179._28_4_ = 0xc2b0c0a5;
      auVar293 = vmaxps_avx(auVar19,auVar179);
      auVar189._8_4_ = 1.442695;
      auVar189._12_4_ = 1.442695;
      auVar189._0_4_ = 1.442695;
      auVar189._4_4_ = 1.442695;
      auVar189._16_4_ = 1.442695;
      auVar189._20_4_ = 1.442695;
      auVar189._24_4_ = 1.442695;
      auVar189._28_4_ = 1.442695;
      auVar188._8_4_ = 0.5;
      auVar188._12_4_ = 0.5;
      auVar188._0_4_ = 0.5;
      auVar188._4_4_ = 0.5;
      auVar188._16_4_ = 0.5;
      auVar188._20_4_ = 0.5;
      auVar188._24_4_ = 0.5;
      auVar188._28_4_ = 0.5;
      auVar20 = vfmadd213ps_fma(auVar189,auVar293,auVar188);
      auVar24 = vroundps_avx(ZEXT1632(auVar20),1);
      auVar19 = vcmpps_avx(ZEXT1632(auVar20),auVar24,1);
      auVar187._8_8_ = 0x3f8000003f800000;
      auVar187._0_8_ = 0x3f8000003f800000;
      auVar187._16_8_ = 0x3f8000003f800000;
      auVar187._24_8_ = 0x3f8000003f800000;
      auVar19 = vpand_avx2(auVar19,auVar187);
      auVar19 = vsubps_avx(auVar24,auVar19);
      auVar205._8_4_ = 0.6933594;
      auVar205._12_4_ = 0.6933594;
      auVar205._0_4_ = 0.6933594;
      auVar205._4_4_ = 0.6933594;
      auVar205._16_4_ = 0.6933594;
      auVar205._20_4_ = 0.6933594;
      auVar205._24_4_ = 0.6933594;
      auVar205._28_4_ = 0.6933594;
      auVar20 = vfnmadd213ps_fma(auVar205,auVar19,auVar293);
      auVar206._8_4_ = -0.00021219444;
      auVar206._12_4_ = -0.00021219444;
      auVar206._0_4_ = -0.00021219444;
      auVar206._4_4_ = -0.00021219444;
      auVar206._16_4_ = -0.00021219444;
      auVar206._20_4_ = -0.00021219444;
      auVar206._24_4_ = -0.00021219444;
      auVar206._28_4_ = -0.00021219444;
      auVar20 = vfnmadd213ps_fma(auVar206,auVar19,ZEXT1632(auVar20));
      auVar293 = ZEXT1632(auVar20);
      local_3160 = auVar20._0_4_;
      fStack_315c = auVar20._4_4_;
      fStack_3158 = auVar20._8_4_;
      fStack_3154 = auVar20._12_4_;
      _local_3280 = ZEXT1632(CONCAT412(fStack_3154 * fStack_3154,
                                       CONCAT48(fStack_3158 * fStack_3158,
                                                CONCAT44(fStack_315c * fStack_315c,
                                                         local_3160 * local_3160))));
      uStack_3318._0_4_ = 0x39506967;
      local_3320 = (undefined1  [8])0x3950696739506967;
      uStack_3318._4_4_ = 0x39506967;
      uStack_3310._0_4_ = 0x39506967;
      uStack_3310._4_4_ = 0x39506967;
      uStack_3308._0_4_ = 0x39506967;
      uStack_3308._4_4_ = 0x39506967;
      auVar190._8_4_ = 0.0013981999;
      auVar190._12_4_ = 0.0013981999;
      auVar190._0_4_ = 0.0013981999;
      auVar190._4_4_ = 0.0013981999;
      auVar190._16_4_ = 0.0013981999;
      auVar190._20_4_ = 0.0013981999;
      auVar190._24_4_ = 0.0013981999;
      auVar190._28_4_ = 0.0013981999;
      auVar20 = vfmadd213ps_fma(auVar293,_local_3320,auVar190);
      auVar191._8_4_ = 0.008333452;
      auVar191._12_4_ = 0.008333452;
      auVar191._0_4_ = 0.008333452;
      auVar191._4_4_ = 0.008333452;
      auVar191._16_4_ = 0.008333452;
      auVar191._20_4_ = 0.008333452;
      auVar191._24_4_ = 0.008333452;
      auVar191._28_4_ = 0.008333452;
      auVar20 = vfmadd213ps_fma(auVar293,ZEXT1632(auVar20),auVar191);
      auVar192._8_4_ = 0.041665796;
      auVar192._12_4_ = 0.041665796;
      auVar192._0_4_ = 0.041665796;
      auVar192._4_4_ = 0.041665796;
      auVar192._16_4_ = 0.041665796;
      auVar192._20_4_ = 0.041665796;
      auVar192._24_4_ = 0.041665796;
      auVar192._28_4_ = 0.041665796;
      auVar20 = vfmadd213ps_fma(auVar293,ZEXT1632(auVar20),auVar192);
      auVar193._8_4_ = 0.16666666;
      auVar193._12_4_ = 0.16666666;
      auVar193._0_4_ = 0.16666666;
      auVar193._4_4_ = 0.16666666;
      auVar193._16_4_ = 0.16666666;
      auVar193._20_4_ = 0.16666666;
      auVar193._24_4_ = 0.16666666;
      auVar193._28_4_ = 0.16666666;
      auVar20 = vfmadd213ps_fma(auVar293,ZEXT1632(auVar20),auVar193);
      auVar194._8_4_ = 0.5;
      auVar194._12_4_ = 0.5;
      auVar194._0_4_ = 0.5;
      auVar194._4_4_ = 0.5;
      auVar194._16_4_ = 0.5;
      auVar194._20_4_ = 0.5;
      auVar194._24_4_ = 0.5;
      auVar194._28_4_ = 0.5;
      auVar20 = vfmadd213ps_fma(auVar293,ZEXT1632(auVar20),auVar194);
      auVar20 = vfmadd213ps_fma(_local_3280,ZEXT1632(auVar20),auVar293);
      local_3220 = auVar20._0_4_;
      fStack_321c = auVar20._4_4_;
      fStack_3218 = auVar20._8_4_;
      fStack_3214 = auVar20._12_4_;
      local_2a20 = auVar19._0_4_;
      fStack_2a1c = auVar19._4_4_;
      fStack_2a18 = auVar19._8_4_;
      fStack_2a14 = auVar19._12_4_;
      fStack_2a10 = auVar19._16_4_;
      fStack_2a0c = auVar19._20_4_;
      fStack_2a08 = auVar19._24_4_;
      fStack_2a04 = auVar19._28_4_;
      local_32c0._4_4_ = (int)fStack_2a1c;
      local_32c0._0_4_ = (int)local_2a20;
      local_32c0._8_4_ = (int)fStack_2a18;
      local_32c0._12_4_ = (int)fStack_2a14;
      uStack_32b0._0_4_ = (int)fStack_2a10;
      uStack_32b0._4_4_ = (int)fStack_2a0c;
      uStack_32a8._0_4_ = (int)fStack_2a08;
      uStack_32a8._4_4_ = (int)fStack_2a04;
      auVar19 = _local_32c0;
      uStack_32a8 = auVar19._24_8_;
      auVar209._16_8_ = uStack_32b0;
      auVar209._0_16_ = local_32c0;
      auVar209._24_8_ = uStack_32a8;
      auVar208._8_8_ = 0x7f0000007f;
      auVar208._0_8_ = 0x7f0000007f;
      auVar208._16_8_ = 0x7f0000007f;
      auVar208._24_8_ = 0x7f0000007f;
      auVar19 = vpaddd_avx2(auVar209,auVar208);
      auVar19 = vpslld_avx2(auVar19,ZEXT416(0x17));
      local_31c0 = auVar19._0_4_;
      fStack_31bc = auVar19._4_4_;
      fStack_31b8 = auVar19._8_4_;
      fStack_31b4 = auVar19._12_4_;
      fStack_31b0 = auVar19._16_4_;
      fStack_31ac = auVar19._20_4_;
      fStack_31a8 = auVar19._24_4_;
      local_3320._4_4_ = (fStack_321c + 1.0) * fStack_31bc;
      local_3320._0_4_ = (local_3220 + 1.0) * local_31c0;
      uStack_3318._0_4_ = (fStack_3218 + 1.0) * fStack_31b8;
      uStack_3318._4_4_ = (fStack_3214 + 1.0) * fStack_31b4;
      uStack_3310._0_4_ = fStack_31b0 * 1.0;
      uStack_3310._4_4_ = fStack_31ac * 1.0;
      auVar287 = _local_3320;
      uStack_3308._0_4_ = fStack_31a8 * 1.0;
      uStack_3308._4_4_ = 0x3f800000;
      auVar19 = _local_3320;
      uStack_3310 = auVar287._16_8_;
      uStack_3308 = auVar19._24_8_;
      *local_a660 = local_3320;
      local_a660[1] = uStack_3318;
      local_a660[2] = uStack_3310;
      local_a660[3] = uStack_3308;
      local_a658 = local_a658 + 2;
      local_a660 = local_a660 + 4;
      local_a8c4 = local_a8c4 + 2;
    }
    for (; local_a8c4 < in_ECX; local_a8c4 = local_a8c4 + 1) {
      uVar1 = *local_a658;
      auVar273._8_8_ = CONCAT44(uVar1,uVar1);
      auVar273._0_8_ = CONCAT44(uVar1,uVar1);
      auVar272._8_8_ = CONCAT44(uVar1,uVar1);
      auVar272._0_8_ = CONCAT44(uVar1,uVar1);
      auVar20 = vcmpps_avx(auVar273,ZEXT816(0),2);
      auVar23._8_4_ = 0x800000;
      auVar23._0_8_ = 0x80000000800000;
      auVar23._12_4_ = 0x800000;
      auVar21 = vmaxps_avx(auVar272,auVar23);
      auVar22 = vpsrld_avx(auVar21,ZEXT416(0x17));
      auVar247._8_4_ = 0x807fffff;
      auVar247._0_8_ = 0x807fffff807fffff;
      auVar247._12_4_ = 0x807fffff;
      auVar21 = vpand_avx(auVar21,auVar247);
      auVar269._8_4_ = 0x3f000000;
      auVar269._0_8_ = 0x3f0000003f000000;
      auVar269._12_4_ = 0x3f000000;
      auVar23 = vpor_avx(auVar21,auVar269);
      auVar270._8_8_ = 0x7f0000007f;
      auVar270._0_8_ = 0x7f0000007f;
      auVar21 = vpsubd_avx(auVar22,auVar270);
      auVar21 = vcvtdq2ps_avx(auVar21);
      local_8a0 = auVar21._0_4_;
      fStack_89c = auVar21._4_4_;
      fStack_898 = auVar21._8_4_;
      fStack_894 = auVar21._12_4_;
      local_940 = CONCAT44(fStack_89c + 1.0,local_8a0 + 1.0);
      uStack_938._0_4_ = fStack_898 + 1.0;
      uStack_938._4_4_ = fStack_894 + 1.0;
      auVar271._8_4_ = 0x3f3504f3;
      auVar271._0_8_ = 0x3f3504f33f3504f3;
      auVar271._12_4_ = 0x3f3504f3;
      auVar21 = vcmpps_avx(auVar23,auVar271,1);
      auVar22 = vpand_avx(auVar23,auVar21);
      auVar243._8_8_ = 0x3f8000003f800000;
      auVar243._0_8_ = 0x3f8000003f800000;
      auVar23 = vsubps_avx(auVar23,auVar243);
      auVar246._8_8_ = 0x3f8000003f800000;
      auVar246._0_8_ = 0x3f8000003f800000;
      auVar21 = vpand_avx(auVar246,auVar21);
      auVar242._8_8_ = uStack_938;
      auVar242._0_8_ = local_940;
      auVar21 = vsubps_avx(auVar242,auVar21);
      local_8c0 = auVar23._0_4_;
      fStack_8bc = auVar23._4_4_;
      fStack_8b8 = auVar23._8_4_;
      fStack_8b4 = auVar23._12_4_;
      local_8d0 = auVar22._0_4_;
      fStack_8cc = auVar22._4_4_;
      fStack_8c8 = auVar22._8_4_;
      fStack_8c4 = auVar22._12_4_;
      local_900._0_4_ = local_8c0 + local_8d0;
      local_900._4_4_ = fStack_8bc + fStack_8cc;
      fStack_8f8 = fStack_8b8 + fStack_8c8;
      fStack_8f4 = fStack_8b4 + fStack_8c4;
      fStack_978 = 0.070376836;
      local_980 = (undefined1  [8])0x3d9021bb3d9021bb;
      fStack_974 = 0.070376836;
      auVar259._8_4_ = -0.1151461;
      auVar259._12_4_ = -0.1151461;
      auVar259._0_4_ = -0.1151461;
      auVar259._4_4_ = -0.1151461;
      auVar22 = vfmadd213ps_fma(_local_900,_local_980,auVar259);
      auVar260._8_4_ = 0.116769984;
      auVar260._12_4_ = 0.116769984;
      auVar260._0_4_ = 0.116769984;
      auVar260._4_4_ = 0.116769984;
      auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar260);
      auVar261._8_4_ = -0.12420141;
      auVar261._12_4_ = -0.12420141;
      auVar261._0_4_ = -0.12420141;
      auVar261._4_4_ = -0.12420141;
      auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar261);
      auVar262._8_4_ = 0.14249323;
      auVar262._12_4_ = 0.14249323;
      auVar262._0_4_ = 0.14249323;
      auVar262._4_4_ = 0.14249323;
      auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar262);
      auVar263._8_4_ = -0.16668057;
      auVar263._12_4_ = -0.16668057;
      auVar263._0_4_ = -0.16668057;
      auVar263._4_4_ = -0.16668057;
      auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar263);
      auVar264._8_4_ = 0.20000714;
      auVar264._12_4_ = 0.20000714;
      auVar264._0_4_ = 0.20000714;
      auVar264._4_4_ = 0.20000714;
      auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar264);
      auVar265._8_4_ = -0.24999994;
      auVar265._12_4_ = -0.24999994;
      auVar265._0_4_ = -0.24999994;
      auVar265._4_4_ = -0.24999994;
      auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar265);
      auVar266._8_4_ = 0.3333333;
      auVar266._12_4_ = 0.3333333;
      auVar266._0_4_ = 0.3333333;
      auVar266._4_4_ = 0.3333333;
      auVar22 = vfmadd213ps_fma(_local_900,auVar22,auVar266);
      local_820 = auVar22._0_4_;
      fStack_81c = auVar22._4_4_;
      fStack_818 = auVar22._8_4_;
      fStack_814 = auVar22._12_4_;
      local_980._4_4_ =
           fStack_81c * (float)local_900._4_4_ * (float)local_900._4_4_ * (float)local_900._4_4_;
      local_980._0_4_ =
           local_820 * (float)local_900._0_4_ * (float)local_900._0_4_ * (float)local_900._0_4_;
      fStack_978 = fStack_818 * fStack_8f8 * fStack_8f8 * fStack_8f8;
      fStack_974 = fStack_814 * fStack_8f4 * fStack_8f4 * fStack_8f4;
      auVar267._8_4_ = -0.00021219444;
      auVar267._12_4_ = -0.00021219444;
      auVar267._0_4_ = -0.00021219444;
      auVar267._4_4_ = -0.00021219444;
      auVar22 = vfmadd213ps_fma(auVar267,auVar21,_local_980);
      auVar280._4_4_ = (float)local_900._4_4_ * (float)local_900._4_4_;
      auVar280._0_4_ = (float)local_900._0_4_ * (float)local_900._0_4_;
      auVar280._8_4_ = fStack_8f8 * fStack_8f8;
      auVar280._12_4_ = fStack_8f4 * fStack_8f4;
      auVar253._8_4_ = 0.5;
      auVar253._12_4_ = 0.5;
      auVar253._0_4_ = 0.5;
      auVar253._4_4_ = 0.5;
      auVar22 = vfnmadd213ps_fma(auVar253,auVar280,auVar22);
      local_8f0 = auVar22._0_4_;
      fStack_8ec = auVar22._4_4_;
      fStack_8e8 = auVar22._8_4_;
      fStack_8e4 = auVar22._12_4_;
      local_900._4_4_ = (float)local_900._4_4_ + fStack_8ec;
      local_900._0_4_ = (float)local_900._0_4_ + local_8f0;
      fStack_8f8 = fStack_8f8 + fStack_8e8;
      fStack_8f4 = fStack_8f4 + fStack_8e4;
      auVar268._8_4_ = 0.6933594;
      auVar268._12_4_ = 0.6933594;
      auVar268._0_4_ = 0.6933594;
      auVar268._4_4_ = 0.6933594;
      auVar21 = vfmadd213ps_fma(auVar268,auVar21,_local_900);
      auVar20 = vpor_avx(auVar21,auVar20);
      local_b20 = auVar20._0_4_;
      fStack_b1c = auVar20._4_4_;
      fStack_b18 = auVar20._8_4_;
      fStack_b14 = auVar20._12_4_;
      local_a90 = CONCAT44(fStack_335c * fStack_b1c,local_3360 * local_b20);
      uStack_a88._0_4_ = fStack_3358 * fStack_b18;
      uStack_a88._4_4_ = fStack_3354 * fStack_b14;
      auVar22._8_8_ = uStack_a88;
      auVar22._0_8_ = local_a90;
      auVar20._8_4_ = 0x42b0c0a5;
      auVar20._0_8_ = 0x42b0c0a542b0c0a5;
      auVar20._12_4_ = 0x42b0c0a5;
      auVar20 = vminps_avx(auVar22,auVar20);
      auVar21._8_4_ = 0xc2b0c0a5;
      auVar21._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar21._12_4_ = 0xc2b0c0a5;
      auVar22 = vmaxps_avx(auVar20,auVar21);
      local_9d0 = auVar22._0_4_;
      fStack_9cc = auVar22._4_4_;
      fStack_9c8 = auVar22._8_4_;
      fStack_9c4 = auVar22._12_4_;
      fVar292 = local_9d0 * 1.442695 + 0.5;
      fVar294 = fStack_9cc * 1.442695 + 0.5;
      fVar295 = fStack_9c8 * 1.442695 + 0.5;
      fVar296 = fStack_9c4 * 1.442695 + 0.5;
      local_ab0 = CONCAT44(fVar294,fVar292);
      uStack_aa8._0_4_ = fVar295;
      uStack_aa8._4_4_ = fVar296;
      local_ac0 = CONCAT44((int)fVar294,(int)fVar292);
      uStack_ab8._0_4_ = (int)fVar295;
      uStack_ab8._4_4_ = (int)fVar296;
      auVar244._8_8_ = uStack_ab8;
      auVar244._0_8_ = local_ac0;
      auVar21 = vcvtdq2ps_avx(auVar244);
      auVar245._8_8_ = uStack_aa8;
      auVar245._0_8_ = local_ab0;
      auVar20 = vcmpps_avx(auVar245,auVar21,1);
      auVar248._8_8_ = 0x3f8000003f800000;
      auVar248._0_8_ = 0x3f8000003f800000;
      auVar20 = vpand_avx(auVar20,auVar248);
      auVar20 = vsubps_avx(auVar21,auVar20);
      auVar251._8_4_ = 0.6933594;
      auVar251._12_4_ = 0.6933594;
      auVar251._0_4_ = 0.6933594;
      auVar251._4_4_ = 0.6933594;
      auVar21 = vfnmadd213ps_fma(auVar251,auVar20,auVar22);
      auVar252._8_4_ = -0.00021219444;
      auVar252._12_4_ = -0.00021219444;
      auVar252._0_4_ = -0.00021219444;
      auVar252._4_4_ = -0.00021219444;
      auVar22 = vfnmadd213ps_fma(auVar252,auVar20,auVar21);
      local_9f0 = auVar22._0_4_;
      fStack_9ec = auVar22._4_4_;
      fStack_9e8 = auVar22._8_4_;
      fStack_9e4 = auVar22._12_4_;
      local_aa0._4_4_ = fStack_9ec * fStack_9ec;
      local_aa0._0_4_ = local_9f0 * local_9f0;
      fStack_a98 = fStack_9e8 * fStack_9e8;
      fStack_a94 = fStack_9e4 * fStack_9e4;
      uStack_ae8._0_4_ = 0x39506967;
      local_af0 = (undefined1  [8])0x3950696739506967;
      uStack_ae8._4_4_ = 0x39506967;
      auVar254._8_4_ = 0.0013981999;
      auVar254._12_4_ = 0.0013981999;
      auVar254._0_4_ = 0.0013981999;
      auVar254._4_4_ = 0.0013981999;
      auVar21 = vfmadd213ps_fma(auVar22,_local_af0,auVar254);
      auVar255._8_4_ = 0.008333452;
      auVar255._12_4_ = 0.008333452;
      auVar255._0_4_ = 0.008333452;
      auVar255._4_4_ = 0.008333452;
      auVar21 = vfmadd213ps_fma(auVar22,auVar21,auVar255);
      auVar256._8_4_ = 0.041665796;
      auVar256._12_4_ = 0.041665796;
      auVar256._0_4_ = 0.041665796;
      auVar256._4_4_ = 0.041665796;
      auVar21 = vfmadd213ps_fma(auVar22,auVar21,auVar256);
      auVar257._8_4_ = 0.16666666;
      auVar257._12_4_ = 0.16666666;
      auVar257._0_4_ = 0.16666666;
      auVar257._4_4_ = 0.16666666;
      auVar21 = vfmadd213ps_fma(auVar22,auVar21,auVar257);
      auVar258._8_4_ = 0.5;
      auVar258._12_4_ = 0.5;
      auVar258._0_4_ = 0.5;
      auVar258._4_4_ = 0.5;
      auVar21 = vfmadd213ps_fma(auVar22,auVar21,auVar258);
      auVar21 = vfmadd213ps_fma(_local_aa0,auVar21,auVar22);
      local_a70 = auVar21._0_4_;
      fStack_a6c = auVar21._4_4_;
      fStack_a68 = auVar21._8_4_;
      fStack_a64 = auVar21._12_4_;
      local_7b0 = auVar20._0_4_;
      fStack_7ac = auVar20._4_4_;
      fStack_7a8 = auVar20._8_4_;
      fStack_7a4 = auVar20._12_4_;
      local_ac0 = CONCAT44((int)fStack_7ac,(int)local_7b0);
      uStack_ab8._0_4_ = (int)fStack_7a8;
      uStack_ab8._4_4_ = (int)fStack_7a4;
      auVar250._8_8_ = uStack_ab8;
      auVar250._0_8_ = local_ac0;
      auVar249._8_8_ = 0x7f0000007f;
      auVar249._0_8_ = 0x7f0000007f;
      auVar20 = vpaddd_avx(auVar250,auVar249);
      auVar20 = vpslld_avx(auVar20,ZEXT416(0x17));
      local_a20 = auVar20._0_4_;
      fStack_a1c = auVar20._4_4_;
      fStack_a18 = auVar20._8_4_;
      fStack_a14 = auVar20._12_4_;
      local_af0._4_4_ = (fStack_a6c + 1.0) * fStack_a1c;
      local_af0._0_4_ = (local_a70 + 1.0) * local_a20;
      uStack_ae8._0_4_ = (fStack_a68 + 1.0) * fStack_a18;
      uStack_ae8._4_4_ = (fStack_a64 + 1.0) * fStack_a14;
      *local_a660 = local_af0;
      local_a660[1] = uStack_ae8;
      local_a658 = local_a658 + 1;
      local_a660 = local_a660 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_a(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        __m512 _p = _mm512_loadu_ps(ptr);
        for (; i < w; i++)
        {
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
        __m256 _p = _mm256_loadu_ps(ptr);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p), _p, 1);
        for (; i + 1 < w; i += 2)
        {
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
        __m128 _p = _mm_loadu_ps(ptr);
#if __AVX__
        __m256 _p_256 = _mm256_insertf128_ps(_mm256_castps128_ps256(_p), _p, 1);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p_256), _p_256, 1);
        for (; i + 3 < w; i += 4)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p_256, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}